

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  uint uVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  long lVar21;
  long lVar22;
  RTCFilterFunctionN p_Var23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar82;
  uint uVar83;
  ulong uVar84;
  ulong uVar85;
  uint uVar86;
  long lVar87;
  byte bVar89;
  uint uVar90;
  long lVar91;
  undefined4 uVar92;
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar106 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar137;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar144 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  vfloat4 a0_1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float t1;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  float fVar217;
  undefined1 auVar216 [32];
  float fVar218;
  float fVar240;
  float fVar242;
  vfloat4 a0_2;
  float fVar243;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar241;
  float fVar244;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar245;
  float fVar246;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar247;
  float fVar262;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar260;
  float fVar261;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar266;
  undefined1 auVar259 [32];
  float fVar280;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar267;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar283;
  float fVar284;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar282 [16];
  vfloat4 b0;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar297;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar312;
  float fVar313;
  float fVar315;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar314;
  undefined1 auVar311 [32];
  float fVar316;
  float fVar329;
  float fVar330;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar331;
  undefined1 auVar328 [32];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  float fVar360;
  float fVar374;
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  float fVar372;
  float fVar373;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  float fVar379;
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  float fVar386;
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar399 [64];
  float fVar406;
  vfloat4 a0;
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  RTCFilterFunctionNArguments local_510;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  uint auStack_490 [4];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  float afStack_360 [8];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar88;
  undefined1 auVar277 [32];
  undefined1 auVar398 [32];
  
  PVar16 = prim[1];
  uVar84 = (ulong)(byte)PVar16;
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 6)));
  auVar303 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 10)));
  auVar269 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 5 + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 5 + 10)));
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 6)));
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 10)));
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xf + 6)));
  lVar87 = uVar84 * 0x25;
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xf + 10)));
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar16 * 0x10 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar16 * 0x10 + 10)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x11 + 6)));
  auVar388 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x11 + 10)));
  auVar110 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar110 = vinsertps_avx(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar223 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar223 = vinsertps_avx(auVar223,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar110 = vsubps_avx(auVar110,*(undefined1 (*) [16])(prim + lVar87 + 6));
  fVar137 = *(float *)(prim + lVar87 + 0x12);
  local_720._4_4_ = fVar137 * auVar110._4_4_;
  local_720._0_4_ = fVar137 * auVar110._0_4_;
  fStack_718 = fVar137 * auVar110._8_4_;
  fStack_714 = fVar137 * auVar110._12_4_;
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1a + 6)));
  auVar317._0_4_ = fVar137 * auVar223._0_4_;
  auVar317._4_4_ = fVar137 * auVar223._4_4_;
  auVar317._8_4_ = fVar137 * auVar223._8_4_;
  auVar317._12_4_ = fVar137 * auVar223._12_4_;
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1a + 10)));
  auVar121._16_16_ = auVar303;
  auVar121._0_16_ = auVar197;
  auVar161._16_16_ = auVar32;
  auVar161._0_16_ = auVar269;
  auVar235._16_16_ = auVar146;
  auVar235._0_16_ = auVar158;
  auVar394._16_16_ = auVar147;
  auVar394._0_16_ = auVar183;
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1b + 6)));
  auVar303 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1b + 10)));
  auVar269 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1c + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1c + 10)));
  auVar122 = vcvtdq2ps_avx(auVar161);
  auVar24 = vcvtdq2ps_avx(auVar235);
  auVar162._16_16_ = auVar33;
  auVar162._0_16_ = auVar282;
  auVar25 = vcvtdq2ps_avx(auVar162);
  auVar236._16_16_ = auVar388;
  auVar236._0_16_ = auVar34;
  auVar26 = vcvtdq2ps_avx(auVar236);
  auVar163._16_16_ = auVar223;
  auVar163._0_16_ = auVar110;
  auVar293._16_16_ = auVar303;
  auVar293._0_16_ = auVar197;
  auVar275._16_16_ = auVar32;
  auVar275._0_16_ = auVar269;
  auVar110 = vshufps_avx(auVar317,auVar317,0x55);
  auVar223 = vshufps_avx(auVar317,auVar317,0xaa);
  fVar137 = auVar223._0_4_;
  fVar132 = auVar223._4_4_;
  fVar218 = auVar223._8_4_;
  fVar242 = auVar223._12_4_;
  fVar378 = auVar110._0_4_;
  fVar245 = auVar110._4_4_;
  fVar246 = auVar110._8_4_;
  fVar247 = auVar110._12_4_;
  auVar27 = vcvtdq2ps_avx(auVar121);
  auVar28 = vcvtdq2ps_avx(auVar394);
  auVar29 = vcvtdq2ps_avx(auVar163);
  auVar30 = vcvtdq2ps_avx(auVar293);
  auVar31 = vcvtdq2ps_avx(auVar275);
  auVar110 = vshufps_avx(auVar317,auVar317,0);
  fVar93 = auVar110._0_4_;
  fVar133 = auVar110._4_4_;
  fVar240 = auVar110._8_4_;
  fVar243 = auVar110._12_4_;
  auVar276._0_4_ = auVar27._0_4_ * fVar93 + fVar378 * auVar122._0_4_ + auVar24._0_4_ * fVar137;
  auVar276._4_4_ = auVar27._4_4_ * fVar133 + fVar245 * auVar122._4_4_ + auVar24._4_4_ * fVar132;
  auVar276._8_4_ = auVar27._8_4_ * fVar240 + fVar246 * auVar122._8_4_ + auVar24._8_4_ * fVar218;
  auVar276._12_4_ = auVar27._12_4_ * fVar243 + fVar247 * auVar122._12_4_ + auVar24._12_4_ * fVar242;
  auVar276._16_4_ = auVar27._16_4_ * fVar93 + fVar378 * auVar122._16_4_ + auVar24._16_4_ * fVar137;
  auVar276._20_4_ = auVar27._20_4_ * fVar133 + fVar245 * auVar122._20_4_ + auVar24._20_4_ * fVar132;
  auVar276._24_4_ = auVar27._24_4_ * fVar240 + fVar246 * auVar122._24_4_ + auVar24._24_4_ * fVar218;
  auVar276._28_4_ = 0;
  auVar257._0_4_ = auVar28._0_4_ * fVar93 + fVar378 * auVar25._0_4_ + auVar26._0_4_ * fVar137;
  auVar257._4_4_ = auVar28._4_4_ * fVar133 + fVar245 * auVar25._4_4_ + auVar26._4_4_ * fVar132;
  auVar257._8_4_ = auVar28._8_4_ * fVar240 + fVar246 * auVar25._8_4_ + auVar26._8_4_ * fVar218;
  auVar257._12_4_ = auVar28._12_4_ * fVar243 + fVar247 * auVar25._12_4_ + auVar26._12_4_ * fVar242;
  auVar257._16_4_ = auVar28._16_4_ * fVar93 + fVar378 * auVar25._16_4_ + auVar26._16_4_ * fVar137;
  auVar257._20_4_ = auVar28._20_4_ * fVar133 + fVar245 * auVar25._20_4_ + auVar26._20_4_ * fVar132;
  auVar257._24_4_ = auVar28._24_4_ * fVar240 + fVar246 * auVar25._24_4_ + auVar26._24_4_ * fVar218;
  auVar257._28_4_ = 0;
  auVar237._0_4_ = fVar93 * auVar29._0_4_ + fVar378 * auVar30._0_4_ + fVar137 * auVar31._0_4_;
  auVar237._4_4_ = fVar133 * auVar29._4_4_ + fVar245 * auVar30._4_4_ + fVar132 * auVar31._4_4_;
  auVar237._8_4_ = fVar240 * auVar29._8_4_ + fVar246 * auVar30._8_4_ + fVar218 * auVar31._8_4_;
  auVar237._12_4_ = fVar243 * auVar29._12_4_ + fVar247 * auVar30._12_4_ + fVar242 * auVar31._12_4_;
  auVar237._16_4_ = fVar93 * auVar29._16_4_ + fVar378 * auVar30._16_4_ + fVar137 * auVar31._16_4_;
  auVar237._20_4_ = fVar133 * auVar29._20_4_ + fVar245 * auVar30._20_4_ + fVar132 * auVar31._20_4_;
  auVar237._24_4_ = fVar240 * auVar29._24_4_ + fVar246 * auVar30._24_4_ + fVar218 * auVar31._24_4_;
  auVar237._28_4_ = fVar242 + 0.0 + 0.0;
  auVar110 = vshufps_avx(_local_720,_local_720,0x55);
  auVar223 = vshufps_avx(_local_720,_local_720,0xaa);
  fVar137 = auVar223._0_4_;
  fVar132 = auVar223._4_4_;
  fVar218 = auVar223._8_4_;
  fVar242 = auVar223._12_4_;
  fVar93 = auVar110._0_4_;
  fVar133 = auVar110._4_4_;
  fVar240 = auVar110._8_4_;
  fVar243 = auVar110._12_4_;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar84 * 7 + 6);
  auVar110 = vpmovsxwd_avx(auVar110);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar84 * 7 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar223);
  fVar378 = auVar24._28_4_ + 0.0;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar84 * 0xb + 6);
  auVar197 = vpmovsxwd_avx(auVar197);
  auVar303._8_8_ = 0;
  auVar303._0_8_ = *(ulong *)(prim + uVar84 * 0xb + 0xe);
  auVar303 = vpmovsxwd_avx(auVar303);
  auVar269 = vshufps_avx(_local_720,_local_720,0);
  fVar245 = auVar269._0_4_;
  fVar246 = auVar269._4_4_;
  fVar260 = auVar269._8_4_;
  fVar261 = auVar269._12_4_;
  auVar164._0_4_ = fVar245 * auVar27._0_4_ + auVar24._0_4_ * fVar137 + auVar122._0_4_ * fVar93;
  auVar164._4_4_ = fVar246 * auVar27._4_4_ + auVar24._4_4_ * fVar132 + auVar122._4_4_ * fVar133;
  auVar164._8_4_ = fVar260 * auVar27._8_4_ + auVar24._8_4_ * fVar218 + auVar122._8_4_ * fVar240;
  auVar164._12_4_ = fVar261 * auVar27._12_4_ + auVar24._12_4_ * fVar242 + auVar122._12_4_ * fVar243;
  auVar164._16_4_ = fVar245 * auVar27._16_4_ + auVar24._16_4_ * fVar137 + auVar122._16_4_ * fVar93;
  auVar164._20_4_ = fVar246 * auVar27._20_4_ + auVar24._20_4_ * fVar132 + auVar122._20_4_ * fVar133;
  auVar164._24_4_ = fVar260 * auVar27._24_4_ + auVar24._24_4_ * fVar218 + auVar122._24_4_ * fVar240;
  auVar164._28_4_ = auVar31._28_4_ + fVar247 + fVar242;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *(ulong *)(prim + uVar84 * 9 + 6);
  auVar269 = vpmovsxwd_avx(auVar269);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar84 * 9 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar32);
  auVar215._0_4_ = auVar25._0_4_ * fVar93 + auVar26._0_4_ * fVar137 + fVar245 * auVar28._0_4_;
  auVar215._4_4_ = auVar25._4_4_ * fVar133 + auVar26._4_4_ * fVar132 + fVar246 * auVar28._4_4_;
  auVar215._8_4_ = auVar25._8_4_ * fVar240 + auVar26._8_4_ * fVar218 + fVar260 * auVar28._8_4_;
  auVar215._12_4_ = auVar25._12_4_ * fVar243 + auVar26._12_4_ * fVar242 + fVar261 * auVar28._12_4_;
  auVar215._16_4_ = auVar25._16_4_ * fVar93 + auVar26._16_4_ * fVar137 + fVar245 * auVar28._16_4_;
  auVar215._20_4_ = auVar25._20_4_ * fVar133 + auVar26._20_4_ * fVar132 + fVar246 * auVar28._20_4_;
  auVar215._24_4_ = auVar25._24_4_ * fVar240 + auVar26._24_4_ * fVar218 + fVar260 * auVar28._24_4_;
  auVar215._28_4_ = fVar378 + 0.0;
  auVar383._8_4_ = 0x7fffffff;
  auVar383._0_8_ = 0x7fffffff7fffffff;
  auVar383._12_4_ = 0x7fffffff;
  auVar383._16_4_ = 0x7fffffff;
  auVar383._20_4_ = 0x7fffffff;
  auVar383._24_4_ = 0x7fffffff;
  auVar383._28_4_ = 0x7fffffff;
  auVar198._0_4_ = fVar245 * auVar29._0_4_ + fVar93 * auVar30._0_4_ + fVar137 * auVar31._0_4_;
  auVar198._4_4_ = fVar246 * auVar29._4_4_ + fVar133 * auVar30._4_4_ + fVar132 * auVar31._4_4_;
  auVar198._8_4_ = fVar260 * auVar29._8_4_ + fVar240 * auVar30._8_4_ + fVar218 * auVar31._8_4_;
  auVar198._12_4_ = fVar261 * auVar29._12_4_ + fVar243 * auVar30._12_4_ + fVar242 * auVar31._12_4_;
  auVar198._16_4_ = fVar245 * auVar29._16_4_ + fVar93 * auVar30._16_4_ + fVar137 * auVar31._16_4_;
  auVar198._20_4_ = fVar246 * auVar29._20_4_ + fVar133 * auVar30._20_4_ + fVar132 * auVar31._20_4_;
  auVar198._24_4_ = fVar260 * auVar29._24_4_ + fVar240 * auVar30._24_4_ + fVar218 * auVar31._24_4_;
  auVar198._28_4_ = fVar378 + auVar30._28_4_ + auVar31._28_4_;
  auVar122 = vandps_avx(auVar383,auVar276);
  auVar395._8_4_ = 0x219392ef;
  auVar395._0_8_ = 0x219392ef219392ef;
  auVar395._12_4_ = 0x219392ef;
  auVar395._16_4_ = 0x219392ef;
  auVar395._20_4_ = 0x219392ef;
  auVar395._24_4_ = 0x219392ef;
  auVar395._28_4_ = 0x219392ef;
  auVar122 = vcmpps_avx(auVar122,auVar395,1);
  auVar24 = vblendvps_avx(auVar276,auVar395,auVar122);
  auVar122 = vandps_avx(auVar383,auVar257);
  auVar122 = vcmpps_avx(auVar122,auVar395,1);
  auVar25 = vblendvps_avx(auVar257,auVar395,auVar122);
  auVar122 = vandps_avx(auVar383,auVar237);
  auVar122 = vcmpps_avx(auVar122,auVar395,1);
  auVar26 = vrcpps_avx(auVar24);
  auVar122 = vblendvps_avx(auVar237,auVar395,auVar122);
  auVar396._8_4_ = 0x3f800000;
  auVar396._0_8_ = 0x3f8000003f800000;
  auVar396._12_4_ = 0x3f800000;
  auVar396._16_4_ = 0x3f800000;
  auVar396._20_4_ = 0x3f800000;
  auVar396._24_4_ = 0x3f800000;
  auVar396._28_4_ = 0x3f800000;
  fVar218 = auVar26._0_4_;
  fVar240 = auVar26._4_4_;
  auVar27._4_4_ = fVar240 * auVar24._4_4_;
  auVar27._0_4_ = fVar218 * auVar24._0_4_;
  fVar242 = auVar26._8_4_;
  auVar27._8_4_ = fVar242 * auVar24._8_4_;
  fVar243 = auVar26._12_4_;
  auVar27._12_4_ = fVar243 * auVar24._12_4_;
  fVar378 = auVar26._16_4_;
  auVar27._16_4_ = fVar378 * auVar24._16_4_;
  fVar245 = auVar26._20_4_;
  auVar27._20_4_ = fVar245 * auVar24._20_4_;
  fVar246 = auVar26._24_4_;
  auVar27._24_4_ = fVar246 * auVar24._24_4_;
  auVar27._28_4_ = auVar237._28_4_;
  auVar28 = vsubps_avx(auVar396,auVar27);
  fVar218 = fVar218 + fVar218 * auVar28._0_4_;
  fVar240 = fVar240 + fVar240 * auVar28._4_4_;
  fVar242 = fVar242 + fVar242 * auVar28._8_4_;
  fVar243 = fVar243 + fVar243 * auVar28._12_4_;
  fVar378 = fVar378 + fVar378 * auVar28._16_4_;
  fVar245 = fVar245 + fVar245 * auVar28._20_4_;
  fVar246 = fVar246 + fVar246 * auVar28._24_4_;
  auVar27 = vrcpps_avx(auVar25);
  fVar247 = auVar27._0_4_;
  fVar260 = auVar27._4_4_;
  auVar24._4_4_ = fVar260 * auVar25._4_4_;
  auVar24._0_4_ = fVar247 * auVar25._0_4_;
  fVar261 = auVar27._8_4_;
  auVar24._8_4_ = fVar261 * auVar25._8_4_;
  fVar262 = auVar27._12_4_;
  auVar24._12_4_ = fVar262 * auVar25._12_4_;
  fVar263 = auVar27._16_4_;
  auVar24._16_4_ = fVar263 * auVar25._16_4_;
  fVar264 = auVar27._20_4_;
  auVar24._20_4_ = fVar264 * auVar25._20_4_;
  fVar265 = auVar27._24_4_;
  auVar24._24_4_ = fVar265 * auVar25._24_4_;
  auVar24._28_4_ = auVar25._28_4_;
  auVar25 = vsubps_avx(auVar396,auVar24);
  auVar24 = vrcpps_avx(auVar122);
  fVar247 = fVar247 + fVar247 * auVar25._0_4_;
  fVar260 = fVar260 + fVar260 * auVar25._4_4_;
  fVar261 = fVar261 + fVar261 * auVar25._8_4_;
  fVar262 = fVar262 + fVar262 * auVar25._12_4_;
  fVar263 = fVar263 + fVar263 * auVar25._16_4_;
  fVar264 = fVar264 + fVar264 * auVar25._20_4_;
  fVar265 = fVar265 + fVar265 * auVar25._24_4_;
  fVar267 = auVar24._0_4_;
  fVar278 = auVar24._4_4_;
  auVar29._4_4_ = fVar278 * auVar122._4_4_;
  auVar29._0_4_ = fVar267 * auVar122._0_4_;
  fVar279 = auVar24._8_4_;
  auVar29._8_4_ = fVar279 * auVar122._8_4_;
  fVar280 = auVar24._12_4_;
  auVar29._12_4_ = fVar280 * auVar122._12_4_;
  fVar281 = auVar24._16_4_;
  auVar29._16_4_ = fVar281 * auVar122._16_4_;
  fVar283 = auVar24._20_4_;
  auVar29._20_4_ = fVar283 * auVar122._20_4_;
  fVar284 = auVar24._24_4_;
  auVar29._24_4_ = fVar284 * auVar122._24_4_;
  auVar29._28_4_ = auVar27._28_4_;
  auVar122 = vsubps_avx(auVar396,auVar29);
  fVar267 = fVar267 + fVar267 * auVar122._0_4_;
  fVar278 = fVar278 + fVar278 * auVar122._4_4_;
  fVar279 = fVar279 + fVar279 * auVar122._8_4_;
  fVar280 = fVar280 + fVar280 * auVar122._12_4_;
  fVar281 = fVar281 + fVar281 * auVar122._16_4_;
  fVar283 = fVar283 + fVar283 * auVar122._20_4_;
  fVar284 = fVar284 + fVar284 * auVar122._24_4_;
  auVar325._16_16_ = auVar223;
  auVar325._0_16_ = auVar110;
  auVar354._16_16_ = auVar303;
  auVar354._0_16_ = auVar197;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar84 * 0xd + 6);
  auVar110 = vpmovsxwd_avx(auVar158);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar84 * 0xd + 0xe);
  auVar223 = vpmovsxwd_avx(auVar146);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar84 * 0x12 + 6);
  auVar197 = vpmovsxwd_avx(auVar183);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar84 * 0x12 + 0xe);
  auVar303 = vpmovsxwd_avx(auVar147);
  auVar158 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                          *(float *)(prim + lVar87 + 0x16)) *
                                         *(float *)(prim + lVar87 + 0x1a))),0);
  auVar122 = vcvtdq2ps_avx(auVar325);
  auVar24 = vcvtdq2ps_avx(auVar354);
  auVar24 = vsubps_avx(auVar24,auVar122);
  fVar137 = auVar158._0_4_;
  fVar93 = auVar158._4_4_;
  fVar132 = auVar158._8_4_;
  fVar133 = auVar158._12_4_;
  auVar326._0_4_ = auVar122._0_4_ + auVar24._0_4_ * fVar137;
  auVar326._4_4_ = auVar122._4_4_ + auVar24._4_4_ * fVar93;
  auVar326._8_4_ = auVar122._8_4_ + auVar24._8_4_ * fVar132;
  auVar326._12_4_ = auVar122._12_4_ + auVar24._12_4_ * fVar133;
  auVar326._16_4_ = auVar122._16_4_ + auVar24._16_4_ * fVar137;
  auVar326._20_4_ = auVar122._20_4_ + auVar24._20_4_ * fVar93;
  auVar326._24_4_ = auVar122._24_4_ + auVar24._24_4_ * fVar132;
  auVar326._28_4_ = auVar122._28_4_ + auVar24._28_4_;
  auVar294._16_16_ = auVar32;
  auVar294._0_16_ = auVar269;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *(ulong *)(prim + uVar84 * 0x16 + 6);
  auVar269 = vpmovsxwd_avx(auVar282);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar84 * 0x16 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar33);
  auVar122 = vcvtdq2ps_avx(auVar294);
  auVar368._16_16_ = auVar223;
  auVar368._0_16_ = auVar110;
  auVar24 = vcvtdq2ps_avx(auVar368);
  auVar24 = vsubps_avx(auVar24,auVar122);
  auVar295._0_4_ = auVar24._0_4_ * fVar137 + auVar122._0_4_;
  auVar295._4_4_ = auVar24._4_4_ * fVar93 + auVar122._4_4_;
  auVar295._8_4_ = auVar24._8_4_ * fVar132 + auVar122._8_4_;
  auVar295._12_4_ = auVar24._12_4_ * fVar133 + auVar122._12_4_;
  auVar295._16_4_ = auVar24._16_4_ * fVar137 + auVar122._16_4_;
  auVar295._20_4_ = auVar24._20_4_ * fVar93 + auVar122._20_4_;
  auVar295._24_4_ = auVar24._24_4_ * fVar132 + auVar122._24_4_;
  auVar295._28_4_ = auVar24._28_4_ + auVar122._28_4_;
  auVar344._16_16_ = auVar303;
  auVar344._0_16_ = auVar197;
  auVar122 = vcvtdq2ps_avx(auVar344);
  auVar309._16_16_ = auVar32;
  auVar309._0_16_ = auVar269;
  auVar24 = vcvtdq2ps_avx(auVar309);
  auVar24 = vsubps_avx(auVar24,auVar122);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar84 * 0x14 + 6);
  auVar110 = vpmovsxwd_avx(auVar34);
  auVar310._0_4_ = auVar122._0_4_ + auVar24._0_4_ * fVar137;
  auVar310._4_4_ = auVar122._4_4_ + auVar24._4_4_ * fVar93;
  auVar310._8_4_ = auVar122._8_4_ + auVar24._8_4_ * fVar132;
  auVar310._12_4_ = auVar122._12_4_ + auVar24._12_4_ * fVar133;
  auVar310._16_4_ = auVar122._16_4_ + auVar24._16_4_ * fVar137;
  auVar310._20_4_ = auVar122._20_4_ + auVar24._20_4_ * fVar93;
  auVar310._24_4_ = auVar122._24_4_ + auVar24._24_4_ * fVar132;
  auVar310._28_4_ = auVar122._28_4_ + auVar24._28_4_;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = *(ulong *)(prim + uVar84 * 0x14 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar388);
  auVar345._16_16_ = auVar223;
  auVar345._0_16_ = auVar110;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar84 * 0x18 + 6);
  auVar110 = vpmovsxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar84 * 0x18 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar7);
  auVar122 = vcvtdq2ps_avx(auVar345);
  auVar355._16_16_ = auVar223;
  auVar355._0_16_ = auVar110;
  auVar24 = vcvtdq2ps_avx(auVar355);
  auVar24 = vsubps_avx(auVar24,auVar122);
  auVar346._0_4_ = auVar122._0_4_ + auVar24._0_4_ * fVar137;
  auVar346._4_4_ = auVar122._4_4_ + auVar24._4_4_ * fVar93;
  auVar346._8_4_ = auVar122._8_4_ + auVar24._8_4_ * fVar132;
  auVar346._12_4_ = auVar122._12_4_ + auVar24._12_4_ * fVar133;
  auVar346._16_4_ = auVar122._16_4_ + auVar24._16_4_ * fVar137;
  auVar346._20_4_ = auVar122._20_4_ + auVar24._20_4_ * fVar93;
  auVar346._24_4_ = auVar122._24_4_ + auVar24._24_4_ * fVar132;
  auVar346._28_4_ = auVar122._28_4_ + auVar24._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar84 * 0x1d + 6);
  auVar110 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar84 * 0x1d + 0xe);
  auVar223 = vpmovsxwd_avx(auVar9);
  auVar356._16_16_ = auVar223;
  auVar356._0_16_ = auVar110;
  auVar122 = vcvtdq2ps_avx(auVar356);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar84 * 0x21 + 6);
  auVar110 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar84 * 0x21 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar11);
  auVar369._16_16_ = auVar223;
  auVar369._0_16_ = auVar110;
  auVar24 = vcvtdq2ps_avx(auVar369);
  auVar24 = vsubps_avx(auVar24,auVar122);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar84 * 0x1f + 6);
  auVar110 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar84 * 0x1f + 0xe);
  auVar223 = vpmovsxwd_avx(auVar13);
  auVar357._0_4_ = auVar122._0_4_ + auVar24._0_4_ * fVar137;
  auVar357._4_4_ = auVar122._4_4_ + auVar24._4_4_ * fVar93;
  auVar357._8_4_ = auVar122._8_4_ + auVar24._8_4_ * fVar132;
  auVar357._12_4_ = auVar122._12_4_ + auVar24._12_4_ * fVar133;
  auVar357._16_4_ = auVar122._16_4_ + auVar24._16_4_ * fVar137;
  auVar357._20_4_ = auVar122._20_4_ + auVar24._20_4_ * fVar93;
  auVar357._24_4_ = auVar122._24_4_ + auVar24._24_4_ * fVar132;
  auVar357._28_4_ = auVar122._28_4_ + auVar24._28_4_;
  auVar370._16_16_ = auVar223;
  auVar370._0_16_ = auVar110;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar84 * 0x23 + 6);
  auVar110 = vpmovsxwd_avx(auVar14);
  auVar122 = vcvtdq2ps_avx(auVar370);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar84 * 0x23 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar15);
  auVar384._16_16_ = auVar223;
  auVar384._0_16_ = auVar110;
  auVar24 = vcvtdq2ps_avx(auVar384);
  auVar24 = vsubps_avx(auVar24,auVar122);
  auVar371._0_4_ = auVar122._0_4_ + auVar24._0_4_ * fVar137;
  auVar371._4_4_ = auVar122._4_4_ + auVar24._4_4_ * fVar93;
  auVar371._8_4_ = auVar122._8_4_ + auVar24._8_4_ * fVar132;
  auVar371._12_4_ = auVar122._12_4_ + auVar24._12_4_ * fVar133;
  auVar371._16_4_ = auVar122._16_4_ + auVar24._16_4_ * fVar137;
  auVar371._20_4_ = auVar122._20_4_ + auVar24._20_4_ * fVar93;
  auVar371._24_4_ = auVar122._24_4_ + auVar24._24_4_ * fVar132;
  auVar371._28_4_ = auVar122._28_4_ + fVar133;
  auVar122 = vsubps_avx(auVar326,auVar164);
  auVar94._0_4_ = fVar218 * auVar122._0_4_;
  auVar94._4_4_ = fVar240 * auVar122._4_4_;
  auVar94._8_4_ = fVar242 * auVar122._8_4_;
  auVar94._12_4_ = fVar243 * auVar122._12_4_;
  auVar30._16_4_ = fVar378 * auVar122._16_4_;
  auVar30._0_16_ = auVar94;
  auVar30._20_4_ = fVar245 * auVar122._20_4_;
  auVar30._24_4_ = fVar246 * auVar122._24_4_;
  auVar30._28_4_ = auVar122._28_4_;
  auVar122 = vsubps_avx(auVar295,auVar164);
  auVar219._0_4_ = fVar218 * auVar122._0_4_;
  auVar219._4_4_ = fVar240 * auVar122._4_4_;
  auVar219._8_4_ = fVar242 * auVar122._8_4_;
  auVar219._12_4_ = fVar243 * auVar122._12_4_;
  auVar31._16_4_ = fVar378 * auVar122._16_4_;
  auVar31._0_16_ = auVar219;
  auVar31._20_4_ = fVar245 * auVar122._20_4_;
  auVar31._24_4_ = fVar246 * auVar122._24_4_;
  auVar31._28_4_ = auVar26._28_4_ + auVar28._28_4_;
  auVar122 = vsubps_avx(auVar310,auVar215);
  auVar138._0_4_ = fVar247 * auVar122._0_4_;
  auVar138._4_4_ = fVar260 * auVar122._4_4_;
  auVar138._8_4_ = fVar261 * auVar122._8_4_;
  auVar138._12_4_ = fVar262 * auVar122._12_4_;
  auVar26._16_4_ = fVar263 * auVar122._16_4_;
  auVar26._0_16_ = auVar138;
  auVar26._20_4_ = fVar264 * auVar122._20_4_;
  auVar26._24_4_ = fVar265 * auVar122._24_4_;
  auVar26._28_4_ = auVar122._28_4_;
  auVar122 = vsubps_avx(auVar346,auVar215);
  auVar248._0_4_ = fVar247 * auVar122._0_4_;
  auVar248._4_4_ = fVar260 * auVar122._4_4_;
  auVar248._8_4_ = fVar261 * auVar122._8_4_;
  auVar248._12_4_ = fVar262 * auVar122._12_4_;
  auVar28._16_4_ = fVar263 * auVar122._16_4_;
  auVar28._0_16_ = auVar248;
  auVar28._20_4_ = fVar264 * auVar122._20_4_;
  auVar28._24_4_ = fVar265 * auVar122._24_4_;
  auVar28._28_4_ = auVar27._28_4_ + auVar25._28_4_;
  auVar122 = vsubps_avx(auVar357,auVar198);
  auVar203._0_4_ = fVar267 * auVar122._0_4_;
  auVar203._4_4_ = fVar278 * auVar122._4_4_;
  auVar203._8_4_ = fVar279 * auVar122._8_4_;
  auVar203._12_4_ = fVar280 * auVar122._12_4_;
  auVar25._16_4_ = fVar281 * auVar122._16_4_;
  auVar25._0_16_ = auVar203;
  auVar25._20_4_ = fVar283 * auVar122._20_4_;
  auVar25._24_4_ = fVar284 * auVar122._24_4_;
  auVar25._28_4_ = auVar122._28_4_;
  auVar122 = vsubps_avx(auVar371,auVar198);
  auVar172._0_4_ = fVar267 * auVar122._0_4_;
  auVar172._4_4_ = fVar278 * auVar122._4_4_;
  auVar172._8_4_ = fVar279 * auVar122._8_4_;
  auVar172._12_4_ = fVar280 * auVar122._12_4_;
  auVar35._16_4_ = fVar281 * auVar122._16_4_;
  auVar35._0_16_ = auVar172;
  auVar35._20_4_ = fVar283 * auVar122._20_4_;
  auVar35._24_4_ = fVar284 * auVar122._24_4_;
  auVar35._28_4_ = auVar122._28_4_;
  auVar110 = vpminsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar223 = vpminsd_avx(auVar94,auVar219);
  auVar347._16_16_ = auVar110;
  auVar347._0_16_ = auVar223;
  auVar110 = vpminsd_avx(auVar26._16_16_,auVar28._16_16_);
  auVar223 = vpminsd_avx(auVar138,auVar248);
  auVar358._16_16_ = auVar110;
  auVar358._0_16_ = auVar223;
  auVar122 = vmaxps_avx(auVar347,auVar358);
  auVar110 = vpminsd_avx(auVar25._16_16_,auVar35._16_16_);
  auVar223 = vpminsd_avx(auVar203,auVar172);
  auVar385._16_16_ = auVar110;
  auVar385._0_16_ = auVar223;
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar397._4_4_ = uVar92;
  auVar397._0_4_ = uVar92;
  auVar397._8_4_ = uVar92;
  auVar397._12_4_ = uVar92;
  auVar397._16_4_ = uVar92;
  auVar397._20_4_ = uVar92;
  auVar397._24_4_ = uVar92;
  auVar397._28_4_ = uVar92;
  auVar24 = vmaxps_avx(auVar385,auVar397);
  auVar122 = vmaxps_avx(auVar122,auVar24);
  local_300._4_4_ = auVar122._4_4_ * 0.99999964;
  local_300._0_4_ = auVar122._0_4_ * 0.99999964;
  local_300._8_4_ = auVar122._8_4_ * 0.99999964;
  local_300._12_4_ = auVar122._12_4_ * 0.99999964;
  local_300._16_4_ = auVar122._16_4_ * 0.99999964;
  local_300._20_4_ = auVar122._20_4_ * 0.99999964;
  local_300._24_4_ = auVar122._24_4_ * 0.99999964;
  local_300._28_4_ = auVar122._28_4_;
  auVar110 = vpmaxsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar223 = vpmaxsd_avx(auVar94,auVar219);
  auVar122._16_16_ = auVar110;
  auVar122._0_16_ = auVar223;
  auVar110 = vpmaxsd_avx(auVar26._16_16_,auVar28._16_16_);
  auVar223 = vpmaxsd_avx(auVar138,auVar248);
  auVar165._16_16_ = auVar110;
  auVar165._0_16_ = auVar223;
  auVar122 = vminps_avx(auVar122,auVar165);
  auVar110 = vpmaxsd_avx(auVar25._16_16_,auVar35._16_16_);
  auVar223 = vpmaxsd_avx(auVar203,auVar172);
  auVar166._16_16_ = auVar110;
  auVar166._0_16_ = auVar223;
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar199._4_4_ = uVar92;
  auVar199._0_4_ = uVar92;
  auVar199._8_4_ = uVar92;
  auVar199._12_4_ = uVar92;
  auVar199._16_4_ = uVar92;
  auVar199._20_4_ = uVar92;
  auVar199._24_4_ = uVar92;
  auVar199._28_4_ = uVar92;
  auVar24 = vminps_avx(auVar166,auVar199);
  auVar122 = vminps_avx(auVar122,auVar24);
  auVar36._4_4_ = auVar122._4_4_ * 1.0000004;
  auVar36._0_4_ = auVar122._0_4_ * 1.0000004;
  auVar36._8_4_ = auVar122._8_4_ * 1.0000004;
  auVar36._12_4_ = auVar122._12_4_ * 1.0000004;
  auVar36._16_4_ = auVar122._16_4_ * 1.0000004;
  auVar36._20_4_ = auVar122._20_4_ * 1.0000004;
  auVar36._24_4_ = auVar122._24_4_ * 1.0000004;
  auVar36._28_4_ = auVar122._28_4_;
  auVar122 = vcmpps_avx(local_300,auVar36,2);
  auVar110 = vpshufd_avx(ZEXT116((byte)PVar16),0);
  auVar167._16_16_ = auVar110;
  auVar167._0_16_ = auVar110;
  auVar24 = vcvtdq2ps_avx(auVar167);
  auVar24 = vcmpps_avx(_DAT_01f7b060,auVar24,1);
  auVar122 = vandps_avx(auVar122,auVar24);
  uVar92 = vmovmskps_avx(auVar122);
  uVar84 = CONCAT44((int)((ulong)prim >> 0x20),uVar92);
  auVar123._16_16_ = mm_lookupmask_ps._240_16_;
  auVar123._0_16_ = mm_lookupmask_ps._240_16_;
  uVar90 = 1 << ((byte)k & 0x1f);
  local_2e0 = vblendps_avx(auVar123,ZEXT832(0) << 0x20,0x80);
  auVar110 = (undefined1  [16])0x0;
LAB_00b5a143:
  if (uVar84 == 0) {
    return;
  }
  lVar87 = 0;
  if (uVar84 != 0) {
    for (; (uVar84 >> lVar87 & 1) == 0; lVar87 = lVar87 + 1) {
    }
  }
  uVar83 = *(uint *)(prim + 2);
  pGVar18 = (context->scene->geometries).items[uVar83].ptr;
  fVar137 = (pGVar18->time_range).lower;
  fVar137 = pGVar18->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar137) / ((pGVar18->time_range).upper - fVar137));
  auVar223 = vroundss_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),9);
  auVar223 = vminss_avx(auVar223,ZEXT416((uint)(pGVar18->fnumTimeSegments + -1.0)));
  auVar110 = vmaxss_avx(auVar110,auVar223);
  uVar17 = *(uint *)(prim + lVar87 * 4 + 6);
  uVar85 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                           (ulong)uVar17 *
                           pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar91 = (long)(int)auVar110._0_4_ * 0x38;
  lVar20 = *(long *)(_Var19 + lVar91);
  lVar21 = *(long *)(_Var19 + 0x10 + lVar91);
  pfVar3 = (float *)(lVar20 + lVar21 * uVar85);
  fVar93 = *pfVar3;
  fVar132 = pfVar3[1];
  fVar133 = pfVar3[2];
  fVar218 = pfVar3[3];
  lVar87 = uVar85 + 1;
  pfVar3 = (float *)(lVar20 + lVar21 * lVar87);
  fVar240 = *pfVar3;
  fVar242 = pfVar3[1];
  fVar243 = pfVar3[2];
  fVar378 = pfVar3[3];
  lVar1 = uVar85 + 2;
  pfVar3 = (float *)(lVar20 + lVar21 * lVar1);
  fVar245 = *pfVar3;
  fVar246 = pfVar3[1];
  fVar247 = pfVar3[2];
  fVar260 = pfVar3[3];
  lVar2 = uVar85 + 3;
  pfVar3 = (float *)(lVar20 + lVar21 * lVar2);
  fVar261 = *pfVar3;
  fVar262 = pfVar3[1];
  fVar263 = pfVar3[2];
  fVar264 = pfVar3[3];
  lVar20 = *(long *)&pGVar18[4].fnumTimeSegments;
  lVar21 = *(long *)(lVar20 + lVar91);
  lVar22 = *(long *)(lVar20 + 0x10 + lVar91);
  pfVar3 = (float *)(lVar21 + lVar22 * uVar85);
  fVar265 = *pfVar3;
  fVar267 = pfVar3[1];
  fVar278 = pfVar3[2];
  fVar279 = pfVar3[3];
  pfVar3 = (float *)(lVar21 + lVar22 * lVar87);
  fVar280 = *pfVar3;
  fVar281 = pfVar3[1];
  fVar283 = pfVar3[2];
  fVar284 = pfVar3[3];
  pfVar3 = (float *)(lVar21 + lVar22 * lVar1);
  fVar134 = *pfVar3;
  fVar135 = pfVar3[1];
  fVar136 = pfVar3[2];
  fVar217 = pfVar3[3];
  fVar137 = fVar137 - auVar110._0_4_;
  pfVar3 = (float *)(lVar21 + lVar22 * lVar2);
  fVar266 = *pfVar3;
  fVar241 = pfVar3[1];
  fVar297 = pfVar3[2];
  fVar244 = pfVar3[3];
  auVar95._0_4_ = fVar240 * 0.0 + fVar245 * 0.5 + fVar261 * 0.0;
  auVar95._4_4_ = fVar242 * 0.0 + fVar246 * 0.5 + fVar262 * 0.0;
  auVar95._8_4_ = fVar243 * 0.0 + fVar247 * 0.5 + fVar263 * 0.0;
  auVar95._12_4_ = fVar378 * 0.0 + fVar260 * 0.5 + fVar264 * 0.0;
  auVar173._0_4_ = fVar93 * 0.5;
  auVar173._4_4_ = fVar132 * 0.5;
  auVar173._8_4_ = fVar133 * 0.5;
  auVar173._12_4_ = fVar218 * 0.5;
  auVar146 = vsubps_avx(auVar95,auVar173);
  auVar96._0_4_ = fVar280 * 0.0 + fVar134 * 0.5 + fVar266 * 0.0;
  auVar96._4_4_ = fVar281 * 0.0 + fVar135 * 0.5 + fVar241 * 0.0;
  auVar96._8_4_ = fVar283 * 0.0 + fVar136 * 0.5 + fVar297 * 0.0;
  auVar96._12_4_ = fVar284 * 0.0 + fVar217 * 0.5 + fVar244 * 0.0;
  auVar387._0_4_ = fVar265 * 0.5;
  auVar387._4_4_ = fVar267 * 0.5;
  auVar387._8_4_ = fVar278 * 0.5;
  auVar387._12_4_ = fVar279 * 0.5;
  auVar303 = vsubps_avx(auVar96,auVar387);
  local_720._0_4_ = fVar93 * -0.0 + fVar245 * 0.0 + fVar261 * -0.0 + fVar240;
  local_720._4_4_ = fVar132 * -0.0 + fVar246 * 0.0 + fVar262 * -0.0 + fVar242;
  fStack_718 = fVar133 * -0.0 + fVar247 * 0.0 + fVar263 * -0.0 + fVar243;
  fStack_714 = fVar218 * -0.0 + fVar260 * 0.0 + fVar264 * -0.0 + fVar378;
  local_6d0._0_4_ = fVar93 * -0.0 + fVar240 * 0.0 + fVar245 + fVar261 * -0.0;
  local_6d0._4_4_ = fVar132 * -0.0 + fVar242 * 0.0 + fVar246 + fVar262 * -0.0;
  fStack_6c8 = fVar133 * -0.0 + fVar243 * 0.0 + fVar247 + fVar263 * -0.0;
  fStack_6c4 = fVar218 * -0.0 + fVar378 * 0.0 + fVar260 + fVar264 * -0.0;
  auVar298._0_4_ = fVar245 * 0.0 + fVar261 * 0.5;
  auVar298._4_4_ = fVar246 * 0.0 + fVar262 * 0.5;
  auVar298._8_4_ = fVar247 * 0.0 + fVar263 * 0.5;
  auVar298._12_4_ = fVar260 * 0.0 + fVar264 * 0.5;
  auVar220._0_4_ = fVar240 * 0.5;
  auVar220._4_4_ = fVar242 * 0.5;
  auVar220._8_4_ = fVar243 * 0.5;
  auVar220._12_4_ = fVar378 * 0.5;
  auVar110 = vsubps_avx(auVar298,auVar220);
  auVar400._0_4_ = fVar265 * -0.0 + fVar134 * 0.0 + fVar266 * -0.0 + fVar280;
  auVar400._4_4_ = fVar267 * -0.0 + fVar135 * 0.0 + fVar241 * -0.0 + fVar281;
  auVar400._8_4_ = fVar278 * -0.0 + fVar136 * 0.0 + fVar297 * -0.0 + fVar283;
  auVar400._12_4_ = fVar279 * -0.0 + fVar217 * 0.0 + fVar244 * -0.0 + fVar284;
  auVar318._0_4_ = fVar93 * 0.0 + auVar110._0_4_;
  auVar318._4_4_ = fVar132 * 0.0 + auVar110._4_4_;
  auVar318._8_4_ = fVar133 * 0.0 + auVar110._8_4_;
  auVar318._12_4_ = fVar218 * 0.0 + auVar110._12_4_;
  auVar204._0_4_ = fVar265 * -0.0 + fVar280 * 0.0 + fVar134 + fVar266 * -0.0;
  auVar204._4_4_ = fVar267 * -0.0 + fVar281 * 0.0 + fVar135 + fVar241 * -0.0;
  auVar204._8_4_ = fVar278 * -0.0 + fVar283 * 0.0 + fVar136 + fVar297 * -0.0;
  auVar204._12_4_ = fVar279 * -0.0 + fVar284 * 0.0 + fVar217 + fVar244 * -0.0;
  auVar221._0_4_ = fVar134 * 0.0 + fVar266 * 0.5;
  auVar221._4_4_ = fVar135 * 0.0 + fVar241 * 0.5;
  auVar221._8_4_ = fVar136 * 0.0 + fVar297 * 0.5;
  auVar221._12_4_ = fVar217 * 0.0 + fVar244 * 0.5;
  auVar285._0_4_ = fVar280 * 0.5;
  auVar285._4_4_ = fVar281 * 0.5;
  auVar285._8_4_ = fVar283 * 0.5;
  auVar285._12_4_ = fVar284 * 0.5;
  auVar110 = vsubps_avx(auVar221,auVar285);
  auVar222._0_4_ = fVar265 * 0.0 + auVar110._0_4_;
  auVar222._4_4_ = fVar267 * 0.0 + auVar110._4_4_;
  auVar222._8_4_ = fVar278 * 0.0 + auVar110._8_4_;
  auVar222._12_4_ = fVar279 * 0.0 + auVar110._12_4_;
  auVar110 = vshufps_avx(auVar146,auVar146,0xc9);
  auVar223 = vshufps_avx(auVar400,auVar400,0xc9);
  fVar312 = auVar146._0_4_;
  auVar249._0_4_ = fVar312 * auVar223._0_4_;
  fVar360 = auVar146._4_4_;
  auVar249._4_4_ = fVar360 * auVar223._4_4_;
  fVar313 = auVar146._8_4_;
  auVar249._8_4_ = fVar313 * auVar223._8_4_;
  fVar372 = auVar146._12_4_;
  auVar249._12_4_ = fVar372 * auVar223._12_4_;
  auVar299._0_4_ = auVar400._0_4_ * auVar110._0_4_;
  auVar299._4_4_ = auVar400._4_4_ * auVar110._4_4_;
  auVar299._8_4_ = auVar400._8_4_ * auVar110._8_4_;
  auVar299._12_4_ = auVar400._12_4_ * auVar110._12_4_;
  auVar223 = vsubps_avx(auVar299,auVar249);
  auVar197 = vshufps_avx(auVar223,auVar223,0xc9);
  auVar223 = vshufps_avx(auVar303,auVar303,0xc9);
  auVar300._0_4_ = auVar223._0_4_ * fVar312;
  auVar300._4_4_ = auVar223._4_4_ * fVar360;
  auVar300._8_4_ = auVar223._8_4_ * fVar313;
  auVar300._12_4_ = auVar223._12_4_ * fVar372;
  auVar97._0_4_ = auVar110._0_4_ * auVar303._0_4_;
  auVar97._4_4_ = auVar110._4_4_ * auVar303._4_4_;
  auVar97._8_4_ = auVar110._8_4_ * auVar303._8_4_;
  auVar97._12_4_ = auVar110._12_4_ * auVar303._12_4_;
  auVar110 = vsubps_avx(auVar97,auVar300);
  auVar303 = vshufps_avx(auVar110,auVar110,0xc9);
  auVar110 = vshufps_avx(auVar318,auVar318,0xc9);
  auVar223 = vshufps_avx(auVar204,auVar204,0xc9);
  auVar301._0_4_ = auVar318._0_4_ * auVar223._0_4_;
  auVar301._4_4_ = auVar318._4_4_ * auVar223._4_4_;
  auVar301._8_4_ = auVar318._8_4_ * auVar223._8_4_;
  auVar301._12_4_ = auVar318._12_4_ * auVar223._12_4_;
  auVar205._0_4_ = auVar110._0_4_ * auVar204._0_4_;
  auVar205._4_4_ = auVar110._4_4_ * auVar204._4_4_;
  auVar205._8_4_ = auVar110._8_4_ * auVar204._8_4_;
  auVar205._12_4_ = auVar110._12_4_ * auVar204._12_4_;
  auVar223 = vsubps_avx(auVar205,auVar301);
  auVar269 = vshufps_avx(auVar223,auVar223,0xc9);
  auVar223 = vshufps_avx(auVar222,auVar222,0xc9);
  auVar302._0_4_ = auVar318._0_4_ * auVar223._0_4_;
  auVar302._4_4_ = auVar318._4_4_ * auVar223._4_4_;
  auVar302._8_4_ = auVar318._8_4_ * auVar223._8_4_;
  auVar302._12_4_ = auVar318._12_4_ * auVar223._12_4_;
  auVar98._0_4_ = auVar110._0_4_ * auVar222._0_4_;
  auVar98._4_4_ = auVar110._4_4_ * auVar222._4_4_;
  auVar98._8_4_ = auVar110._8_4_ * auVar222._8_4_;
  auVar98._12_4_ = auVar110._12_4_ * auVar222._12_4_;
  auVar110 = vdpps_avx(auVar197,auVar197,0x7f);
  auVar223 = vsubps_avx(auVar98,auVar302);
  auVar32 = vshufps_avx(auVar223,auVar223,0xc9);
  fVar132 = auVar110._0_4_;
  auVar147 = ZEXT416((uint)fVar132);
  auVar223 = vrsqrtss_avx(auVar147,auVar147);
  fVar93 = auVar223._0_4_;
  auVar223 = ZEXT416((uint)(fVar93 * 1.5 - fVar132 * 0.5 * fVar93 * fVar93 * fVar93));
  auVar158 = vshufps_avx(auVar223,auVar223,0);
  fVar280 = auVar158._0_4_ * auVar197._0_4_;
  fVar281 = auVar158._4_4_ * auVar197._4_4_;
  fVar283 = auVar158._8_4_ * auVar197._8_4_;
  fVar284 = auVar158._12_4_ * auVar197._12_4_;
  auVar223 = vdpps_avx(auVar197,auVar303,0x7f);
  auVar110 = vshufps_avx(auVar110,auVar110,0);
  auVar286._0_4_ = auVar110._0_4_ * auVar303._0_4_;
  auVar286._4_4_ = auVar110._4_4_ * auVar303._4_4_;
  auVar286._8_4_ = auVar110._8_4_ * auVar303._8_4_;
  auVar286._12_4_ = auVar110._12_4_ * auVar303._12_4_;
  auVar110 = vshufps_avx(auVar223,auVar223,0);
  auVar250._0_4_ = auVar110._0_4_ * auVar197._0_4_;
  auVar250._4_4_ = auVar110._4_4_ * auVar197._4_4_;
  auVar250._8_4_ = auVar110._8_4_ * auVar197._8_4_;
  auVar250._12_4_ = auVar110._12_4_ * auVar197._12_4_;
  auVar183 = vsubps_avx(auVar286,auVar250);
  auVar110 = vrcpss_avx(auVar147,auVar147);
  auVar110 = ZEXT416((uint)((2.0 - fVar132 * auVar110._0_4_) * auVar110._0_4_));
  auVar197 = vshufps_avx(auVar110,auVar110,0);
  auVar110 = vdpps_avx(auVar269,auVar269,0x7f);
  fVar134 = auVar110._0_4_;
  auVar303 = ZEXT416((uint)fVar134);
  auVar223 = vrsqrtss_avx(auVar303,auVar303);
  fVar265 = auVar223._0_4_;
  auVar223 = vdpps_avx(auVar269,auVar32,0x7f);
  auVar110 = vshufps_avx(auVar110,auVar110,0);
  auVar401._0_4_ = auVar110._0_4_ * auVar32._0_4_;
  auVar401._4_4_ = auVar110._4_4_ * auVar32._4_4_;
  auVar401._8_4_ = auVar110._8_4_ * auVar32._8_4_;
  auVar401._12_4_ = auVar110._12_4_ * auVar32._12_4_;
  lVar21 = *(long *)(_Var19 + 0x38 + lVar91);
  lVar22 = *(long *)(_Var19 + 0x48 + lVar91);
  pfVar3 = (float *)(lVar21 + lVar22 * uVar85);
  fVar93 = *pfVar3;
  fVar132 = pfVar3[1];
  fVar133 = pfVar3[2];
  fVar218 = pfVar3[3];
  pfVar3 = (float *)(lVar21 + lVar22 * lVar87);
  fVar240 = *pfVar3;
  fVar242 = pfVar3[1];
  fVar243 = pfVar3[2];
  fVar378 = pfVar3[3];
  pfVar3 = (float *)(lVar21 + lVar22 * lVar1);
  fVar245 = *pfVar3;
  fVar246 = pfVar3[1];
  fVar247 = pfVar3[2];
  fVar260 = pfVar3[3];
  auVar110 = vshufps_avx(auVar223,auVar223,0);
  auVar99._0_4_ = auVar110._0_4_ * auVar269._0_4_;
  auVar99._4_4_ = auVar110._4_4_ * auVar269._4_4_;
  auVar99._8_4_ = auVar110._8_4_ * auVar269._8_4_;
  auVar99._12_4_ = auVar110._12_4_ * auVar269._12_4_;
  auVar32 = vsubps_avx(auVar401,auVar99);
  pfVar3 = (float *)(lVar21 + lVar22 * lVar2);
  fVar261 = *pfVar3;
  fVar262 = pfVar3[1];
  fVar263 = pfVar3[2];
  fVar264 = pfVar3[3];
  lVar21 = *(long *)(lVar20 + 0x38 + lVar91);
  lVar20 = *(long *)(lVar20 + 0x48 + lVar91);
  auVar110 = ZEXT416((uint)(fVar265 * 1.5 - fVar134 * 0.5 * fVar265 * fVar265 * fVar265));
  auVar223 = vshufps_avx(auVar110,auVar110,0);
  fVar265 = auVar223._0_4_ * auVar269._0_4_;
  fVar267 = auVar223._4_4_ * auVar269._4_4_;
  fVar278 = auVar223._8_4_ * auVar269._8_4_;
  fVar279 = auVar223._12_4_ * auVar269._12_4_;
  auVar110 = vrcpss_avx(auVar303,auVar303);
  auVar110 = ZEXT416((uint)(auVar110._0_4_ * (2.0 - auVar110._0_4_ * fVar134)));
  auVar110 = vshufps_avx(auVar110,auVar110,0);
  auVar303 = vshufps_avx(_local_720,_local_720,0xff);
  auVar361._0_4_ = auVar303._0_4_ * fVar280;
  auVar361._4_4_ = auVar303._4_4_ * fVar281;
  auVar361._8_4_ = auVar303._8_4_ * fVar283;
  auVar361._12_4_ = auVar303._12_4_ * fVar284;
  auVar269 = vshufps_avx(auVar146,auVar146,0xff);
  auVar147 = vsubps_avx(_local_720,auVar361);
  auVar287._0_4_ =
       auVar269._0_4_ * fVar280 + auVar303._0_4_ * auVar158._0_4_ * auVar183._0_4_ * auVar197._0_4_;
  auVar287._4_4_ =
       auVar269._4_4_ * fVar281 + auVar303._4_4_ * auVar158._4_4_ * auVar183._4_4_ * auVar197._4_4_;
  auVar287._8_4_ =
       auVar269._8_4_ * fVar283 + auVar303._8_4_ * auVar158._8_4_ * auVar183._8_4_ * auVar197._8_4_;
  auVar287._12_4_ =
       auVar269._12_4_ * fVar284 +
       auVar303._12_4_ * auVar158._12_4_ * auVar183._12_4_ * auVar197._12_4_;
  auVar183 = vsubps_avx(auVar146,auVar287);
  local_720._0_4_ = auVar361._0_4_ + (float)local_720._0_4_;
  local_720._4_4_ = auVar361._4_4_ + (float)local_720._4_4_;
  fStack_718 = auVar361._8_4_ + fStack_718;
  fStack_714 = auVar361._12_4_ + fStack_714;
  auVar197 = vshufps_avx(_local_6d0,_local_6d0,0xff);
  auVar174._0_4_ = auVar197._0_4_ * fVar265;
  auVar174._4_4_ = auVar197._4_4_ * fVar267;
  auVar174._8_4_ = auVar197._8_4_ * fVar278;
  auVar174._12_4_ = auVar197._12_4_ * fVar279;
  auVar303 = vshufps_avx(auVar318,auVar318,0xff);
  auVar282 = vsubps_avx(_local_6d0,auVar174);
  auVar100._0_4_ =
       auVar303._0_4_ * fVar265 + auVar197._0_4_ * auVar223._0_4_ * auVar32._0_4_ * auVar110._0_4_;
  auVar100._4_4_ =
       auVar303._4_4_ * fVar267 + auVar197._4_4_ * auVar223._4_4_ * auVar32._4_4_ * auVar110._4_4_;
  auVar100._8_4_ =
       auVar303._8_4_ * fVar278 + auVar197._8_4_ * auVar223._8_4_ * auVar32._8_4_ * auVar110._8_4_;
  auVar100._12_4_ =
       auVar303._12_4_ * fVar279 +
       auVar197._12_4_ * auVar223._12_4_ * auVar32._12_4_ * auVar110._12_4_;
  auVar33 = vsubps_avx(auVar318,auVar100);
  local_6d0._0_4_ = (float)local_6d0._0_4_ + auVar174._0_4_;
  local_6d0._4_4_ = (float)local_6d0._4_4_ + auVar174._4_4_;
  fStack_6c8 = fStack_6c8 + auVar174._8_4_;
  fStack_6c4 = fStack_6c4 + auVar174._12_4_;
  auVar101._0_4_ = fVar240 * 0.0 + fVar245 * 0.5 + fVar261 * 0.0;
  auVar101._4_4_ = fVar242 * 0.0 + fVar246 * 0.5 + fVar262 * 0.0;
  auVar101._8_4_ = fVar243 * 0.0 + fVar247 * 0.5 + fVar263 * 0.0;
  auVar101._12_4_ = fVar378 * 0.0 + fVar260 * 0.5 + fVar264 * 0.0;
  auVar139._0_4_ = fVar93 * 0.5;
  auVar139._4_4_ = fVar132 * 0.5;
  auVar139._8_4_ = fVar133 * 0.5;
  auVar139._12_4_ = fVar218 * 0.5;
  auVar34 = vsubps_avx(auVar101,auVar139);
  pfVar3 = (float *)(lVar21 + lVar1 * lVar20);
  fVar265 = *pfVar3;
  fVar267 = pfVar3[1];
  fVar278 = pfVar3[2];
  fVar279 = pfVar3[3];
  auVar110 = *(undefined1 (*) [16])(lVar21 + lVar20 * lVar2);
  fVar266 = auVar110._0_4_;
  fVar241 = auVar110._4_4_;
  fVar297 = auVar110._8_4_;
  fVar244 = auVar110._12_4_;
  pfVar3 = (float *)(lVar21 + lVar87 * lVar20);
  fVar280 = *pfVar3;
  fVar281 = pfVar3[1];
  fVar283 = pfVar3[2];
  fVar284 = pfVar3[3];
  auVar268._0_4_ = fVar280 * 0.0 + fVar266 * 0.0 + fVar265 * 0.5;
  auVar268._4_4_ = fVar281 * 0.0 + fVar241 * 0.0 + fVar267 * 0.5;
  auVar268._8_4_ = fVar283 * 0.0 + fVar297 * 0.0 + fVar278 * 0.5;
  auVar268._12_4_ = fVar284 * 0.0 + fVar244 * 0.0 + fVar279 * 0.5;
  pfVar3 = (float *)(lVar21 + uVar85 * lVar20);
  fVar134 = *pfVar3;
  fVar135 = pfVar3[1];
  fVar136 = pfVar3[2];
  fVar217 = pfVar3[3];
  auVar304._0_4_ = fVar134 * 0.5;
  auVar304._4_4_ = fVar135 * 0.5;
  auVar304._8_4_ = fVar136 * 0.5;
  auVar304._12_4_ = fVar217 * 0.5;
  auVar223 = vsubps_avx(auVar268,auVar304);
  auVar305._0_4_ = fVar93 * -0.0 + fVar240 + fVar245 * 0.0 + fVar261 * -0.0;
  auVar305._4_4_ = fVar132 * -0.0 + fVar242 + fVar246 * 0.0 + fVar262 * -0.0;
  auVar305._8_4_ = fVar133 * -0.0 + fVar243 + fVar247 * 0.0 + fVar263 * -0.0;
  auVar305._12_4_ = fVar218 * -0.0 + fVar378 + fVar260 * 0.0 + fVar264 * -0.0;
  auVar288._0_4_ = fVar93 * -0.0 + fVar240 * 0.0 + fVar245 + fVar261 * -0.0;
  auVar288._4_4_ = fVar132 * -0.0 + fVar242 * 0.0 + fVar246 + fVar262 * -0.0;
  auVar288._8_4_ = fVar133 * -0.0 + fVar243 * 0.0 + fVar247 + fVar263 * -0.0;
  auVar288._12_4_ = fVar218 * -0.0 + fVar378 * 0.0 + fVar260 + fVar264 * -0.0;
  auVar335._0_4_ = fVar245 * 0.0 + fVar261 * 0.5;
  auVar335._4_4_ = fVar246 * 0.0 + fVar262 * 0.5;
  auVar335._8_4_ = fVar247 * 0.0 + fVar263 * 0.5;
  auVar335._12_4_ = fVar260 * 0.0 + fVar264 * 0.5;
  auVar362._0_4_ = fVar240 * 0.5;
  auVar362._4_4_ = fVar242 * 0.5;
  auVar362._8_4_ = fVar243 * 0.5;
  auVar362._12_4_ = fVar378 * 0.5;
  auVar110 = vsubps_avx(auVar335,auVar362);
  auVar349._0_4_ = fVar93 * 0.0 + auVar110._0_4_;
  auVar349._4_4_ = fVar132 * 0.0 + auVar110._4_4_;
  auVar349._8_4_ = fVar133 * 0.0 + auVar110._8_4_;
  auVar349._12_4_ = fVar218 * 0.0 + auVar110._12_4_;
  auVar336._0_4_ = fVar134 * -0.0 + fVar280 + fVar266 * -0.0 + fVar265 * 0.0;
  auVar336._4_4_ = fVar135 * -0.0 + fVar281 + fVar241 * -0.0 + fVar267 * 0.0;
  auVar336._8_4_ = fVar136 * -0.0 + fVar283 + fVar297 * -0.0 + fVar278 * 0.0;
  auVar336._12_4_ = fVar217 * -0.0 + fVar284 + fVar244 * -0.0 + fVar279 * 0.0;
  auVar140._0_4_ = fVar134 * -0.0 + fVar266 * -0.0 + fVar265 + fVar280 * 0.0;
  auVar140._4_4_ = fVar135 * -0.0 + fVar241 * -0.0 + fVar267 + fVar281 * 0.0;
  auVar140._8_4_ = fVar136 * -0.0 + fVar297 * -0.0 + fVar278 + fVar283 * 0.0;
  auVar140._12_4_ = fVar217 * -0.0 + fVar244 * -0.0 + fVar279 + fVar284 * 0.0;
  auVar175._0_4_ = fVar265 * 0.0 + fVar266 * 0.5;
  auVar175._4_4_ = fVar267 * 0.0 + fVar241 * 0.5;
  auVar175._8_4_ = fVar278 * 0.0 + fVar297 * 0.5;
  auVar175._12_4_ = fVar279 * 0.0 + fVar244 * 0.5;
  auVar206._0_4_ = fVar280 * 0.5;
  auVar206._4_4_ = fVar281 * 0.5;
  auVar206._8_4_ = fVar283 * 0.5;
  auVar206._12_4_ = fVar284 * 0.5;
  auVar110 = vsubps_avx(auVar175,auVar206);
  auVar176._0_4_ = fVar134 * 0.0 + auVar110._0_4_;
  auVar176._4_4_ = fVar135 * 0.0 + auVar110._4_4_;
  auVar176._8_4_ = fVar136 * 0.0 + auVar110._8_4_;
  auVar176._12_4_ = fVar217 * 0.0 + auVar110._12_4_;
  auVar110 = vshufps_avx(auVar336,auVar336,0xc9);
  fVar245 = auVar34._0_4_;
  auVar102._0_4_ = fVar245 * auVar110._0_4_;
  fVar246 = auVar34._4_4_;
  auVar102._4_4_ = fVar246 * auVar110._4_4_;
  fVar247 = auVar34._8_4_;
  auVar102._8_4_ = fVar247 * auVar110._8_4_;
  fVar262 = auVar34._12_4_;
  auVar102._12_4_ = fVar262 * auVar110._12_4_;
  auVar110 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar337._0_4_ = auVar336._0_4_ * auVar110._0_4_;
  auVar337._4_4_ = auVar336._4_4_ * auVar110._4_4_;
  auVar337._8_4_ = auVar336._8_4_ * auVar110._8_4_;
  auVar337._12_4_ = auVar336._12_4_ * auVar110._12_4_;
  auVar197 = vsubps_avx(auVar337,auVar102);
  auVar103._0_4_ = auVar110._0_4_ * auVar223._0_4_;
  auVar103._4_4_ = auVar110._4_4_ * auVar223._4_4_;
  auVar103._8_4_ = auVar110._8_4_ * auVar223._8_4_;
  auVar103._12_4_ = auVar110._12_4_ * auVar223._12_4_;
  auVar110 = vshufps_avx(auVar223,auVar223,0xc9);
  auVar207._0_4_ = fVar245 * auVar110._0_4_;
  auVar207._4_4_ = fVar246 * auVar110._4_4_;
  auVar207._8_4_ = fVar247 * auVar110._8_4_;
  auVar207._12_4_ = fVar262 * auVar110._12_4_;
  auVar303 = vsubps_avx(auVar103,auVar207);
  auVar110 = vshufps_avx(auVar140,auVar140,0xc9);
  auVar104._0_4_ = auVar349._0_4_ * auVar110._0_4_;
  auVar104._4_4_ = auVar349._4_4_ * auVar110._4_4_;
  auVar104._8_4_ = auVar349._8_4_ * auVar110._8_4_;
  auVar104._12_4_ = auVar349._12_4_ * auVar110._12_4_;
  auVar110 = vshufps_avx(auVar349,auVar349,0xc9);
  auVar141._0_4_ = auVar110._0_4_ * auVar140._0_4_;
  auVar141._4_4_ = auVar110._4_4_ * auVar140._4_4_;
  auVar141._8_4_ = auVar110._8_4_ * auVar140._8_4_;
  auVar141._12_4_ = auVar110._12_4_ * auVar140._12_4_;
  auVar32 = vsubps_avx(auVar141,auVar104);
  auVar142._0_4_ = auVar110._0_4_ * auVar176._0_4_;
  auVar142._4_4_ = auVar110._4_4_ * auVar176._4_4_;
  auVar142._8_4_ = auVar110._8_4_ * auVar176._8_4_;
  auVar142._12_4_ = auVar110._12_4_ * auVar176._12_4_;
  auVar110 = vshufps_avx(auVar176,auVar176,0xc9);
  auVar177._0_4_ = auVar349._0_4_ * auVar110._0_4_;
  auVar177._4_4_ = auVar349._4_4_ * auVar110._4_4_;
  auVar177._8_4_ = auVar349._8_4_ * auVar110._8_4_;
  auVar177._12_4_ = auVar349._12_4_ * auVar110._12_4_;
  auVar158 = vsubps_avx(auVar142,auVar177);
  auVar197 = vshufps_avx(auVar197,auVar197,0xc9);
  auVar110 = vdpps_avx(auVar197,auVar197,0x7f);
  fVar93 = auVar110._0_4_;
  auVar269 = ZEXT416((uint)fVar93);
  auVar223 = vrsqrtss_avx(auVar269,auVar269);
  fVar132 = auVar223._0_4_;
  auVar303 = vshufps_avx(auVar303,auVar303,0xc9);
  auVar223 = vdpps_avx(auVar197,auVar303,0x7f);
  auVar110 = vshufps_avx(auVar110,auVar110,0);
  auVar208._0_4_ = auVar110._0_4_ * auVar303._0_4_;
  auVar208._4_4_ = auVar110._4_4_ * auVar303._4_4_;
  auVar208._8_4_ = auVar110._8_4_ * auVar303._8_4_;
  auVar208._12_4_ = auVar110._12_4_ * auVar303._12_4_;
  auVar110 = vshufps_avx(auVar223,auVar223,0);
  auVar363._0_4_ = auVar110._0_4_ * auVar197._0_4_;
  auVar363._4_4_ = auVar110._4_4_ * auVar197._4_4_;
  auVar363._8_4_ = auVar110._8_4_ * auVar197._8_4_;
  auVar363._12_4_ = auVar110._12_4_ * auVar197._12_4_;
  auVar388 = vsubps_avx(auVar208,auVar363);
  auVar110 = vrcpss_avx(auVar269,auVar269);
  auVar110 = ZEXT416((uint)(auVar110._0_4_ * (2.0 - fVar93 * auVar110._0_4_)));
  auVar303 = vshufps_avx(auVar110,auVar110,0);
  auVar110 = ZEXT416((uint)(fVar132 * 1.5 - fVar93 * 0.5 * fVar132 * fVar132 * fVar132));
  auVar269 = vshufps_avx(auVar110,auVar110,0);
  fVar240 = auVar197._0_4_ * auVar269._0_4_;
  fVar242 = auVar197._4_4_ * auVar269._4_4_;
  fVar243 = auVar197._8_4_ * auVar269._8_4_;
  fVar378 = auVar197._12_4_ * auVar269._12_4_;
  auVar32 = vshufps_avx(auVar32,auVar32,0xc9);
  auVar223 = vdpps_avx(auVar32,auVar32,0x7f);
  auVar110 = vblendps_avx(auVar223,_DAT_01f45a50,0xe);
  auVar197 = vrsqrtss_avx(auVar110,auVar110);
  fVar93 = auVar197._0_4_;
  auVar158 = vshufps_avx(auVar158,auVar158,0xc9);
  auVar197 = vdpps_avx(auVar32,auVar158,0x7f);
  auVar146 = vshufps_avx(auVar223,auVar223,0);
  auVar338._0_4_ = auVar146._0_4_ * auVar158._0_4_;
  auVar338._4_4_ = auVar146._4_4_ * auVar158._4_4_;
  auVar338._8_4_ = auVar146._8_4_ * auVar158._8_4_;
  auVar338._12_4_ = auVar146._12_4_ * auVar158._12_4_;
  auVar197 = vshufps_avx(auVar197,auVar197,0);
  auVar364._0_4_ = auVar197._0_4_ * auVar32._0_4_;
  auVar364._4_4_ = auVar197._4_4_ * auVar32._4_4_;
  auVar364._8_4_ = auVar197._8_4_ * auVar32._8_4_;
  auVar364._12_4_ = auVar197._12_4_ * auVar32._12_4_;
  auVar158 = vsubps_avx(auVar338,auVar364);
  auVar110 = vrcpss_avx(auVar110,auVar110);
  auVar110 = ZEXT416((uint)(auVar110._0_4_ * (2.0 - auVar223._0_4_ * auVar110._0_4_)));
  auVar110 = vshufps_avx(auVar110,auVar110,0);
  auVar223 = ZEXT416((uint)(fVar93 * 1.5 - auVar223._0_4_ * 0.5 * fVar93 * fVar93 * fVar93));
  auVar223 = vshufps_avx(auVar223,auVar223,0);
  fVar93 = auVar32._0_4_ * auVar223._0_4_;
  fVar132 = auVar32._4_4_ * auVar223._4_4_;
  fVar133 = auVar32._8_4_ * auVar223._8_4_;
  fVar218 = auVar32._12_4_ * auVar223._12_4_;
  auVar197 = vshufps_avx(auVar34,auVar34,0xff);
  auVar32 = vshufps_avx(auVar305,auVar305,0xff);
  auVar143._0_4_ = auVar32._0_4_ * fVar240;
  auVar143._4_4_ = auVar32._4_4_ * fVar242;
  auVar143._8_4_ = auVar32._8_4_ * fVar243;
  auVar143._12_4_ = auVar32._12_4_ * fVar378;
  auVar209._0_4_ =
       auVar197._0_4_ * fVar240 + auVar269._0_4_ * auVar388._0_4_ * auVar303._0_4_ * auVar32._0_4_;
  auVar209._4_4_ =
       auVar197._4_4_ * fVar242 + auVar269._4_4_ * auVar388._4_4_ * auVar303._4_4_ * auVar32._4_4_;
  auVar209._8_4_ =
       auVar197._8_4_ * fVar243 + auVar269._8_4_ * auVar388._8_4_ * auVar303._8_4_ * auVar32._8_4_;
  auVar209._12_4_ =
       auVar197._12_4_ * fVar378 +
       auVar269._12_4_ * auVar388._12_4_ * auVar303._12_4_ * auVar32._12_4_;
  auVar269 = vsubps_avx(auVar305,auVar143);
  auVar32 = vsubps_avx(auVar34,auVar209);
  auVar197 = vshufps_avx(auVar349,auVar349,0xff);
  auVar303 = vshufps_avx(auVar288,auVar288,0xff);
  auVar319._0_4_ = auVar303._0_4_ * fVar93;
  auVar319._4_4_ = auVar303._4_4_ * fVar132;
  auVar319._8_4_ = auVar303._8_4_ * fVar133;
  auVar319._12_4_ = auVar303._12_4_ * fVar218;
  auVar178._0_4_ =
       auVar197._0_4_ * fVar93 + auVar303._0_4_ * auVar223._0_4_ * auVar158._0_4_ * auVar110._0_4_;
  auVar178._4_4_ =
       auVar197._4_4_ * fVar132 + auVar303._4_4_ * auVar223._4_4_ * auVar158._4_4_ * auVar110._4_4_;
  auVar178._8_4_ =
       auVar197._8_4_ * fVar133 + auVar303._8_4_ * auVar223._8_4_ * auVar158._8_4_ * auVar110._8_4_;
  auVar178._12_4_ =
       auVar197._12_4_ * fVar218 +
       auVar303._12_4_ * auVar223._12_4_ * auVar158._12_4_ * auVar110._12_4_;
  auVar197 = vsubps_avx(auVar288,auVar319);
  auVar380._0_4_ = auVar319._0_4_ + auVar288._0_4_;
  auVar380._4_4_ = auVar319._4_4_ + auVar288._4_4_;
  auVar380._8_4_ = auVar319._8_4_ + auVar288._8_4_;
  auVar380._12_4_ = auVar319._12_4_ + auVar288._12_4_;
  auVar303 = vsubps_avx(auVar349,auVar178);
  local_640 = auVar183._0_4_;
  fStack_63c = auVar183._4_4_;
  fStack_638 = auVar183._8_4_;
  fStack_634 = auVar183._12_4_;
  local_620 = auVar147._0_4_;
  fStack_61c = auVar147._4_4_;
  fStack_618 = auVar147._8_4_;
  fStack_614 = auVar147._12_4_;
  auVar110 = vshufps_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),0);
  auVar223 = vshufps_avx(ZEXT416((uint)(1.0 - fVar137)),ZEXT416((uint)(1.0 - fVar137)),0);
  fVar218 = auVar110._0_4_;
  fVar240 = auVar110._4_4_;
  fVar242 = auVar110._8_4_;
  fVar243 = auVar110._12_4_;
  fVar137 = auVar223._0_4_;
  fVar93 = auVar223._4_4_;
  fVar132 = auVar223._8_4_;
  fVar133 = auVar223._12_4_;
  local_4a0._0_4_ = fVar137 * local_620 + fVar218 * auVar269._0_4_;
  local_4a0._4_4_ = fVar93 * fStack_61c + fVar240 * auVar269._4_4_;
  fStack_498 = fVar132 * fStack_618 + fVar242 * auVar269._8_4_;
  fStack_494 = fVar133 * fStack_614 + fVar243 * auVar269._12_4_;
  fVar260 = fVar137 * (local_620 + local_640 * 0.33333334) +
            fVar218 * (auVar269._0_4_ + auVar32._0_4_ * 0.33333334);
  fVar263 = fVar93 * (fStack_61c + fStack_63c * 0.33333334) +
            fVar240 * (auVar269._4_4_ + auVar32._4_4_ * 0.33333334);
  fVar267 = fVar132 * (fStack_618 + fStack_638 * 0.33333334) +
            fVar242 * (auVar269._8_4_ + auVar32._8_4_ * 0.33333334);
  fVar280 = fVar133 * (fStack_614 + fStack_634 * 0.33333334) +
            fVar243 * (auVar269._12_4_ + auVar32._12_4_ * 0.33333334);
  local_6a0 = auVar33._0_4_;
  fStack_69c = auVar33._4_4_;
  fStack_698 = auVar33._8_4_;
  fStack_694 = auVar33._12_4_;
  auVar179._0_4_ = local_6a0 * 0.33333334;
  auVar179._4_4_ = fStack_69c * 0.33333334;
  auVar179._8_4_ = fStack_698 * 0.33333334;
  auVar179._12_4_ = fStack_694 * 0.33333334;
  auVar110 = vsubps_avx(auVar282,auVar179);
  auVar270._0_4_ = (auVar318._0_4_ + auVar100._0_4_) * 0.33333334;
  auVar270._4_4_ = (auVar318._4_4_ + auVar100._4_4_) * 0.33333334;
  auVar270._8_4_ = (auVar318._8_4_ + auVar100._8_4_) * 0.33333334;
  auVar270._12_4_ = (auVar318._12_4_ + auVar100._12_4_) * 0.33333334;
  auVar223 = vsubps_avx(_local_6d0,auVar270);
  auVar210._0_4_ = auVar303._0_4_ * 0.33333334;
  auVar210._4_4_ = auVar303._4_4_ * 0.33333334;
  auVar210._8_4_ = auVar303._8_4_ * 0.33333334;
  auVar210._12_4_ = auVar303._12_4_ * 0.33333334;
  auVar303 = vsubps_avx(auVar197,auVar210);
  auVar339._0_4_ = (auVar349._0_4_ + auVar178._0_4_) * 0.33333334;
  auVar339._4_4_ = (auVar349._4_4_ + auVar178._4_4_) * 0.33333334;
  auVar339._8_4_ = (auVar349._8_4_ + auVar178._8_4_) * 0.33333334;
  auVar339._12_4_ = (auVar349._12_4_ + auVar178._12_4_) * 0.33333334;
  auVar269 = vsubps_avx(auVar380,auVar339);
  local_4b0._0_4_ = fVar218 * auVar303._0_4_ + fVar137 * auVar110._0_4_;
  local_4b0._4_4_ = fVar240 * auVar303._4_4_ + fVar93 * auVar110._4_4_;
  fStack_4a8 = fVar242 * auVar303._8_4_ + fVar132 * auVar110._8_4_;
  fStack_4a4 = fVar243 * auVar303._12_4_ + fVar133 * auVar110._12_4_;
  fVar261 = fVar137 * auVar282._0_4_ + fVar218 * auVar197._0_4_;
  fVar264 = fVar93 * auVar282._4_4_ + fVar240 * auVar197._4_4_;
  fVar278 = fVar132 * auVar282._8_4_ + fVar242 * auVar197._8_4_;
  fVar281 = fVar133 * auVar282._12_4_ + fVar243 * auVar197._12_4_;
  local_4c0._0_4_ = (float)local_720._0_4_ * fVar137 + fVar218 * (auVar305._0_4_ + auVar143._0_4_);
  local_4c0._4_4_ = (float)local_720._4_4_ * fVar93 + fVar240 * (auVar305._4_4_ + auVar143._4_4_);
  fStack_4b8 = fStack_718 * fVar132 + fVar242 * (auVar305._8_4_ + auVar143._8_4_);
  fStack_4b4 = fStack_714 * fVar133 + fVar243 * (auVar305._12_4_ + auVar143._12_4_);
  local_4d0._0_4_ =
       fVar137 * ((float)local_720._0_4_ + (fVar312 + auVar287._0_4_) * 0.33333334) +
       fVar218 * (auVar305._0_4_ + auVar143._0_4_ + (fVar245 + auVar209._0_4_) * 0.33333334);
  local_4d0._4_4_ =
       fVar93 * ((float)local_720._4_4_ + (fVar360 + auVar287._4_4_) * 0.33333334) +
       fVar240 * (auVar305._4_4_ + auVar143._4_4_ + (fVar246 + auVar209._4_4_) * 0.33333334);
  fStack_4c8 = fVar132 * (fStack_718 + (fVar313 + auVar287._8_4_) * 0.33333334) +
               fVar242 * (auVar305._8_4_ + auVar143._8_4_ + (fVar247 + auVar209._8_4_) * 0.33333334)
  ;
  fStack_4c4 = fVar133 * (fStack_714 + (fVar372 + auVar287._12_4_) * 0.33333334) +
               fVar243 * (auVar305._12_4_ + auVar143._12_4_ +
                         (fVar262 + auVar209._12_4_) * 0.33333334);
  fVar262 = fVar137 * auVar223._0_4_ + fVar218 * auVar269._0_4_;
  fVar265 = fVar93 * auVar223._4_4_ + fVar240 * auVar269._4_4_;
  fVar279 = fVar132 * auVar223._8_4_ + fVar242 * auVar269._8_4_;
  fVar283 = fVar133 * auVar223._12_4_ + fVar243 * auVar269._12_4_;
  auVar110 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  local_4e0 = (float)local_6d0._0_4_ * fVar137 + fVar218 * auVar380._0_4_;
  fStack_4dc = (float)local_6d0._4_4_ * fVar93 + fVar240 * auVar380._4_4_;
  fStack_4d8 = fStack_6c8 * fVar132 + fVar242 * auVar380._8_4_;
  fStack_4d4 = fStack_6c4 * fVar133 + fVar243 * auVar380._12_4_;
  auVar110 = vinsertps_avx(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_3c0 = vsubps_avx(_local_4a0,auVar110);
  auVar197 = vmovsldup_avx(local_3c0);
  auVar223 = vmovshdup_avx(local_3c0);
  auVar303 = vshufps_avx(local_3c0,local_3c0,0xaa);
  fVar137 = pre->ray_space[k].vx.field_0.m128[0];
  fVar93 = pre->ray_space[k].vx.field_0.m128[1];
  fVar132 = pre->ray_space[k].vx.field_0.m128[2];
  fVar133 = pre->ray_space[k].vx.field_0.m128[3];
  fVar218 = pre->ray_space[k].vy.field_0.m128[0];
  fVar240 = pre->ray_space[k].vy.field_0.m128[1];
  fVar242 = pre->ray_space[k].vy.field_0.m128[2];
  fVar243 = pre->ray_space[k].vy.field_0.m128[3];
  fVar378 = pre->ray_space[k].vz.field_0.m128[0];
  fVar245 = pre->ray_space[k].vz.field_0.m128[1];
  fVar246 = pre->ray_space[k].vz.field_0.m128[2];
  fVar247 = pre->ray_space[k].vz.field_0.m128[3];
  auVar365._0_4_ = fVar137 * auVar197._0_4_ + fVar218 * auVar223._0_4_ + fVar378 * auVar303._0_4_;
  auVar365._4_4_ = fVar93 * auVar197._4_4_ + fVar240 * auVar223._4_4_ + fVar245 * auVar303._4_4_;
  auVar365._8_4_ = fVar132 * auVar197._8_4_ + fVar242 * auVar223._8_4_ + fVar246 * auVar303._8_4_;
  auVar365._12_4_ =
       fVar133 * auVar197._12_4_ + fVar243 * auVar223._12_4_ + fVar247 * auVar303._12_4_;
  auVar79._4_4_ = fVar263;
  auVar79._0_4_ = fVar260;
  auVar79._8_4_ = fVar267;
  auVar79._12_4_ = fVar280;
  local_3d0 = vsubps_avx(auVar79,auVar110);
  auVar303 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar223 = vmovshdup_avx(local_3d0);
  auVar197 = vmovsldup_avx(local_3d0);
  auVar381._0_4_ = fVar137 * auVar197._0_4_ + fVar218 * auVar223._0_4_ + fVar378 * auVar303._0_4_;
  auVar381._4_4_ = fVar93 * auVar197._4_4_ + fVar240 * auVar223._4_4_ + fVar245 * auVar303._4_4_;
  auVar381._8_4_ = fVar132 * auVar197._8_4_ + fVar242 * auVar223._8_4_ + fVar246 * auVar303._8_4_;
  auVar381._12_4_ =
       fVar133 * auVar197._12_4_ + fVar243 * auVar223._12_4_ + fVar247 * auVar303._12_4_;
  local_3e0 = vsubps_avx(_local_4b0,auVar110);
  auVar303 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar223 = vmovshdup_avx(local_3e0);
  auVar197 = vmovsldup_avx(local_3e0);
  auVar402._0_4_ = fVar137 * auVar197._0_4_ + fVar218 * auVar223._0_4_ + fVar378 * auVar303._0_4_;
  auVar402._4_4_ = fVar93 * auVar197._4_4_ + fVar240 * auVar223._4_4_ + fVar245 * auVar303._4_4_;
  auVar402._8_4_ = fVar132 * auVar197._8_4_ + fVar242 * auVar223._8_4_ + fVar246 * auVar303._8_4_;
  auVar402._12_4_ =
       fVar133 * auVar197._12_4_ + fVar243 * auVar223._12_4_ + fVar247 * auVar303._12_4_;
  auVar77._4_4_ = fVar264;
  auVar77._0_4_ = fVar261;
  auVar77._8_4_ = fVar278;
  auVar77._12_4_ = fVar281;
  local_3f0 = vsubps_avx(auVar77,auVar110);
  auVar303 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar223 = vmovshdup_avx(local_3f0);
  auVar197 = vmovsldup_avx(local_3f0);
  auVar289._0_4_ = auVar197._0_4_ * fVar137 + auVar223._0_4_ * fVar218 + fVar378 * auVar303._0_4_;
  auVar289._4_4_ = auVar197._4_4_ * fVar93 + auVar223._4_4_ * fVar240 + fVar245 * auVar303._4_4_;
  auVar289._8_4_ = auVar197._8_4_ * fVar132 + auVar223._8_4_ * fVar242 + fVar246 * auVar303._8_4_;
  auVar289._12_4_ =
       auVar197._12_4_ * fVar133 + auVar223._12_4_ * fVar243 + fVar247 * auVar303._12_4_;
  local_400 = vsubps_avx(_local_4c0,auVar110);
  auVar303 = vshufps_avx(local_400,local_400,0xaa);
  auVar223 = vmovshdup_avx(local_400);
  auVar197 = vmovsldup_avx(local_400);
  auVar306._0_4_ = auVar197._0_4_ * fVar137 + auVar223._0_4_ * fVar218 + auVar303._0_4_ * fVar378;
  auVar306._4_4_ = auVar197._4_4_ * fVar93 + auVar223._4_4_ * fVar240 + auVar303._4_4_ * fVar245;
  auVar306._8_4_ = auVar197._8_4_ * fVar132 + auVar223._8_4_ * fVar242 + auVar303._8_4_ * fVar246;
  auVar306._12_4_ =
       auVar197._12_4_ * fVar133 + auVar223._12_4_ * fVar243 + auVar303._12_4_ * fVar247;
  local_410 = vsubps_avx(_local_4d0,auVar110);
  auVar303 = vshufps_avx(local_410,local_410,0xaa);
  auVar223 = vmovshdup_avx(local_410);
  auVar197 = vmovsldup_avx(local_410);
  auVar320._0_4_ = auVar197._0_4_ * fVar137 + auVar223._0_4_ * fVar218 + auVar303._0_4_ * fVar378;
  auVar320._4_4_ = auVar197._4_4_ * fVar93 + auVar223._4_4_ * fVar240 + auVar303._4_4_ * fVar245;
  auVar320._8_4_ = auVar197._8_4_ * fVar132 + auVar223._8_4_ * fVar242 + auVar303._8_4_ * fVar246;
  auVar320._12_4_ =
       auVar197._12_4_ * fVar133 + auVar223._12_4_ * fVar243 + auVar303._12_4_ * fVar247;
  auVar75._4_4_ = fVar265;
  auVar75._0_4_ = fVar262;
  auVar75._8_4_ = fVar279;
  auVar75._12_4_ = fVar283;
  local_420 = vsubps_avx(auVar75,auVar110);
  auVar303 = vshufps_avx(local_420,local_420,0xaa);
  auVar223 = vmovshdup_avx(local_420);
  auVar197 = vmovsldup_avx(local_420);
  auVar340._0_4_ = auVar197._0_4_ * fVar137 + auVar223._0_4_ * fVar218 + auVar303._0_4_ * fVar378;
  auVar340._4_4_ = auVar197._4_4_ * fVar93 + auVar223._4_4_ * fVar240 + auVar303._4_4_ * fVar245;
  auVar340._8_4_ = auVar197._8_4_ * fVar132 + auVar223._8_4_ * fVar242 + auVar303._8_4_ * fVar246;
  auVar340._12_4_ =
       auVar197._12_4_ * fVar133 + auVar223._12_4_ * fVar243 + auVar303._12_4_ * fVar247;
  auVar81._4_4_ = fStack_4dc;
  auVar81._0_4_ = local_4e0;
  auVar81._8_4_ = fStack_4d8;
  auVar81._12_4_ = fStack_4d4;
  local_430 = vsubps_avx(auVar81,auVar110);
  auVar197 = vshufps_avx(local_430,local_430,0xaa);
  auVar110 = vmovshdup_avx(local_430);
  auVar223 = vmovsldup_avx(local_430);
  auVar105._0_4_ = fVar137 * auVar223._0_4_ + fVar218 * auVar110._0_4_ + fVar378 * auVar197._0_4_;
  auVar105._4_4_ = fVar93 * auVar223._4_4_ + fVar240 * auVar110._4_4_ + fVar245 * auVar197._4_4_;
  auVar105._8_4_ = fVar132 * auVar223._8_4_ + fVar242 * auVar110._8_4_ + fVar246 * auVar197._8_4_;
  auVar105._12_4_ =
       fVar133 * auVar223._12_4_ + fVar243 * auVar110._12_4_ + fVar247 * auVar197._12_4_;
  auVar303 = vmovlhps_avx(auVar365,auVar306);
  auVar269 = vmovlhps_avx(auVar381,auVar320);
  auVar32 = vmovlhps_avx(auVar402,auVar340);
  _local_3a0 = vmovlhps_avx(auVar289,auVar105);
  auVar110 = vminps_avx(auVar303,auVar269);
  auVar223 = vminps_avx(auVar32,_local_3a0);
  auVar197 = vminps_avx(auVar110,auVar223);
  auVar110 = vmaxps_avx(auVar303,auVar269);
  auVar223 = vmaxps_avx(auVar32,_local_3a0);
  auVar110 = vmaxps_avx(auVar110,auVar223);
  auVar223 = vshufpd_avx(auVar197,auVar197,3);
  auVar197 = vminps_avx(auVar197,auVar223);
  auVar223 = vshufpd_avx(auVar110,auVar110,3);
  auVar223 = vmaxps_avx(auVar110,auVar223);
  auVar271._8_4_ = 0x7fffffff;
  auVar271._0_8_ = 0x7fffffff7fffffff;
  auVar271._12_4_ = 0x7fffffff;
  auVar110 = vandps_avx(auVar197,auVar271);
  auVar223 = vandps_avx(auVar223,auVar271);
  auVar110 = vmaxps_avx(auVar110,auVar223);
  auVar223 = vmovshdup_avx(auVar110);
  auVar110 = vmaxss_avx(auVar223,auVar110);
  fVar137 = auVar110._0_4_ * 9.536743e-07;
  local_3b0 = ZEXT416((uint)fVar137);
  auVar110 = vshufps_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),0);
  local_1c0._16_16_ = auVar110;
  local_1c0._0_16_ = auVar110;
  auVar106._0_8_ = auVar110._0_8_ ^ 0x8000000080000000;
  auVar106._8_4_ = auVar110._8_4_ ^ 0x80000000;
  auVar106._12_4_ = auVar110._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar106;
  local_1e0._0_16_ = auVar106;
  auVar110 = vpshufd_avx(ZEXT416(uVar83),0);
  local_320._16_16_ = auVar110;
  local_320._0_16_ = auVar110;
  auVar110 = vpshufd_avx(ZEXT416(uVar17),0);
  local_340._16_16_ = auVar110;
  local_340._0_16_ = auVar110;
  uVar85 = 0;
  fVar137 = *(float *)(ray + k * 4 + 0x60);
  _local_370 = vsubps_avx(auVar269,auVar303);
  _local_380 = vsubps_avx(auVar32,auVar269);
  _local_390 = vsubps_avx(_local_3a0,auVar32);
  _local_450 = vsubps_avx(_local_4c0,_local_4a0);
  auVar80._4_4_ = fVar263;
  auVar80._0_4_ = fVar260;
  auVar80._8_4_ = fVar267;
  auVar80._12_4_ = fVar280;
  _local_460 = vsubps_avx(_local_4d0,auVar80);
  auVar76._4_4_ = fVar265;
  auVar76._0_4_ = fVar262;
  auVar76._8_4_ = fVar279;
  auVar76._12_4_ = fVar283;
  _local_470 = vsubps_avx(auVar76,_local_4b0);
  auVar78._4_4_ = fVar264;
  auVar78._0_4_ = fVar261;
  auVar78._8_4_ = fVar278;
  auVar78._12_4_ = fVar281;
  _local_480 = vsubps_avx(auVar81,auVar78);
  auVar399 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar405 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00b5adf4:
  do {
    local_440 = auVar405._0_16_;
    auVar388 = auVar399._0_16_;
    auVar110 = vshufps_avx(auVar388,auVar388,0x50);
    auVar389._8_4_ = 0x3f800000;
    auVar389._0_8_ = 0x3f8000003f800000;
    auVar389._12_4_ = 0x3f800000;
    auVar398._16_4_ = 0x3f800000;
    auVar398._0_16_ = auVar389;
    auVar398._20_4_ = 0x3f800000;
    auVar398._24_4_ = 0x3f800000;
    auVar398._28_4_ = 0x3f800000;
    auVar223 = vsubps_avx(auVar389,auVar110);
    fVar93 = auVar110._0_4_;
    fVar132 = auVar110._4_4_;
    fVar133 = auVar110._8_4_;
    fVar218 = auVar110._12_4_;
    fVar240 = auVar223._0_4_;
    fVar242 = auVar223._4_4_;
    fVar243 = auVar223._8_4_;
    fVar378 = auVar223._12_4_;
    auVar211._0_4_ = auVar306._0_4_ * fVar93 + fVar240 * auVar365._0_4_;
    auVar211._4_4_ = auVar306._4_4_ * fVar132 + fVar242 * auVar365._4_4_;
    auVar211._8_4_ = auVar306._0_4_ * fVar133 + fVar243 * auVar365._0_4_;
    auVar211._12_4_ = auVar306._4_4_ * fVar218 + fVar378 * auVar365._4_4_;
    auVar180._0_4_ = auVar320._0_4_ * fVar93 + auVar381._0_4_ * fVar240;
    auVar180._4_4_ = auVar320._4_4_ * fVar132 + auVar381._4_4_ * fVar242;
    auVar180._8_4_ = auVar320._0_4_ * fVar133 + auVar381._0_4_ * fVar243;
    auVar180._12_4_ = auVar320._4_4_ * fVar218 + auVar381._4_4_ * fVar378;
    auVar290._0_4_ = auVar340._0_4_ * fVar93 + auVar402._0_4_ * fVar240;
    auVar290._4_4_ = auVar340._4_4_ * fVar132 + auVar402._4_4_ * fVar242;
    auVar290._8_4_ = auVar340._0_4_ * fVar133 + auVar402._0_4_ * fVar243;
    auVar290._12_4_ = auVar340._4_4_ * fVar218 + auVar402._4_4_ * fVar378;
    auVar224._0_4_ = auVar105._0_4_ * fVar93 + auVar289._0_4_ * fVar240;
    auVar224._4_4_ = auVar105._4_4_ * fVar132 + auVar289._4_4_ * fVar242;
    auVar224._8_4_ = auVar105._0_4_ * fVar133 + auVar289._0_4_ * fVar243;
    auVar224._12_4_ = auVar105._4_4_ * fVar218 + auVar289._4_4_ * fVar378;
    auVar110 = vmovshdup_avx(local_440);
    auVar223 = vshufps_avx(local_440,local_440,0);
    auVar327._16_16_ = auVar223;
    auVar327._0_16_ = auVar223;
    auVar197 = vshufps_avx(local_440,local_440,0x55);
    auVar124._16_16_ = auVar197;
    auVar124._0_16_ = auVar197;
    auVar122 = vsubps_avx(auVar124,auVar327);
    auVar197 = vshufps_avx(auVar211,auVar211,0);
    auVar158 = vshufps_avx(auVar211,auVar211,0x55);
    auVar146 = vshufps_avx(auVar180,auVar180,0);
    auVar183 = vshufps_avx(auVar180,auVar180,0x55);
    auVar147 = vshufps_avx(auVar290,auVar290,0);
    auVar282 = vshufps_avx(auVar290,auVar290,0x55);
    auVar33 = vshufps_avx(auVar224,auVar224,0);
    auVar34 = vshufps_avx(auVar224,auVar224,0x55);
    auVar110 = ZEXT416((uint)((auVar110._0_4_ - auVar405._0_4_) * 0.04761905));
    auVar110 = vshufps_avx(auVar110,auVar110,0);
    auVar348._0_4_ = auVar223._0_4_ + auVar122._0_4_ * 0.0;
    auVar348._4_4_ = auVar223._4_4_ + auVar122._4_4_ * 0.14285715;
    auVar348._8_4_ = auVar223._8_4_ + auVar122._8_4_ * 0.2857143;
    auVar348._12_4_ = auVar223._12_4_ + auVar122._12_4_ * 0.42857146;
    auVar348._16_4_ = auVar223._0_4_ + auVar122._16_4_ * 0.5714286;
    auVar348._20_4_ = auVar223._4_4_ + auVar122._20_4_ * 0.71428573;
    auVar348._24_4_ = auVar223._8_4_ + auVar122._24_4_ * 0.8571429;
    auVar348._28_4_ = auVar223._12_4_ + auVar122._28_4_;
    auVar26 = vsubps_avx(auVar398,auVar348);
    fVar93 = auVar146._0_4_;
    fVar133 = auVar146._4_4_;
    fVar240 = auVar146._8_4_;
    fVar243 = auVar146._12_4_;
    fVar316 = auVar26._0_4_;
    fVar329 = auVar26._4_4_;
    fVar330 = auVar26._8_4_;
    fVar331 = auVar26._12_4_;
    fVar332 = auVar26._16_4_;
    fVar333 = auVar26._20_4_;
    fVar334 = auVar26._24_4_;
    fVar312 = auVar183._0_4_;
    fVar313 = auVar183._4_4_;
    fVar314 = auVar183._8_4_;
    fVar315 = auVar183._12_4_;
    fVar386 = auVar158._12_4_ + 1.0;
    fVar266 = auVar147._0_4_;
    fVar241 = auVar147._4_4_;
    fVar297 = auVar147._8_4_;
    fVar244 = auVar147._12_4_;
    fVar245 = fVar266 * auVar348._0_4_ + fVar316 * fVar93;
    fVar246 = fVar241 * auVar348._4_4_ + fVar329 * fVar133;
    fVar247 = fVar297 * auVar348._8_4_ + fVar330 * fVar240;
    fVar284 = fVar244 * auVar348._12_4_ + fVar331 * fVar243;
    fVar134 = fVar266 * auVar348._16_4_ + fVar332 * fVar93;
    fVar135 = fVar241 * auVar348._20_4_ + fVar333 * fVar133;
    fVar136 = fVar297 * auVar348._24_4_ + fVar334 * fVar240;
    fVar132 = auVar282._0_4_;
    fVar218 = auVar282._4_4_;
    fVar242 = auVar282._8_4_;
    fVar378 = auVar282._12_4_;
    fVar360 = fVar312 * fVar316 + auVar348._0_4_ * fVar132;
    fVar372 = fVar313 * fVar329 + auVar348._4_4_ * fVar218;
    fVar373 = fVar314 * fVar330 + auVar348._8_4_ * fVar242;
    fVar374 = fVar315 * fVar331 + auVar348._12_4_ * fVar378;
    fVar375 = fVar312 * fVar332 + auVar348._16_4_ * fVar132;
    fVar376 = fVar313 * fVar333 + auVar348._20_4_ * fVar218;
    fVar377 = fVar314 * fVar334 + auVar348._24_4_ * fVar242;
    fVar379 = fVar315 + fVar243;
    auVar223 = vshufps_avx(auVar211,auVar211,0xaa);
    auVar146 = vshufps_avx(auVar211,auVar211,0xff);
    fVar217 = fVar244 + 0.0;
    auVar183 = vshufps_avx(auVar180,auVar180,0xaa);
    auVar147 = vshufps_avx(auVar180,auVar180,0xff);
    auVar238._0_4_ =
         fVar316 * (auVar348._0_4_ * fVar93 + fVar316 * auVar197._0_4_) + auVar348._0_4_ * fVar245;
    auVar238._4_4_ =
         fVar329 * (auVar348._4_4_ * fVar133 + fVar329 * auVar197._4_4_) + auVar348._4_4_ * fVar246;
    auVar238._8_4_ =
         fVar330 * (auVar348._8_4_ * fVar240 + fVar330 * auVar197._8_4_) + auVar348._8_4_ * fVar247;
    auVar238._12_4_ =
         fVar331 * (auVar348._12_4_ * fVar243 + fVar331 * auVar197._12_4_) +
         auVar348._12_4_ * fVar284;
    auVar238._16_4_ =
         fVar332 * (auVar348._16_4_ * fVar93 + fVar332 * auVar197._0_4_) + auVar348._16_4_ * fVar134
    ;
    auVar238._20_4_ =
         fVar333 * (auVar348._20_4_ * fVar133 + fVar333 * auVar197._4_4_) +
         auVar348._20_4_ * fVar135;
    auVar238._24_4_ =
         fVar334 * (auVar348._24_4_ * fVar240 + fVar334 * auVar197._8_4_) +
         auVar348._24_4_ * fVar136;
    auVar238._28_4_ = auVar197._12_4_ + 1.0 + fVar378;
    auVar258._0_4_ =
         fVar316 * (fVar312 * auVar348._0_4_ + auVar158._0_4_ * fVar316) + auVar348._0_4_ * fVar360;
    auVar258._4_4_ =
         fVar329 * (fVar313 * auVar348._4_4_ + auVar158._4_4_ * fVar329) + auVar348._4_4_ * fVar372;
    auVar258._8_4_ =
         fVar330 * (fVar314 * auVar348._8_4_ + auVar158._8_4_ * fVar330) + auVar348._8_4_ * fVar373;
    auVar258._12_4_ =
         fVar331 * (fVar315 * auVar348._12_4_ + auVar158._12_4_ * fVar331) +
         auVar348._12_4_ * fVar374;
    auVar258._16_4_ =
         fVar332 * (fVar312 * auVar348._16_4_ + auVar158._0_4_ * fVar332) +
         auVar348._16_4_ * fVar375;
    auVar258._20_4_ =
         fVar333 * (fVar313 * auVar348._20_4_ + auVar158._4_4_ * fVar333) +
         auVar348._20_4_ * fVar376;
    auVar258._24_4_ =
         fVar334 * (fVar314 * auVar348._24_4_ + auVar158._8_4_ * fVar334) +
         auVar348._24_4_ * fVar377;
    auVar258._28_4_ = auVar34._12_4_ + fVar378;
    auVar125._0_4_ =
         fVar316 * fVar245 + auVar348._0_4_ * (fVar266 * fVar316 + auVar33._0_4_ * auVar348._0_4_);
    auVar125._4_4_ =
         fVar329 * fVar246 + auVar348._4_4_ * (fVar241 * fVar329 + auVar33._4_4_ * auVar348._4_4_);
    auVar125._8_4_ =
         fVar330 * fVar247 + auVar348._8_4_ * (fVar297 * fVar330 + auVar33._8_4_ * auVar348._8_4_);
    auVar125._12_4_ =
         fVar331 * fVar284 +
         auVar348._12_4_ * (fVar244 * fVar331 + auVar33._12_4_ * auVar348._12_4_);
    auVar125._16_4_ =
         fVar332 * fVar134 + auVar348._16_4_ * (fVar266 * fVar332 + auVar33._0_4_ * auVar348._16_4_)
    ;
    auVar125._20_4_ =
         fVar333 * fVar135 + auVar348._20_4_ * (fVar241 * fVar333 + auVar33._4_4_ * auVar348._20_4_)
    ;
    auVar125._24_4_ =
         fVar334 * fVar136 + auVar348._24_4_ * (fVar297 * fVar334 + auVar33._8_4_ * auVar348._24_4_)
    ;
    auVar125._28_4_ = fVar243 + 1.0 + fVar217;
    auVar359._0_4_ =
         fVar316 * fVar360 + auVar348._0_4_ * (auVar34._0_4_ * auVar348._0_4_ + fVar316 * fVar132);
    auVar359._4_4_ =
         fVar329 * fVar372 + auVar348._4_4_ * (auVar34._4_4_ * auVar348._4_4_ + fVar329 * fVar218);
    auVar359._8_4_ =
         fVar330 * fVar373 + auVar348._8_4_ * (auVar34._8_4_ * auVar348._8_4_ + fVar330 * fVar242);
    auVar359._12_4_ =
         fVar331 * fVar374 +
         auVar348._12_4_ * (auVar34._12_4_ * auVar348._12_4_ + fVar331 * fVar378);
    auVar359._16_4_ =
         fVar332 * fVar375 + auVar348._16_4_ * (auVar34._0_4_ * auVar348._16_4_ + fVar332 * fVar132)
    ;
    auVar359._20_4_ =
         fVar333 * fVar376 + auVar348._20_4_ * (auVar34._4_4_ * auVar348._20_4_ + fVar333 * fVar218)
    ;
    auVar359._24_4_ =
         fVar334 * fVar377 + auVar348._24_4_ * (auVar34._8_4_ * auVar348._24_4_ + fVar334 * fVar242)
    ;
    auVar359._28_4_ = fVar217 + fVar378 + 0.0;
    local_220._0_4_ = fVar316 * auVar238._0_4_ + auVar348._0_4_ * auVar125._0_4_;
    local_220._4_4_ = fVar329 * auVar238._4_4_ + auVar348._4_4_ * auVar125._4_4_;
    local_220._8_4_ = fVar330 * auVar238._8_4_ + auVar348._8_4_ * auVar125._8_4_;
    local_220._12_4_ = fVar331 * auVar238._12_4_ + auVar348._12_4_ * auVar125._12_4_;
    local_220._16_4_ = fVar332 * auVar238._16_4_ + auVar348._16_4_ * auVar125._16_4_;
    local_220._20_4_ = fVar333 * auVar238._20_4_ + auVar348._20_4_ * auVar125._20_4_;
    local_220._24_4_ = fVar334 * auVar238._24_4_ + auVar348._24_4_ * auVar125._24_4_;
    local_220._28_4_ = fVar379 + fVar378 + 0.0;
    auVar216._0_4_ = fVar316 * auVar258._0_4_ + auVar348._0_4_ * auVar359._0_4_;
    auVar216._4_4_ = fVar329 * auVar258._4_4_ + auVar348._4_4_ * auVar359._4_4_;
    auVar216._8_4_ = fVar330 * auVar258._8_4_ + auVar348._8_4_ * auVar359._8_4_;
    auVar216._12_4_ = fVar331 * auVar258._12_4_ + auVar348._12_4_ * auVar359._12_4_;
    auVar216._16_4_ = fVar332 * auVar258._16_4_ + auVar348._16_4_ * auVar359._16_4_;
    auVar216._20_4_ = fVar333 * auVar258._20_4_ + auVar348._20_4_ * auVar359._20_4_;
    auVar216._24_4_ = fVar334 * auVar258._24_4_ + auVar348._24_4_ * auVar359._24_4_;
    auVar216._28_4_ = fVar379 + fVar217;
    auVar27 = vsubps_avx(auVar125,auVar238);
    auVar122 = vsubps_avx(auVar359,auVar258);
    local_640 = auVar110._0_4_;
    fStack_63c = auVar110._4_4_;
    fStack_638 = auVar110._8_4_;
    fStack_634 = auVar110._12_4_;
    local_260 = local_640 * auVar27._0_4_ * 3.0;
    fStack_25c = fStack_63c * auVar27._4_4_ * 3.0;
    auVar37._4_4_ = fStack_25c;
    auVar37._0_4_ = local_260;
    fStack_258 = fStack_638 * auVar27._8_4_ * 3.0;
    auVar37._8_4_ = fStack_258;
    fStack_254 = fStack_634 * auVar27._12_4_ * 3.0;
    auVar37._12_4_ = fStack_254;
    fStack_250 = local_640 * auVar27._16_4_ * 3.0;
    auVar37._16_4_ = fStack_250;
    fStack_24c = fStack_63c * auVar27._20_4_ * 3.0;
    auVar37._20_4_ = fStack_24c;
    fStack_248 = fStack_638 * auVar27._24_4_ * 3.0;
    auVar37._24_4_ = fStack_248;
    auVar37._28_4_ = auVar27._28_4_;
    local_280 = local_640 * auVar122._0_4_ * 3.0;
    fStack_27c = fStack_63c * auVar122._4_4_ * 3.0;
    auVar38._4_4_ = fStack_27c;
    auVar38._0_4_ = local_280;
    fStack_278 = fStack_638 * auVar122._8_4_ * 3.0;
    auVar38._8_4_ = fStack_278;
    fStack_274 = fStack_634 * auVar122._12_4_ * 3.0;
    auVar38._12_4_ = fStack_274;
    fStack_270 = local_640 * auVar122._16_4_ * 3.0;
    auVar38._16_4_ = fStack_270;
    fStack_26c = fStack_63c * auVar122._20_4_ * 3.0;
    auVar38._20_4_ = fStack_26c;
    fStack_268 = fStack_638 * auVar122._24_4_ * 3.0;
    auVar38._24_4_ = fStack_268;
    auVar38._28_4_ = fVar379;
    auVar24 = vsubps_avx(local_220,auVar37);
    auVar122 = vperm2f128_avx(auVar24,auVar24,1);
    auVar122 = vshufps_avx(auVar122,auVar24,0x30);
    auVar122 = vshufps_avx(auVar24,auVar122,0x29);
    auVar25 = vsubps_avx(auVar216,auVar38);
    auVar24 = vperm2f128_avx(auVar25,auVar25,1);
    auVar24 = vshufps_avx(auVar24,auVar25,0x30);
    auVar25 = vshufps_avx(auVar25,auVar24,0x29);
    fVar376 = auVar183._0_4_;
    fVar377 = auVar183._4_4_;
    fVar406 = auVar183._8_4_;
    fVar243 = auVar223._12_4_;
    fVar241 = auVar147._0_4_;
    fVar244 = auVar147._4_4_;
    fVar360 = auVar147._8_4_;
    fVar372 = auVar147._12_4_;
    auVar110 = vshufps_avx(auVar290,auVar290,0xaa);
    fVar93 = auVar110._0_4_;
    fVar133 = auVar110._4_4_;
    fVar240 = auVar110._8_4_;
    fVar378 = auVar110._12_4_;
    fVar247 = auVar348._0_4_ * fVar93 + fVar376 * fVar316;
    fVar284 = auVar348._4_4_ * fVar133 + fVar377 * fVar329;
    fVar134 = auVar348._8_4_ * fVar240 + fVar406 * fVar330;
    fVar135 = auVar348._12_4_ * fVar378 + auVar183._12_4_ * fVar331;
    fVar136 = auVar348._16_4_ * fVar93 + fVar376 * fVar332;
    fVar217 = auVar348._20_4_ * fVar133 + fVar377 * fVar333;
    fVar266 = auVar348._24_4_ * fVar240 + fVar406 * fVar334;
    auVar110 = vshufps_avx(auVar290,auVar290,0xff);
    fVar132 = auVar110._0_4_;
    fVar218 = auVar110._4_4_;
    fVar242 = auVar110._8_4_;
    fVar245 = auVar110._12_4_;
    fVar297 = auVar348._0_4_ * fVar132 + fVar241 * fVar316;
    fVar312 = auVar348._4_4_ * fVar218 + fVar244 * fVar329;
    fVar313 = auVar348._8_4_ * fVar242 + fVar360 * fVar330;
    fVar314 = auVar348._12_4_ * fVar245 + fVar372 * fVar331;
    fVar373 = auVar348._16_4_ * fVar132 + fVar241 * fVar332;
    fVar315 = auVar348._20_4_ * fVar218 + fVar244 * fVar333;
    fVar374 = auVar348._24_4_ * fVar242 + fVar360 * fVar334;
    auVar110 = vshufps_avx(auVar224,auVar224,0xaa);
    fVar375 = auVar110._12_4_ + fVar378;
    auVar197 = vshufps_avx(auVar224,auVar224,0xff);
    fVar246 = auVar197._12_4_;
    auVar126._0_4_ =
         fVar316 * (fVar376 * auVar348._0_4_ + fVar316 * auVar223._0_4_) + auVar348._0_4_ * fVar247;
    auVar126._4_4_ =
         fVar329 * (fVar377 * auVar348._4_4_ + fVar329 * auVar223._4_4_) + auVar348._4_4_ * fVar284;
    auVar126._8_4_ =
         fVar330 * (fVar406 * auVar348._8_4_ + fVar330 * auVar223._8_4_) + auVar348._8_4_ * fVar134;
    auVar126._12_4_ =
         fVar331 * (auVar183._12_4_ * auVar348._12_4_ + fVar331 * fVar243) +
         auVar348._12_4_ * fVar135;
    auVar126._16_4_ =
         fVar332 * (fVar376 * auVar348._16_4_ + fVar332 * auVar223._0_4_) +
         auVar348._16_4_ * fVar136;
    auVar126._20_4_ =
         fVar333 * (fVar377 * auVar348._20_4_ + fVar333 * auVar223._4_4_) +
         auVar348._20_4_ * fVar217;
    auVar126._24_4_ =
         fVar334 * (fVar406 * auVar348._24_4_ + fVar334 * auVar223._8_4_) +
         auVar348._24_4_ * fVar266;
    auVar126._28_4_ = auVar25._28_4_ + fVar243 + fVar246;
    auVar168._0_4_ =
         fVar316 * (fVar241 * auVar348._0_4_ + auVar146._0_4_ * fVar316) + auVar348._0_4_ * fVar297;
    auVar168._4_4_ =
         fVar329 * (fVar244 * auVar348._4_4_ + auVar146._4_4_ * fVar329) + auVar348._4_4_ * fVar312;
    auVar168._8_4_ =
         fVar330 * (fVar360 * auVar348._8_4_ + auVar146._8_4_ * fVar330) + auVar348._8_4_ * fVar313;
    auVar168._12_4_ =
         fVar331 * (fVar372 * auVar348._12_4_ + auVar146._12_4_ * fVar331) +
         auVar348._12_4_ * fVar314;
    auVar168._16_4_ =
         fVar332 * (fVar241 * auVar348._16_4_ + auVar146._0_4_ * fVar332) +
         auVar348._16_4_ * fVar373;
    auVar168._20_4_ =
         fVar333 * (fVar244 * auVar348._20_4_ + auVar146._4_4_ * fVar333) +
         auVar348._20_4_ * fVar315;
    auVar168._24_4_ =
         fVar334 * (fVar360 * auVar348._24_4_ + auVar146._8_4_ * fVar334) +
         auVar348._24_4_ * fVar374;
    auVar168._28_4_ = fVar243 + auVar24._28_4_ + fVar246;
    auVar24 = vperm2f128_avx(local_220,local_220,1);
    auVar24 = vshufps_avx(auVar24,local_220,0x30);
    auVar28 = vshufps_avx(local_220,auVar24,0x29);
    auVar259._0_4_ =
         auVar348._0_4_ * (auVar110._0_4_ * auVar348._0_4_ + fVar316 * fVar93) + fVar316 * fVar247;
    auVar259._4_4_ =
         auVar348._4_4_ * (auVar110._4_4_ * auVar348._4_4_ + fVar329 * fVar133) + fVar329 * fVar284;
    auVar259._8_4_ =
         auVar348._8_4_ * (auVar110._8_4_ * auVar348._8_4_ + fVar330 * fVar240) + fVar330 * fVar134;
    auVar259._12_4_ =
         auVar348._12_4_ * (auVar110._12_4_ * auVar348._12_4_ + fVar331 * fVar378) +
         fVar331 * fVar135;
    auVar259._16_4_ =
         auVar348._16_4_ * (auVar110._0_4_ * auVar348._16_4_ + fVar332 * fVar93) + fVar332 * fVar136
    ;
    auVar259._20_4_ =
         auVar348._20_4_ * (auVar110._4_4_ * auVar348._20_4_ + fVar333 * fVar133) +
         fVar333 * fVar217;
    auVar259._24_4_ =
         auVar348._24_4_ * (auVar110._8_4_ * auVar348._24_4_ + fVar334 * fVar240) +
         fVar334 * fVar266;
    auVar259._28_4_ = fVar375 + fVar386 + auVar258._28_4_;
    auVar311._0_4_ =
         fVar316 * fVar297 + auVar348._0_4_ * (auVar348._0_4_ * auVar197._0_4_ + fVar316 * fVar132);
    auVar311._4_4_ =
         fVar329 * fVar312 + auVar348._4_4_ * (auVar348._4_4_ * auVar197._4_4_ + fVar329 * fVar218);
    auVar311._8_4_ =
         fVar330 * fVar313 + auVar348._8_4_ * (auVar348._8_4_ * auVar197._8_4_ + fVar330 * fVar242);
    auVar311._12_4_ =
         fVar331 * fVar314 + auVar348._12_4_ * (auVar348._12_4_ * fVar246 + fVar331 * fVar245);
    auVar311._16_4_ =
         fVar332 * fVar373 +
         auVar348._16_4_ * (auVar348._16_4_ * auVar197._0_4_ + fVar332 * fVar132);
    auVar311._20_4_ =
         fVar333 * fVar315 +
         auVar348._20_4_ * (auVar348._20_4_ * auVar197._4_4_ + fVar333 * fVar218);
    auVar311._24_4_ =
         fVar334 * fVar374 +
         auVar348._24_4_ * (auVar348._24_4_ * auVar197._8_4_ + fVar334 * fVar242);
    auVar311._28_4_ = fVar386 + fVar372 + fVar246 + fVar245;
    auVar296._0_4_ = fVar316 * auVar126._0_4_ + auVar348._0_4_ * auVar259._0_4_;
    auVar296._4_4_ = fVar329 * auVar126._4_4_ + auVar348._4_4_ * auVar259._4_4_;
    auVar296._8_4_ = fVar330 * auVar126._8_4_ + auVar348._8_4_ * auVar259._8_4_;
    auVar296._12_4_ = fVar331 * auVar126._12_4_ + auVar348._12_4_ * auVar259._12_4_;
    auVar296._16_4_ = fVar332 * auVar126._16_4_ + auVar348._16_4_ * auVar259._16_4_;
    auVar296._20_4_ = fVar333 * auVar126._20_4_ + auVar348._20_4_ * auVar259._20_4_;
    auVar296._24_4_ = fVar334 * auVar126._24_4_ + auVar348._24_4_ * auVar259._24_4_;
    auVar296._28_4_ = fVar375 + fVar246 + fVar245;
    auVar328._0_4_ = fVar316 * auVar168._0_4_ + auVar348._0_4_ * auVar311._0_4_;
    auVar328._4_4_ = fVar329 * auVar168._4_4_ + auVar348._4_4_ * auVar311._4_4_;
    auVar328._8_4_ = fVar330 * auVar168._8_4_ + auVar348._8_4_ * auVar311._8_4_;
    auVar328._12_4_ = fVar331 * auVar168._12_4_ + auVar348._12_4_ * auVar311._12_4_;
    auVar328._16_4_ = fVar332 * auVar168._16_4_ + auVar348._16_4_ * auVar311._16_4_;
    auVar328._20_4_ = fVar333 * auVar168._20_4_ + auVar348._20_4_ * auVar311._20_4_;
    auVar328._24_4_ = fVar334 * auVar168._24_4_ + auVar348._24_4_ * auVar311._24_4_;
    auVar328._28_4_ = auVar26._28_4_ + auVar348._28_4_;
    auVar31 = vsubps_avx(auVar259,auVar126);
    auVar24 = vsubps_avx(auVar311,auVar168);
    local_2a0 = local_640 * auVar31._0_4_ * 3.0;
    fStack_29c = fStack_63c * auVar31._4_4_ * 3.0;
    auVar39._4_4_ = fStack_29c;
    auVar39._0_4_ = local_2a0;
    fStack_298 = fStack_638 * auVar31._8_4_ * 3.0;
    auVar39._8_4_ = fStack_298;
    fStack_294 = fStack_634 * auVar31._12_4_ * 3.0;
    auVar39._12_4_ = fStack_294;
    fStack_290 = local_640 * auVar31._16_4_ * 3.0;
    auVar39._16_4_ = fStack_290;
    fStack_28c = fStack_63c * auVar31._20_4_ * 3.0;
    auVar39._20_4_ = fStack_28c;
    fStack_288 = fStack_638 * auVar31._24_4_ * 3.0;
    auVar39._24_4_ = fStack_288;
    auVar39._28_4_ = auVar31._28_4_;
    local_2c0 = local_640 * auVar24._0_4_ * 3.0;
    fStack_2bc = fStack_63c * auVar24._4_4_ * 3.0;
    auVar40._4_4_ = fStack_2bc;
    auVar40._0_4_ = local_2c0;
    fStack_2b8 = fStack_638 * auVar24._8_4_ * 3.0;
    auVar40._8_4_ = fStack_2b8;
    fStack_2b4 = fStack_634 * auVar24._12_4_ * 3.0;
    auVar40._12_4_ = fStack_2b4;
    fStack_2b0 = local_640 * auVar24._16_4_ * 3.0;
    auVar40._16_4_ = fStack_2b0;
    fStack_2ac = fStack_63c * auVar24._20_4_ * 3.0;
    auVar40._20_4_ = fStack_2ac;
    fStack_2a8 = fStack_638 * auVar24._24_4_ * 3.0;
    auVar40._24_4_ = fStack_2a8;
    auVar40._28_4_ = auVar259._28_4_;
    auVar24 = vperm2f128_avx(auVar296,auVar296,1);
    auVar24 = vshufps_avx(auVar24,auVar296,0x30);
    auVar29 = vshufps_avx(auVar296,auVar24,0x29);
    auVar26 = vsubps_avx(auVar296,auVar39);
    auVar24 = vperm2f128_avx(auVar26,auVar26,1);
    auVar24 = vshufps_avx(auVar24,auVar26,0x30);
    auVar24 = vshufps_avx(auVar26,auVar24,0x29);
    auVar30 = vsubps_avx(auVar328,auVar40);
    auVar26 = vperm2f128_avx(auVar30,auVar30,1);
    auVar26 = vshufps_avx(auVar26,auVar30,0x30);
    local_200 = vshufps_avx(auVar30,auVar26,0x29);
    auVar35 = vsubps_avx(auVar296,local_220);
    auVar36 = vsubps_avx(auVar29,auVar28);
    fVar93 = auVar36._0_4_ + auVar35._0_4_;
    fVar132 = auVar36._4_4_ + auVar35._4_4_;
    fVar133 = auVar36._8_4_ + auVar35._8_4_;
    fVar218 = auVar36._12_4_ + auVar35._12_4_;
    fVar240 = auVar36._16_4_ + auVar35._16_4_;
    fVar242 = auVar36._20_4_ + auVar35._20_4_;
    fVar243 = auVar36._24_4_ + auVar35._24_4_;
    auVar26 = vperm2f128_avx(auVar216,auVar216,1);
    auVar26 = vshufps_avx(auVar26,auVar216,0x30);
    local_240 = vshufps_avx(auVar216,auVar26,0x29);
    auVar26 = vperm2f128_avx(auVar328,auVar328,1);
    auVar26 = vshufps_avx(auVar26,auVar328,0x30);
    auVar30 = vshufps_avx(auVar328,auVar26,0x29);
    auVar26 = vsubps_avx(auVar328,auVar216);
    auVar121 = vsubps_avx(auVar30,local_240);
    fVar378 = auVar121._0_4_ + auVar26._0_4_;
    fVar245 = auVar121._4_4_ + auVar26._4_4_;
    fVar246 = auVar121._8_4_ + auVar26._8_4_;
    fVar247 = auVar121._12_4_ + auVar26._12_4_;
    fVar284 = auVar121._16_4_ + auVar26._16_4_;
    fVar134 = auVar121._20_4_ + auVar26._20_4_;
    fVar135 = auVar121._24_4_ + auVar26._24_4_;
    auVar41._4_4_ = fVar132 * auVar216._4_4_;
    auVar41._0_4_ = fVar93 * auVar216._0_4_;
    auVar41._8_4_ = fVar133 * auVar216._8_4_;
    auVar41._12_4_ = fVar218 * auVar216._12_4_;
    auVar41._16_4_ = fVar240 * auVar216._16_4_;
    auVar41._20_4_ = fVar242 * auVar216._20_4_;
    auVar41._24_4_ = fVar243 * auVar216._24_4_;
    auVar41._28_4_ = auVar26._28_4_;
    auVar42._4_4_ = fVar245 * local_220._4_4_;
    auVar42._0_4_ = fVar378 * local_220._0_4_;
    auVar42._8_4_ = fVar246 * local_220._8_4_;
    auVar42._12_4_ = fVar247 * local_220._12_4_;
    auVar42._16_4_ = fVar284 * local_220._16_4_;
    auVar42._20_4_ = fVar134 * local_220._20_4_;
    auVar42._24_4_ = fVar135 * local_220._24_4_;
    auVar42._28_4_ = fVar375;
    auVar123 = vsubps_avx(auVar41,auVar42);
    local_260 = local_220._0_4_ + local_260;
    fStack_25c = local_220._4_4_ + fStack_25c;
    fStack_258 = local_220._8_4_ + fStack_258;
    fStack_254 = local_220._12_4_ + fStack_254;
    fStack_250 = local_220._16_4_ + fStack_250;
    fStack_24c = local_220._20_4_ + fStack_24c;
    fStack_248 = local_220._24_4_ + fStack_248;
    fStack_244 = local_220._28_4_ + auVar27._28_4_;
    local_280 = local_280 + auVar216._0_4_;
    fStack_27c = fStack_27c + auVar216._4_4_;
    fStack_278 = fStack_278 + auVar216._8_4_;
    fStack_274 = fStack_274 + auVar216._12_4_;
    fStack_270 = fStack_270 + auVar216._16_4_;
    fStack_26c = fStack_26c + auVar216._20_4_;
    fStack_268 = fStack_268 + auVar216._24_4_;
    fStack_264 = fVar379 + auVar216._28_4_;
    auVar43._4_4_ = fVar132 * fStack_27c;
    auVar43._0_4_ = fVar93 * local_280;
    auVar43._8_4_ = fVar133 * fStack_278;
    auVar43._12_4_ = fVar218 * fStack_274;
    auVar43._16_4_ = fVar240 * fStack_270;
    auVar43._20_4_ = fVar242 * fStack_26c;
    auVar43._24_4_ = fVar243 * fStack_268;
    auVar43._28_4_ = fVar379;
    auVar44._4_4_ = fVar245 * fStack_25c;
    auVar44._0_4_ = fVar378 * local_260;
    auVar44._8_4_ = fVar246 * fStack_258;
    auVar44._12_4_ = fVar247 * fStack_254;
    auVar44._16_4_ = fVar284 * fStack_250;
    auVar44._20_4_ = fVar134 * fStack_24c;
    auVar44._24_4_ = fVar135 * fStack_248;
    auVar44._28_4_ = fVar379 + auVar216._28_4_;
    auVar27 = vsubps_avx(auVar43,auVar44);
    local_740 = auVar25._0_4_;
    fStack_73c = auVar25._4_4_;
    fStack_738 = auVar25._8_4_;
    fStack_734 = auVar25._12_4_;
    fStack_730 = auVar25._16_4_;
    fStack_72c = auVar25._20_4_;
    fStack_728 = auVar25._24_4_;
    auVar45._4_4_ = fVar132 * fStack_73c;
    auVar45._0_4_ = fVar93 * local_740;
    auVar45._8_4_ = fVar133 * fStack_738;
    auVar45._12_4_ = fVar218 * fStack_734;
    auVar45._16_4_ = fVar240 * fStack_730;
    auVar45._20_4_ = fVar242 * fStack_72c;
    auVar45._24_4_ = fVar243 * fStack_728;
    auVar45._28_4_ = fVar379;
    local_720._0_4_ = auVar122._0_4_;
    local_720._4_4_ = auVar122._4_4_;
    fStack_718 = auVar122._8_4_;
    fStack_714 = auVar122._12_4_;
    fStack_710 = auVar122._16_4_;
    fStack_70c = auVar122._20_4_;
    fStack_708 = auVar122._24_4_;
    auVar46._4_4_ = fVar245 * (float)local_720._4_4_;
    auVar46._0_4_ = fVar378 * (float)local_720._0_4_;
    auVar46._8_4_ = fVar246 * fStack_718;
    auVar46._12_4_ = fVar247 * fStack_714;
    auVar46._16_4_ = fVar284 * fStack_710;
    auVar46._20_4_ = fVar134 * fStack_70c;
    auVar46._24_4_ = fVar135 * fStack_708;
    auVar46._28_4_ = local_220._28_4_;
    auVar161 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = local_240._4_4_ * fVar132;
    auVar47._0_4_ = local_240._0_4_ * fVar93;
    auVar47._8_4_ = local_240._8_4_ * fVar133;
    auVar47._12_4_ = local_240._12_4_ * fVar218;
    auVar47._16_4_ = local_240._16_4_ * fVar240;
    auVar47._20_4_ = local_240._20_4_ * fVar242;
    auVar47._24_4_ = local_240._24_4_ * fVar243;
    auVar47._28_4_ = fVar379;
    auVar48._4_4_ = auVar28._4_4_ * fVar245;
    auVar48._0_4_ = auVar28._0_4_ * fVar378;
    auVar48._8_4_ = auVar28._8_4_ * fVar246;
    auVar48._12_4_ = auVar28._12_4_ * fVar247;
    auVar48._16_4_ = auVar28._16_4_ * fVar284;
    auVar48._20_4_ = auVar28._20_4_ * fVar134;
    auVar48._24_4_ = auVar28._24_4_ * fVar135;
    auVar48._28_4_ = local_240._28_4_;
    local_640 = auVar24._0_4_;
    fStack_63c = auVar24._4_4_;
    fStack_638 = auVar24._8_4_;
    fStack_634 = auVar24._12_4_;
    fStack_630 = auVar24._16_4_;
    fStack_62c = auVar24._20_4_;
    fStack_628 = auVar24._24_4_;
    auVar162 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = auVar328._4_4_ * fVar132;
    auVar49._0_4_ = auVar328._0_4_ * fVar93;
    auVar49._8_4_ = auVar328._8_4_ * fVar133;
    auVar49._12_4_ = auVar328._12_4_ * fVar218;
    auVar49._16_4_ = auVar328._16_4_ * fVar240;
    auVar49._20_4_ = auVar328._20_4_ * fVar242;
    auVar49._24_4_ = auVar328._24_4_ * fVar243;
    auVar49._28_4_ = fVar379;
    auVar50._4_4_ = fVar245 * auVar296._4_4_;
    auVar50._0_4_ = fVar378 * auVar296._0_4_;
    auVar50._8_4_ = fVar246 * auVar296._8_4_;
    auVar50._12_4_ = fVar247 * auVar296._12_4_;
    auVar50._16_4_ = fVar284 * auVar296._16_4_;
    auVar50._20_4_ = fVar134 * auVar296._20_4_;
    auVar50._24_4_ = fVar135 * auVar296._24_4_;
    auVar50._28_4_ = fStack_244;
    auVar163 = vsubps_avx(auVar49,auVar50);
    local_2a0 = auVar296._0_4_ + local_2a0;
    fStack_29c = auVar296._4_4_ + fStack_29c;
    fStack_298 = auVar296._8_4_ + fStack_298;
    fStack_294 = auVar296._12_4_ + fStack_294;
    fStack_290 = auVar296._16_4_ + fStack_290;
    fStack_28c = auVar296._20_4_ + fStack_28c;
    fStack_288 = auVar296._24_4_ + fStack_288;
    fStack_284 = auVar296._28_4_ + auVar31._28_4_;
    local_2c0 = auVar328._0_4_ + local_2c0;
    fStack_2bc = auVar328._4_4_ + fStack_2bc;
    fStack_2b8 = auVar328._8_4_ + fStack_2b8;
    fStack_2b4 = auVar328._12_4_ + fStack_2b4;
    fStack_2b0 = auVar328._16_4_ + fStack_2b0;
    fStack_2ac = auVar328._20_4_ + fStack_2ac;
    fStack_2a8 = auVar328._24_4_ + fStack_2a8;
    fStack_2a4 = auVar328._28_4_ + auVar259._28_4_;
    auVar51._4_4_ = fVar132 * fStack_2bc;
    auVar51._0_4_ = fVar93 * local_2c0;
    auVar51._8_4_ = fVar133 * fStack_2b8;
    auVar51._12_4_ = fVar218 * fStack_2b4;
    auVar51._16_4_ = fVar240 * fStack_2b0;
    auVar51._20_4_ = fVar242 * fStack_2ac;
    auVar51._24_4_ = fVar243 * fStack_2a8;
    auVar51._28_4_ = auVar328._28_4_ + auVar259._28_4_;
    auVar52._4_4_ = fStack_29c * fVar245;
    auVar52._0_4_ = local_2a0 * fVar378;
    auVar52._8_4_ = fStack_298 * fVar246;
    auVar52._12_4_ = fStack_294 * fVar247;
    auVar52._16_4_ = fStack_290 * fVar284;
    auVar52._20_4_ = fStack_28c * fVar134;
    auVar52._24_4_ = fStack_288 * fVar135;
    auVar52._28_4_ = fStack_284;
    auVar31 = vsubps_avx(auVar51,auVar52);
    auVar53._4_4_ = fVar132 * local_200._4_4_;
    auVar53._0_4_ = fVar93 * local_200._0_4_;
    auVar53._8_4_ = fVar133 * local_200._8_4_;
    auVar53._12_4_ = fVar218 * local_200._12_4_;
    auVar53._16_4_ = fVar240 * local_200._16_4_;
    auVar53._20_4_ = fVar242 * local_200._20_4_;
    auVar53._24_4_ = fVar243 * local_200._24_4_;
    auVar53._28_4_ = fStack_284;
    auVar54._4_4_ = fVar245 * fStack_63c;
    auVar54._0_4_ = fVar378 * local_640;
    auVar54._8_4_ = fVar246 * fStack_638;
    auVar54._12_4_ = fVar247 * fStack_634;
    auVar54._16_4_ = fVar284 * fStack_630;
    auVar54._20_4_ = fVar134 * fStack_62c;
    auVar54._24_4_ = fVar135 * fStack_628;
    auVar54._28_4_ = local_200._28_4_;
    auVar164 = vsubps_avx(auVar53,auVar54);
    auVar55._4_4_ = fVar132 * auVar30._4_4_;
    auVar55._0_4_ = fVar93 * auVar30._0_4_;
    auVar55._8_4_ = fVar133 * auVar30._8_4_;
    auVar55._12_4_ = fVar218 * auVar30._12_4_;
    auVar55._16_4_ = fVar240 * auVar30._16_4_;
    auVar55._20_4_ = fVar242 * auVar30._20_4_;
    auVar55._24_4_ = fVar243 * auVar30._24_4_;
    auVar55._28_4_ = auVar36._28_4_ + auVar35._28_4_;
    auVar56._4_4_ = auVar29._4_4_ * fVar245;
    auVar56._0_4_ = auVar29._0_4_ * fVar378;
    auVar56._8_4_ = auVar29._8_4_ * fVar246;
    auVar56._12_4_ = auVar29._12_4_ * fVar247;
    auVar56._16_4_ = auVar29._16_4_ * fVar284;
    auVar56._20_4_ = auVar29._20_4_ * fVar134;
    auVar56._24_4_ = auVar29._24_4_ * fVar135;
    auVar56._28_4_ = auVar121._28_4_ + auVar26._28_4_;
    auVar35 = vsubps_avx(auVar55,auVar56);
    auVar24 = vminps_avx(auVar123,auVar27);
    auVar122 = vmaxps_avx(auVar123,auVar27);
    auVar25 = vminps_avx(auVar161,auVar162);
    auVar25 = vminps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(auVar161,auVar162);
    auVar122 = vmaxps_avx(auVar122,auVar24);
    auVar26 = vminps_avx(auVar163,auVar31);
    auVar24 = vmaxps_avx(auVar163,auVar31);
    auVar27 = vminps_avx(auVar164,auVar35);
    auVar27 = vminps_avx(auVar26,auVar27);
    auVar27 = vminps_avx(auVar25,auVar27);
    auVar25 = vmaxps_avx(auVar164,auVar35);
    auVar24 = vmaxps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(auVar122,auVar24);
    auVar122 = vcmpps_avx(auVar27,local_1c0,2);
    auVar24 = vcmpps_avx(auVar24,local_1e0,5);
    auVar122 = vandps_avx(auVar24,auVar122);
    auVar24 = local_2e0 & auVar122;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      auVar24 = vsubps_avx(auVar28,local_220);
      auVar25 = vsubps_avx(auVar29,auVar296);
      fVar132 = auVar24._0_4_ + auVar25._0_4_;
      fVar133 = auVar24._4_4_ + auVar25._4_4_;
      fVar218 = auVar24._8_4_ + auVar25._8_4_;
      fVar240 = auVar24._12_4_ + auVar25._12_4_;
      fVar242 = auVar24._16_4_ + auVar25._16_4_;
      fVar243 = auVar24._20_4_ + auVar25._20_4_;
      fVar378 = auVar24._24_4_ + auVar25._24_4_;
      auVar27 = vsubps_avx(local_240,auVar216);
      auVar31 = vsubps_avx(auVar30,auVar328);
      fVar245 = auVar27._0_4_ + auVar31._0_4_;
      fVar246 = auVar27._4_4_ + auVar31._4_4_;
      fVar247 = auVar27._8_4_ + auVar31._8_4_;
      fVar284 = auVar27._12_4_ + auVar31._12_4_;
      fVar134 = auVar27._16_4_ + auVar31._16_4_;
      fVar135 = auVar27._20_4_ + auVar31._20_4_;
      fVar136 = auVar27._24_4_ + auVar31._24_4_;
      fVar93 = auVar31._28_4_;
      auVar57._4_4_ = auVar216._4_4_ * fVar133;
      auVar57._0_4_ = auVar216._0_4_ * fVar132;
      auVar57._8_4_ = auVar216._8_4_ * fVar218;
      auVar57._12_4_ = auVar216._12_4_ * fVar240;
      auVar57._16_4_ = auVar216._16_4_ * fVar242;
      auVar57._20_4_ = auVar216._20_4_ * fVar243;
      auVar57._24_4_ = auVar216._24_4_ * fVar378;
      auVar57._28_4_ = auVar216._28_4_;
      auVar58._4_4_ = local_220._4_4_ * fVar246;
      auVar58._0_4_ = local_220._0_4_ * fVar245;
      auVar58._8_4_ = local_220._8_4_ * fVar247;
      auVar58._12_4_ = local_220._12_4_ * fVar284;
      auVar58._16_4_ = local_220._16_4_ * fVar134;
      auVar58._20_4_ = local_220._20_4_ * fVar135;
      auVar58._24_4_ = local_220._24_4_ * fVar136;
      auVar58._28_4_ = local_220._28_4_;
      auVar31 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar133 * fStack_27c;
      auVar59._0_4_ = fVar132 * local_280;
      auVar59._8_4_ = fVar218 * fStack_278;
      auVar59._12_4_ = fVar240 * fStack_274;
      auVar59._16_4_ = fVar242 * fStack_270;
      auVar59._20_4_ = fVar243 * fStack_26c;
      auVar59._24_4_ = fVar378 * fStack_268;
      auVar59._28_4_ = auVar216._28_4_;
      auVar60._4_4_ = fVar246 * fStack_25c;
      auVar60._0_4_ = fVar245 * local_260;
      auVar60._8_4_ = fVar247 * fStack_258;
      auVar60._12_4_ = fVar284 * fStack_254;
      auVar60._16_4_ = fVar134 * fStack_250;
      auVar60._20_4_ = fVar135 * fStack_24c;
      auVar60._24_4_ = fVar136 * fStack_248;
      auVar60._28_4_ = fVar93;
      auVar35 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar133 * fStack_73c;
      auVar61._0_4_ = fVar132 * local_740;
      auVar61._8_4_ = fVar218 * fStack_738;
      auVar61._12_4_ = fVar240 * fStack_734;
      auVar61._16_4_ = fVar242 * fStack_730;
      auVar61._20_4_ = fVar243 * fStack_72c;
      auVar61._24_4_ = fVar378 * fStack_728;
      auVar61._28_4_ = fVar93;
      auVar62._4_4_ = fVar246 * (float)local_720._4_4_;
      auVar62._0_4_ = fVar245 * (float)local_720._0_4_;
      auVar62._8_4_ = fVar247 * fStack_718;
      auVar62._12_4_ = fVar284 * fStack_714;
      auVar62._16_4_ = fVar134 * fStack_710;
      auVar62._20_4_ = fVar135 * fStack_70c;
      auVar62._24_4_ = fVar136 * fStack_708;
      auVar62._28_4_ = auVar26._28_4_;
      auVar36 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = local_240._4_4_ * fVar133;
      auVar63._0_4_ = local_240._0_4_ * fVar132;
      auVar63._8_4_ = local_240._8_4_ * fVar218;
      auVar63._12_4_ = local_240._12_4_ * fVar240;
      auVar63._16_4_ = local_240._16_4_ * fVar242;
      auVar63._20_4_ = local_240._20_4_ * fVar243;
      auVar63._24_4_ = local_240._24_4_ * fVar378;
      auVar63._28_4_ = auVar26._28_4_;
      auVar64._4_4_ = auVar28._4_4_ * fVar246;
      auVar64._0_4_ = auVar28._0_4_ * fVar245;
      auVar64._8_4_ = auVar28._8_4_ * fVar247;
      auVar64._12_4_ = auVar28._12_4_ * fVar284;
      auVar64._16_4_ = auVar28._16_4_ * fVar134;
      auVar64._20_4_ = auVar28._20_4_ * fVar135;
      uVar92 = auVar28._28_4_;
      auVar64._24_4_ = auVar28._24_4_ * fVar136;
      auVar64._28_4_ = uVar92;
      auVar28 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = auVar328._4_4_ * fVar133;
      auVar65._0_4_ = auVar328._0_4_ * fVar132;
      auVar65._8_4_ = auVar328._8_4_ * fVar218;
      auVar65._12_4_ = auVar328._12_4_ * fVar240;
      auVar65._16_4_ = auVar328._16_4_ * fVar242;
      auVar65._20_4_ = auVar328._20_4_ * fVar243;
      auVar65._24_4_ = auVar328._24_4_ * fVar378;
      auVar65._28_4_ = uVar92;
      auVar66._4_4_ = auVar296._4_4_ * fVar246;
      auVar66._0_4_ = auVar296._0_4_ * fVar245;
      auVar66._8_4_ = auVar296._8_4_ * fVar247;
      auVar66._12_4_ = auVar296._12_4_ * fVar284;
      auVar66._16_4_ = auVar296._16_4_ * fVar134;
      auVar66._20_4_ = auVar296._20_4_ * fVar135;
      auVar66._24_4_ = auVar296._24_4_ * fVar136;
      auVar66._28_4_ = auVar296._28_4_;
      auVar121 = vsubps_avx(auVar65,auVar66);
      auVar67._4_4_ = fVar133 * fStack_2bc;
      auVar67._0_4_ = fVar132 * local_2c0;
      auVar67._8_4_ = fVar218 * fStack_2b8;
      auVar67._12_4_ = fVar240 * fStack_2b4;
      auVar67._16_4_ = fVar242 * fStack_2b0;
      auVar67._20_4_ = fVar243 * fStack_2ac;
      auVar67._24_4_ = fVar378 * fStack_2a8;
      auVar67._28_4_ = uVar92;
      auVar68._4_4_ = fVar246 * fStack_29c;
      auVar68._0_4_ = fVar245 * local_2a0;
      auVar68._8_4_ = fVar247 * fStack_298;
      auVar68._12_4_ = fVar284 * fStack_294;
      auVar68._16_4_ = fVar134 * fStack_290;
      auVar68._20_4_ = fVar135 * fStack_28c;
      auVar68._24_4_ = fVar136 * fStack_288;
      auVar68._28_4_ = auVar328._28_4_;
      auVar123 = vsubps_avx(auVar67,auVar68);
      auVar69._4_4_ = fVar133 * local_200._4_4_;
      auVar69._0_4_ = fVar132 * local_200._0_4_;
      auVar69._8_4_ = fVar218 * local_200._8_4_;
      auVar69._12_4_ = fVar240 * local_200._12_4_;
      auVar69._16_4_ = fVar242 * local_200._16_4_;
      auVar69._20_4_ = fVar243 * local_200._20_4_;
      auVar69._24_4_ = fVar378 * local_200._24_4_;
      auVar69._28_4_ = auVar328._28_4_;
      auVar70._4_4_ = fStack_63c * fVar246;
      auVar70._0_4_ = local_640 * fVar245;
      auVar70._8_4_ = fStack_638 * fVar247;
      auVar70._12_4_ = fStack_634 * fVar284;
      auVar70._16_4_ = fStack_630 * fVar134;
      auVar70._20_4_ = fStack_62c * fVar135;
      auVar70._24_4_ = fStack_628 * fVar136;
      auVar70._28_4_ = local_240._28_4_;
      auVar161 = vsubps_avx(auVar69,auVar70);
      auVar71._4_4_ = fVar133 * auVar30._4_4_;
      auVar71._0_4_ = fVar132 * auVar30._0_4_;
      auVar71._8_4_ = fVar218 * auVar30._8_4_;
      auVar71._12_4_ = fVar240 * auVar30._12_4_;
      auVar71._16_4_ = fVar242 * auVar30._16_4_;
      auVar71._20_4_ = fVar243 * auVar30._20_4_;
      auVar71._24_4_ = fVar378 * auVar30._24_4_;
      auVar71._28_4_ = auVar24._28_4_ + auVar25._28_4_;
      auVar72._4_4_ = auVar29._4_4_ * fVar246;
      auVar72._0_4_ = auVar29._0_4_ * fVar245;
      auVar72._8_4_ = auVar29._8_4_ * fVar247;
      auVar72._12_4_ = auVar29._12_4_ * fVar284;
      auVar72._16_4_ = auVar29._16_4_ * fVar134;
      auVar72._20_4_ = auVar29._20_4_ * fVar135;
      auVar72._24_4_ = auVar29._24_4_ * fVar136;
      auVar72._28_4_ = auVar27._28_4_ + fVar93;
      auVar29 = vsubps_avx(auVar71,auVar72);
      auVar25 = vminps_avx(auVar31,auVar35);
      auVar24 = vmaxps_avx(auVar31,auVar35);
      auVar26 = vminps_avx(auVar36,auVar28);
      auVar26 = vminps_avx(auVar25,auVar26);
      auVar25 = vmaxps_avx(auVar36,auVar28);
      auVar24 = vmaxps_avx(auVar24,auVar25);
      auVar27 = vminps_avx(auVar121,auVar123);
      auVar25 = vmaxps_avx(auVar121,auVar123);
      auVar28 = vminps_avx(auVar161,auVar29);
      auVar27 = vminps_avx(auVar27,auVar28);
      auVar27 = vminps_avx(auVar26,auVar27);
      auVar26 = vmaxps_avx(auVar161,auVar29);
      auVar25 = vmaxps_avx(auVar25,auVar26);
      auVar25 = vmaxps_avx(auVar24,auVar25);
      auVar24 = vcmpps_avx(auVar27,local_1c0,2);
      auVar25 = vcmpps_avx(auVar25,local_1e0,5);
      auVar24 = vandps_avx(auVar25,auVar24);
      auVar122 = vandps_avx(local_2e0,auVar122);
      auVar25 = auVar122 & auVar24;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        auVar122 = vandps_avx(auVar24,auVar122);
        uVar82 = vmovmskps_avx(auVar122);
        if (uVar82 != 0) {
          auStack_490[uVar85] = uVar82 & 0xff;
          uVar4 = vmovlps_avx(local_440);
          *(undefined8 *)(afStack_360 + uVar85 * 2) = uVar4;
          uVar5 = vmovlps_avx(auVar388);
          auStack_1a0[uVar85] = uVar5;
          uVar85 = (ulong)((int)uVar85 + 1);
        }
      }
    }
LAB_00b5b45c:
    do {
      do {
        do {
          do {
            if ((int)uVar85 == 0) {
              uVar92 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar131._4_4_ = uVar92;
              auVar131._0_4_ = uVar92;
              auVar131._8_4_ = uVar92;
              auVar131._12_4_ = uVar92;
              auVar131._16_4_ = uVar92;
              auVar131._20_4_ = uVar92;
              auVar131._24_4_ = uVar92;
              auVar131._28_4_ = uVar92;
              auVar122 = vcmpps_avx(local_300,auVar131,2);
              uVar83 = vmovmskps_avx(auVar122);
              uVar84 = (ulong)((uint)uVar84 & (uint)uVar84 + 0xff & uVar83);
              auVar110 = ZEXT816(0) << 0x40;
              goto LAB_00b5a143;
            }
            uVar86 = (int)uVar85 - 1;
            uVar88 = (ulong)uVar86;
            uVar82 = auStack_490[uVar88];
            fVar93 = afStack_360[uVar88 * 2];
            fVar132 = afStack_360[uVar88 * 2 + 1];
            auVar390._8_8_ = 0;
            auVar390._0_8_ = auStack_1a0[uVar88];
            auVar399 = ZEXT1664(auVar390);
            uVar5 = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            uVar82 = uVar82 - 1 & uVar82;
            auStack_490[uVar88] = uVar82;
            if (uVar82 == 0) {
              uVar85 = (ulong)uVar86;
            }
            fVar218 = (float)(uVar5 + 1) * 0.14285715;
            fVar133 = (1.0 - (float)uVar5 * 0.14285715) * fVar93 +
                      fVar132 * (float)uVar5 * 0.14285715;
            fVar93 = (1.0 - fVar218) * fVar93 + fVar132 * fVar218;
            fVar132 = fVar93 - fVar133;
            if (0.16666667 <= fVar132) {
              auVar110 = vinsertps_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar93),0x10);
              auVar405 = ZEXT1664(auVar110);
              goto LAB_00b5adf4;
            }
            auVar110 = vshufps_avx(auVar390,auVar390,0x50);
            auVar144._8_4_ = 0x3f800000;
            auVar144._0_8_ = 0x3f8000003f800000;
            auVar144._12_4_ = 0x3f800000;
            auVar223 = vsubps_avx(auVar144,auVar110);
            fVar218 = auVar110._0_4_;
            fVar240 = auVar110._4_4_;
            fVar242 = auVar110._8_4_;
            fVar243 = auVar110._12_4_;
            fVar378 = auVar223._0_4_;
            fVar245 = auVar223._4_4_;
            fVar246 = auVar223._8_4_;
            fVar247 = auVar223._12_4_;
            auVar181._0_4_ = auVar306._0_4_ * fVar218 + fVar378 * auVar365._0_4_;
            auVar181._4_4_ = auVar306._4_4_ * fVar240 + fVar245 * auVar365._4_4_;
            auVar181._8_4_ = auVar306._0_4_ * fVar242 + fVar246 * auVar365._0_4_;
            auVar181._12_4_ = auVar306._4_4_ * fVar243 + fVar247 * auVar365._4_4_;
            auVar225._0_4_ = auVar320._0_4_ * fVar218 + auVar381._0_4_ * fVar378;
            auVar225._4_4_ = auVar320._4_4_ * fVar240 + auVar381._4_4_ * fVar245;
            auVar225._8_4_ = auVar320._0_4_ * fVar242 + auVar381._0_4_ * fVar246;
            auVar225._12_4_ = auVar320._4_4_ * fVar243 + auVar381._4_4_ * fVar247;
            auVar251._0_4_ = auVar340._0_4_ * fVar218 + auVar402._0_4_ * fVar378;
            auVar251._4_4_ = auVar340._4_4_ * fVar240 + auVar402._4_4_ * fVar245;
            auVar251._8_4_ = auVar340._0_4_ * fVar242 + auVar402._0_4_ * fVar246;
            auVar251._12_4_ = auVar340._4_4_ * fVar243 + auVar402._4_4_ * fVar247;
            auVar107._0_4_ = auVar105._0_4_ * fVar218 + auVar289._0_4_ * fVar378;
            auVar107._4_4_ = auVar105._4_4_ * fVar240 + auVar289._4_4_ * fVar245;
            auVar107._8_4_ = auVar105._0_4_ * fVar242 + auVar289._0_4_ * fVar246;
            auVar107._12_4_ = auVar105._4_4_ * fVar243 + auVar289._4_4_ * fVar247;
            auVar169._16_16_ = auVar181;
            auVar169._0_16_ = auVar181;
            auVar200._16_16_ = auVar225;
            auVar200._0_16_ = auVar225;
            auVar239._16_16_ = auVar251;
            auVar239._0_16_ = auVar251;
            auVar122 = ZEXT2032(CONCAT416(fVar93,ZEXT416((uint)fVar133)));
            auVar122 = vshufps_avx(auVar122,auVar122,0);
            auVar24 = vsubps_avx(auVar200,auVar169);
            fVar218 = auVar122._0_4_;
            fVar240 = auVar122._4_4_;
            fVar242 = auVar122._8_4_;
            fVar243 = auVar122._12_4_;
            fVar378 = auVar122._16_4_;
            fVar245 = auVar122._20_4_;
            fVar246 = auVar122._24_4_;
            auVar170._0_4_ = auVar181._0_4_ + auVar24._0_4_ * fVar218;
            auVar170._4_4_ = auVar181._4_4_ + auVar24._4_4_ * fVar240;
            auVar170._8_4_ = auVar181._8_4_ + auVar24._8_4_ * fVar242;
            auVar170._12_4_ = auVar181._12_4_ + auVar24._12_4_ * fVar243;
            auVar170._16_4_ = auVar181._0_4_ + auVar24._16_4_ * fVar378;
            auVar170._20_4_ = auVar181._4_4_ + auVar24._20_4_ * fVar245;
            auVar170._24_4_ = auVar181._8_4_ + auVar24._24_4_ * fVar246;
            auVar170._28_4_ = auVar181._12_4_ + auVar24._28_4_;
            auVar122 = vsubps_avx(auVar239,auVar200);
            auVar201._0_4_ = auVar225._0_4_ + auVar122._0_4_ * fVar218;
            auVar201._4_4_ = auVar225._4_4_ + auVar122._4_4_ * fVar240;
            auVar201._8_4_ = auVar225._8_4_ + auVar122._8_4_ * fVar242;
            auVar201._12_4_ = auVar225._12_4_ + auVar122._12_4_ * fVar243;
            auVar201._16_4_ = auVar225._0_4_ + auVar122._16_4_ * fVar378;
            auVar201._20_4_ = auVar225._4_4_ + auVar122._20_4_ * fVar245;
            auVar201._24_4_ = auVar225._8_4_ + auVar122._24_4_ * fVar246;
            auVar201._28_4_ = auVar225._12_4_ + auVar122._28_4_;
            auVar110 = vsubps_avx(auVar107,auVar251);
            auVar127._0_4_ = auVar251._0_4_ + auVar110._0_4_ * fVar218;
            auVar127._4_4_ = auVar251._4_4_ + auVar110._4_4_ * fVar240;
            auVar127._8_4_ = auVar251._8_4_ + auVar110._8_4_ * fVar242;
            auVar127._12_4_ = auVar251._12_4_ + auVar110._12_4_ * fVar243;
            auVar127._16_4_ = auVar251._0_4_ + auVar110._0_4_ * fVar378;
            auVar127._20_4_ = auVar251._4_4_ + auVar110._4_4_ * fVar245;
            auVar127._24_4_ = auVar251._8_4_ + auVar110._8_4_ * fVar246;
            auVar127._28_4_ = auVar251._12_4_ + auVar110._12_4_;
            auVar122 = vsubps_avx(auVar201,auVar170);
            auVar171._0_4_ = auVar170._0_4_ + fVar218 * auVar122._0_4_;
            auVar171._4_4_ = auVar170._4_4_ + fVar240 * auVar122._4_4_;
            auVar171._8_4_ = auVar170._8_4_ + fVar242 * auVar122._8_4_;
            auVar171._12_4_ = auVar170._12_4_ + fVar243 * auVar122._12_4_;
            auVar171._16_4_ = auVar170._16_4_ + fVar378 * auVar122._16_4_;
            auVar171._20_4_ = auVar170._20_4_ + fVar245 * auVar122._20_4_;
            auVar171._24_4_ = auVar170._24_4_ + fVar246 * auVar122._24_4_;
            auVar171._28_4_ = auVar170._28_4_ + auVar122._28_4_;
            auVar122 = vsubps_avx(auVar127,auVar201);
            auVar128._0_4_ = auVar201._0_4_ + fVar218 * auVar122._0_4_;
            auVar128._4_4_ = auVar201._4_4_ + fVar240 * auVar122._4_4_;
            auVar128._8_4_ = auVar201._8_4_ + fVar242 * auVar122._8_4_;
            auVar128._12_4_ = auVar201._12_4_ + fVar243 * auVar122._12_4_;
            auVar128._16_4_ = auVar201._16_4_ + fVar378 * auVar122._16_4_;
            auVar128._20_4_ = auVar201._20_4_ + fVar245 * auVar122._20_4_;
            auVar128._24_4_ = auVar201._24_4_ + fVar246 * auVar122._24_4_;
            auVar128._28_4_ = auVar201._28_4_ + auVar122._28_4_;
            auVar122 = vsubps_avx(auVar128,auVar171);
            auVar272._0_4_ = auVar171._0_4_ + fVar218 * auVar122._0_4_;
            auVar272._4_4_ = auVar171._4_4_ + fVar240 * auVar122._4_4_;
            auVar272._8_4_ = auVar171._8_4_ + fVar242 * auVar122._8_4_;
            auVar272._12_4_ = auVar171._12_4_ + fVar243 * auVar122._12_4_;
            auVar277._16_4_ = auVar171._16_4_ + fVar378 * auVar122._16_4_;
            auVar277._0_16_ = auVar272;
            auVar277._20_4_ = auVar171._20_4_ + fVar245 * auVar122._20_4_;
            auVar277._24_4_ = auVar171._24_4_ + fVar246 * auVar122._24_4_;
            auVar277._28_4_ = auVar171._28_4_ + auVar201._28_4_;
            auVar282 = auVar277._16_16_;
            auVar146 = vshufps_avx(ZEXT416((uint)(fVar132 * 0.33333334)),
                                   ZEXT416((uint)(fVar132 * 0.33333334)),0);
            auVar226._0_4_ = auVar272._0_4_ + auVar146._0_4_ * auVar122._0_4_ * 3.0;
            auVar226._4_4_ = auVar272._4_4_ + auVar146._4_4_ * auVar122._4_4_ * 3.0;
            auVar226._8_4_ = auVar272._8_4_ + auVar146._8_4_ * auVar122._8_4_ * 3.0;
            auVar226._12_4_ = auVar272._12_4_ + auVar146._12_4_ * auVar122._12_4_ * 3.0;
            auVar197 = vshufpd_avx(auVar272,auVar272,3);
            auVar158 = vshufpd_avx(auVar282,auVar282,3);
            auVar110 = vsubps_avx(auVar197,auVar272);
            auVar223 = vsubps_avx(auVar158,auVar282);
            auVar108._0_4_ = auVar110._0_4_ + auVar223._0_4_;
            auVar108._4_4_ = auVar110._4_4_ + auVar223._4_4_;
            auVar108._8_4_ = auVar110._8_4_ + auVar223._8_4_;
            auVar108._12_4_ = auVar110._12_4_ + auVar223._12_4_;
            auVar110 = vmovshdup_avx(auVar272);
            auVar223 = vmovshdup_avx(auVar226);
            auVar183 = vshufps_avx(auVar108,auVar108,0);
            auVar147 = vshufps_avx(auVar108,auVar108,0x55);
            fVar218 = auVar147._0_4_;
            fVar240 = auVar147._4_4_;
            fVar242 = auVar147._8_4_;
            fVar243 = auVar147._12_4_;
            fVar378 = auVar183._0_4_;
            fVar245 = auVar183._4_4_;
            fVar246 = auVar183._8_4_;
            fVar247 = auVar183._12_4_;
            auVar109._0_4_ = fVar378 * auVar272._0_4_ + auVar110._0_4_ * fVar218;
            auVar109._4_4_ = fVar245 * auVar272._4_4_ + auVar110._4_4_ * fVar240;
            auVar109._8_4_ = fVar246 * auVar272._8_4_ + auVar110._8_4_ * fVar242;
            auVar109._12_4_ = fVar247 * auVar272._12_4_ + auVar110._12_4_ * fVar243;
            auVar350._0_4_ = fVar378 * auVar226._0_4_ + auVar223._0_4_ * fVar218;
            auVar350._4_4_ = fVar245 * auVar226._4_4_ + auVar223._4_4_ * fVar240;
            auVar350._8_4_ = fVar246 * auVar226._8_4_ + auVar223._8_4_ * fVar242;
            auVar350._12_4_ = fVar247 * auVar226._12_4_ + auVar223._12_4_ * fVar243;
            auVar223 = vshufps_avx(auVar109,auVar109,0xe8);
            auVar183 = vshufps_avx(auVar350,auVar350,0xe8);
            auVar110 = vcmpps_avx(auVar223,auVar183,1);
            uVar82 = vextractps_avx(auVar110,0);
            auVar147 = auVar350;
            if ((uVar82 & 1) == 0) {
              auVar147 = auVar109;
            }
            auVar145._0_4_ = auVar146._0_4_ * auVar122._16_4_ * 3.0;
            auVar145._4_4_ = auVar146._4_4_ * auVar122._20_4_ * 3.0;
            auVar145._8_4_ = auVar146._8_4_ * auVar122._24_4_ * 3.0;
            auVar145._12_4_ = auVar146._12_4_ * 0.0;
            auVar34 = vsubps_avx(auVar282,auVar145);
            auVar146 = vmovshdup_avx(auVar34);
            auVar282 = vmovshdup_avx(auVar282);
            fVar284 = auVar34._0_4_;
            fVar134 = auVar34._4_4_;
            auVar252._0_4_ = fVar284 * fVar378 + auVar146._0_4_ * fVar218;
            auVar252._4_4_ = fVar134 * fVar245 + auVar146._4_4_ * fVar240;
            auVar252._8_4_ = auVar34._8_4_ * fVar246 + auVar146._8_4_ * fVar242;
            auVar252._12_4_ = auVar34._12_4_ * fVar247 + auVar146._12_4_ * fVar243;
            auVar403._0_4_ = fVar378 * auVar277._16_4_ + auVar282._0_4_ * fVar218;
            auVar403._4_4_ = fVar245 * auVar277._20_4_ + auVar282._4_4_ * fVar240;
            auVar403._8_4_ = fVar246 * auVar277._24_4_ + auVar282._8_4_ * fVar242;
            auVar403._12_4_ = fVar247 * auVar277._28_4_ + auVar282._12_4_ * fVar243;
            auVar282 = vshufps_avx(auVar252,auVar252,0xe8);
            auVar33 = vshufps_avx(auVar403,auVar403,0xe8);
            auVar146 = vcmpps_avx(auVar282,auVar33,1);
            uVar82 = vextractps_avx(auVar146,0);
            auVar388 = auVar403;
            if ((uVar82 & 1) == 0) {
              auVar388 = auVar252;
            }
            auVar147 = vmaxss_avx(auVar388,auVar147);
            auVar223 = vminps_avx(auVar223,auVar183);
            auVar183 = vminps_avx(auVar282,auVar33);
            auVar183 = vminps_avx(auVar223,auVar183);
            auVar110 = vshufps_avx(auVar110,auVar110,0x55);
            auVar110 = vblendps_avx(auVar110,auVar146,2);
            auVar146 = vpslld_avx(auVar110,0x1f);
            auVar110 = vshufpd_avx(auVar350,auVar350,1);
            auVar110 = vinsertps_avx(auVar110,auVar403,0x9c);
            auVar223 = vshufpd_avx(auVar109,auVar109,1);
            auVar223 = vinsertps_avx(auVar223,auVar252,0x9c);
            auVar110 = vblendvps_avx(auVar223,auVar110,auVar146);
            auVar223 = vmovshdup_avx(auVar110);
            auVar110 = vmaxss_avx(auVar223,auVar110);
            fVar242 = auVar183._0_4_;
            auVar223 = vmovshdup_avx(auVar183);
            fVar240 = auVar110._0_4_;
            fVar243 = auVar223._0_4_;
            fVar218 = auVar147._0_4_;
            if ((fVar242 < 0.0001) && (-0.0001 < fVar240)) break;
            if ((fVar243 < 0.0001 && -0.0001 < fVar218) || (fVar242 < 0.0001 && -0.0001 < fVar218))
            break;
            auVar146 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar110,1);
            auVar223 = vcmpps_avx(auVar223,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar223 = vandps_avx(auVar223,auVar146);
          } while ((auVar223 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar146 = vcmpps_avx(auVar183,_DAT_01f45a50,1);
          auVar223 = vcmpss_avx(auVar147,ZEXT416(0) << 0x20,1);
          auVar182._8_4_ = 0x3f800000;
          auVar182._0_8_ = 0x3f8000003f800000;
          auVar182._12_4_ = 0x3f800000;
          auVar227._8_4_ = 0xbf800000;
          auVar227._0_8_ = 0xbf800000bf800000;
          auVar227._12_4_ = 0xbf800000;
          auVar223 = vblendvps_avx(auVar182,auVar227,auVar223);
          auVar146 = vblendvps_avx(auVar182,auVar227,auVar146);
          auVar183 = vcmpss_avx(auVar146,auVar223,4);
          auVar183 = vpshufd_avx(ZEXT416(auVar183._0_4_ & 1),0x50);
          auVar183 = vpslld_avx(auVar183,0x1f);
          auVar183 = vpsrad_avx(auVar183,0x1f);
          auVar183 = vpandn_avx(auVar183,_DAT_01f7afb0);
          auVar147 = vmovshdup_avx(auVar146);
          fVar378 = auVar147._0_4_;
          if ((auVar146._0_4_ != fVar378) || (NAN(auVar146._0_4_) || NAN(fVar378))) {
            if ((fVar243 != fVar242) || (NAN(fVar243) || NAN(fVar242))) {
              fVar242 = -fVar242 / (fVar243 - fVar242);
              auVar146 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar242) * 0.0 + fVar242)));
            }
            else {
              auVar146 = ZEXT816(0x3f80000000000000);
              if ((fVar242 != 0.0) || (NAN(fVar242))) {
                auVar146 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar282 = vcmpps_avx(auVar183,auVar146,1);
            auVar147 = vblendps_avx(auVar183,auVar146,2);
            auVar146 = vblendps_avx(auVar146,auVar183,2);
            auVar183 = vblendvps_avx(auVar146,auVar147,auVar282);
          }
          auVar110 = vcmpss_avx(auVar110,ZEXT416(0) << 0x20,1);
          auVar184._8_4_ = 0x3f800000;
          auVar184._0_8_ = 0x3f8000003f800000;
          auVar184._12_4_ = 0x3f800000;
          auVar228._8_4_ = 0xbf800000;
          auVar228._0_8_ = 0xbf800000bf800000;
          auVar228._12_4_ = 0xbf800000;
          auVar110 = vblendvps_avx(auVar184,auVar228,auVar110);
          fVar242 = auVar110._0_4_;
          if ((auVar223._0_4_ != fVar242) || (NAN(auVar223._0_4_) || NAN(fVar242))) {
            if ((fVar240 != fVar218) || (NAN(fVar240) || NAN(fVar218))) {
              fVar218 = -fVar218 / (fVar240 - fVar218);
              auVar110 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar218) * 0.0 + fVar218)));
            }
            else {
              auVar110 = ZEXT816(0x3f80000000000000);
              if ((fVar218 != 0.0) || (NAN(fVar218))) {
                auVar110 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar146 = vcmpps_avx(auVar183,auVar110,1);
            auVar223 = vblendps_avx(auVar183,auVar110,2);
            auVar110 = vblendps_avx(auVar110,auVar183,2);
            auVar183 = vblendvps_avx(auVar110,auVar223,auVar146);
          }
          if ((fVar378 != fVar242) || (NAN(fVar378) || NAN(fVar242))) {
            auVar111._8_4_ = 0x3f800000;
            auVar111._0_8_ = 0x3f8000003f800000;
            auVar111._12_4_ = 0x3f800000;
            auVar110 = vcmpps_avx(auVar183,auVar111,1);
            auVar223 = vinsertps_avx(auVar183,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar185._4_12_ = auVar183._4_12_;
            auVar185._0_4_ = 0x3f800000;
            auVar183 = vblendvps_avx(auVar185,auVar223,auVar110);
          }
          auVar110 = vcmpps_avx(auVar183,_DAT_01f46740,1);
          auVar74._12_4_ = 0;
          auVar74._0_12_ = auVar183._4_12_;
          auVar223 = vinsertps_avx(auVar183,ZEXT416(0x3f800000),0x10);
          auVar110 = vblendvps_avx(auVar223,auVar74 << 0x20,auVar110);
          auVar223 = vmovshdup_avx(auVar110);
        } while (auVar223._0_4_ < auVar110._0_4_);
        auVar112._0_4_ = auVar110._0_4_ + -0.1;
        auVar112._4_4_ = auVar110._4_4_ + 0.1;
        auVar112._8_4_ = auVar110._8_4_ + 0.0;
        auVar112._12_4_ = auVar110._12_4_ + 0.0;
        auVar146 = vshufpd_avx(auVar226,auVar226,3);
        auVar273._8_8_ = 0x3f80000000000000;
        auVar273._0_8_ = 0x3f80000000000000;
        auVar110 = vcmpps_avx(auVar112,auVar273,1);
        auVar73._12_4_ = 0;
        auVar73._0_12_ = auVar112._4_12_;
        auVar223 = vinsertps_avx(auVar112,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar110 = vblendvps_avx(auVar223,auVar73 << 0x20,auVar110);
        auVar223 = vshufpd_avx(auVar34,auVar34,3);
        auVar183 = vshufps_avx(auVar110,auVar110,0x50);
        auVar391._8_4_ = 0x3f800000;
        auVar391._0_8_ = 0x3f8000003f800000;
        auVar391._12_4_ = 0x3f800000;
        auVar147 = vsubps_avx(auVar391,auVar183);
        local_620 = auVar197._0_4_;
        fStack_61c = auVar197._4_4_;
        fStack_618 = auVar197._8_4_;
        fStack_614 = auVar197._12_4_;
        fVar218 = auVar183._0_4_;
        fVar240 = auVar183._4_4_;
        fVar242 = auVar183._8_4_;
        fVar243 = auVar183._12_4_;
        local_6a0 = auVar158._0_4_;
        fStack_69c = auVar158._4_4_;
        fStack_698 = auVar158._8_4_;
        fStack_694 = auVar158._12_4_;
        fVar378 = auVar147._0_4_;
        fVar245 = auVar147._4_4_;
        fVar246 = auVar147._8_4_;
        fVar247 = auVar147._12_4_;
        auVar113._0_4_ = fVar218 * local_620 + fVar378 * auVar272._0_4_;
        auVar113._4_4_ = fVar240 * fStack_61c + fVar245 * auVar272._4_4_;
        auVar113._8_4_ = fVar242 * fStack_618 + fVar246 * auVar272._0_4_;
        auVar113._12_4_ = fVar243 * fStack_614 + fVar247 * auVar272._4_4_;
        auVar253._0_4_ = auVar146._0_4_ * fVar218 + fVar378 * auVar226._0_4_;
        auVar253._4_4_ = auVar146._4_4_ * fVar240 + fVar245 * auVar226._4_4_;
        auVar253._8_4_ = auVar146._8_4_ * fVar242 + fVar246 * auVar226._0_4_;
        auVar253._12_4_ = auVar146._12_4_ * fVar243 + fVar247 * auVar226._4_4_;
        auVar291._0_4_ = auVar223._0_4_ * fVar218 + fVar378 * fVar284;
        auVar291._4_4_ = auVar223._4_4_ * fVar240 + fVar245 * fVar134;
        auVar291._8_4_ = auVar223._8_4_ * fVar242 + fVar246 * fVar284;
        auVar291._12_4_ = auVar223._12_4_ * fVar243 + fVar247 * fVar134;
        auVar341._0_4_ = fVar218 * local_6a0 + fVar378 * auVar277._16_4_;
        auVar341._4_4_ = fVar240 * fStack_69c + fVar245 * auVar277._20_4_;
        auVar341._8_4_ = fVar242 * fStack_698 + fVar246 * auVar277._16_4_;
        auVar341._12_4_ = fVar243 * fStack_694 + fVar247 * auVar277._20_4_;
        auVar158 = vsubps_avx(auVar391,auVar110);
        auVar223 = vmovshdup_avx(auVar390);
        auVar197 = vmovsldup_avx(auVar390);
        auVar404._0_4_ = auVar158._0_4_ * auVar197._0_4_ + auVar110._0_4_ * auVar223._0_4_;
        auVar404._4_4_ = auVar158._4_4_ * auVar197._4_4_ + auVar110._4_4_ * auVar223._4_4_;
        auVar404._8_4_ = auVar158._8_4_ * auVar197._8_4_ + auVar110._8_4_ * auVar223._8_4_;
        auVar404._12_4_ = auVar158._12_4_ * auVar197._12_4_ + auVar110._12_4_ * auVar223._12_4_;
        auVar34 = vmovshdup_avx(auVar404);
        auVar110 = vsubps_avx(auVar253,auVar113);
        auVar186._0_4_ = auVar110._0_4_ * 3.0;
        auVar186._4_4_ = auVar110._4_4_ * 3.0;
        auVar186._8_4_ = auVar110._8_4_ * 3.0;
        auVar186._12_4_ = auVar110._12_4_ * 3.0;
        auVar110 = vsubps_avx(auVar291,auVar253);
        auVar212._0_4_ = auVar110._0_4_ * 3.0;
        auVar212._4_4_ = auVar110._4_4_ * 3.0;
        auVar212._8_4_ = auVar110._8_4_ * 3.0;
        auVar212._12_4_ = auVar110._12_4_ * 3.0;
        auVar110 = vsubps_avx(auVar341,auVar291);
        auVar307._0_4_ = auVar110._0_4_ * 3.0;
        auVar307._4_4_ = auVar110._4_4_ * 3.0;
        auVar307._8_4_ = auVar110._8_4_ * 3.0;
        auVar307._12_4_ = auVar110._12_4_ * 3.0;
        auVar223 = vminps_avx(auVar212,auVar307);
        auVar110 = vmaxps_avx(auVar212,auVar307);
        auVar223 = vminps_avx(auVar186,auVar223);
        auVar110 = vmaxps_avx(auVar186,auVar110);
        auVar197 = vshufpd_avx(auVar223,auVar223,3);
        auVar158 = vshufpd_avx(auVar110,auVar110,3);
        auVar223 = vminps_avx(auVar223,auVar197);
        auVar110 = vmaxps_avx(auVar110,auVar158);
        auVar197 = vshufps_avx(ZEXT416((uint)(1.0 / fVar132)),ZEXT416((uint)(1.0 / fVar132)),0);
        auVar308._0_4_ = auVar197._0_4_ * auVar223._0_4_;
        auVar308._4_4_ = auVar197._4_4_ * auVar223._4_4_;
        auVar308._8_4_ = auVar197._8_4_ * auVar223._8_4_;
        auVar308._12_4_ = auVar197._12_4_ * auVar223._12_4_;
        auVar321._0_4_ = auVar197._0_4_ * auVar110._0_4_;
        auVar321._4_4_ = auVar197._4_4_ * auVar110._4_4_;
        auVar321._8_4_ = auVar197._8_4_ * auVar110._8_4_;
        auVar321._12_4_ = auVar197._12_4_ * auVar110._12_4_;
        auVar147 = ZEXT416((uint)(1.0 / (auVar34._0_4_ - auVar404._0_4_)));
        auVar110 = vshufpd_avx(auVar113,auVar113,3);
        auVar223 = vshufpd_avx(auVar253,auVar253,3);
        auVar197 = vshufpd_avx(auVar291,auVar291,3);
        auVar158 = vshufpd_avx(auVar341,auVar341,3);
        auVar110 = vsubps_avx(auVar110,auVar113);
        auVar146 = vsubps_avx(auVar223,auVar253);
        auVar183 = vsubps_avx(auVar197,auVar291);
        auVar158 = vsubps_avx(auVar158,auVar341);
        auVar223 = vminps_avx(auVar110,auVar146);
        auVar110 = vmaxps_avx(auVar110,auVar146);
        auVar197 = vminps_avx(auVar183,auVar158);
        auVar197 = vminps_avx(auVar223,auVar197);
        auVar223 = vmaxps_avx(auVar183,auVar158);
        auVar110 = vmaxps_avx(auVar110,auVar223);
        auVar223 = vshufps_avx(auVar147,auVar147,0);
        auVar382._0_4_ = auVar223._0_4_ * auVar197._0_4_;
        auVar382._4_4_ = auVar223._4_4_ * auVar197._4_4_;
        auVar382._8_4_ = auVar223._8_4_ * auVar197._8_4_;
        auVar382._12_4_ = auVar223._12_4_ * auVar197._12_4_;
        auVar392._0_4_ = auVar223._0_4_ * auVar110._0_4_;
        auVar392._4_4_ = auVar223._4_4_ * auVar110._4_4_;
        auVar392._8_4_ = auVar223._8_4_ * auVar110._8_4_;
        auVar392._12_4_ = auVar223._12_4_ * auVar110._12_4_;
        auVar110 = vmovsldup_avx(auVar404);
        auVar342._4_12_ = auVar110._4_12_;
        auVar342._0_4_ = fVar133;
        auVar351._4_12_ = auVar404._4_12_;
        auVar351._0_4_ = fVar93;
        auVar213._0_4_ = (fVar133 + fVar93) * 0.5;
        auVar213._4_4_ = (auVar110._4_4_ + auVar404._4_4_) * 0.5;
        auVar213._8_4_ = (auVar110._8_4_ + auVar404._8_4_) * 0.5;
        auVar213._12_4_ = (auVar110._12_4_ + auVar404._12_4_) * 0.5;
        auVar110 = vshufps_avx(auVar213,auVar213,0);
        fVar218 = auVar110._0_4_;
        fVar240 = auVar110._4_4_;
        fVar242 = auVar110._8_4_;
        fVar243 = auVar110._12_4_;
        local_6d0._0_4_ = auVar303._0_4_;
        local_6d0._4_4_ = auVar303._4_4_;
        fStack_6c8 = auVar303._8_4_;
        fStack_6c4 = auVar303._12_4_;
        auVar148._0_4_ = fVar218 * (float)local_370._0_4_ + (float)local_6d0._0_4_;
        auVar148._4_4_ = fVar240 * (float)local_370._4_4_ + (float)local_6d0._4_4_;
        auVar148._8_4_ = fVar242 * fStack_368 + fStack_6c8;
        auVar148._12_4_ = fVar243 * fStack_364 + fStack_6c4;
        local_650 = auVar269._0_4_;
        fStack_64c = auVar269._4_4_;
        fStack_648 = auVar269._8_4_;
        fStack_644 = auVar269._12_4_;
        auVar187._0_4_ = fVar218 * (float)local_380._0_4_ + local_650;
        auVar187._4_4_ = fVar240 * (float)local_380._4_4_ + fStack_64c;
        auVar187._8_4_ = fVar242 * fStack_378 + fStack_648;
        auVar187._12_4_ = fVar243 * fStack_374 + fStack_644;
        local_660 = auVar32._0_4_;
        fStack_65c = auVar32._4_4_;
        fStack_658 = auVar32._8_4_;
        fStack_654 = auVar32._12_4_;
        auVar254._0_4_ = fVar218 * (float)local_390._0_4_ + local_660;
        auVar254._4_4_ = fVar240 * (float)local_390._4_4_ + fStack_65c;
        auVar254._8_4_ = fVar242 * fStack_388 + fStack_658;
        auVar254._12_4_ = fVar243 * fStack_384 + fStack_654;
        auVar110 = vsubps_avx(auVar187,auVar148);
        auVar149._0_4_ = auVar148._0_4_ + fVar218 * auVar110._0_4_;
        auVar149._4_4_ = auVar148._4_4_ + fVar240 * auVar110._4_4_;
        auVar149._8_4_ = auVar148._8_4_ + fVar242 * auVar110._8_4_;
        auVar149._12_4_ = auVar148._12_4_ + fVar243 * auVar110._12_4_;
        auVar110 = vsubps_avx(auVar254,auVar187);
        auVar188._0_4_ = auVar187._0_4_ + fVar218 * auVar110._0_4_;
        auVar188._4_4_ = auVar187._4_4_ + fVar240 * auVar110._4_4_;
        auVar188._8_4_ = auVar187._8_4_ + fVar242 * auVar110._8_4_;
        auVar188._12_4_ = auVar187._12_4_ + fVar243 * auVar110._12_4_;
        auVar110 = vsubps_avx(auVar188,auVar149);
        fVar218 = auVar149._0_4_ + fVar218 * auVar110._0_4_;
        fVar240 = auVar149._4_4_ + fVar240 * auVar110._4_4_;
        auVar114._0_8_ = CONCAT44(fVar240,fVar218);
        auVar114._8_4_ = auVar149._8_4_ + fVar242 * auVar110._8_4_;
        auVar114._12_4_ = auVar149._12_4_ + fVar243 * auVar110._12_4_;
        fVar242 = auVar110._0_4_ * 3.0;
        fVar243 = auVar110._4_4_ * 3.0;
        auVar150._0_8_ = CONCAT44(fVar243,fVar242);
        auVar150._8_4_ = auVar110._8_4_ * 3.0;
        auVar150._12_4_ = auVar110._12_4_ * 3.0;
        auVar189._8_8_ = auVar114._0_8_;
        auVar189._0_8_ = auVar114._0_8_;
        auVar110 = vshufpd_avx(auVar114,auVar114,3);
        auVar223 = vshufps_avx(auVar213,auVar213,0x55);
        auVar183 = vsubps_avx(auVar110,auVar189);
        auVar366._0_4_ = auVar183._0_4_ * auVar223._0_4_ + fVar218;
        auVar366._4_4_ = auVar183._4_4_ * auVar223._4_4_ + fVar240;
        auVar366._8_4_ = auVar183._8_4_ * auVar223._8_4_ + fVar218;
        auVar366._12_4_ = auVar183._12_4_ * auVar223._12_4_ + fVar240;
        auVar190._8_8_ = auVar150._0_8_;
        auVar190._0_8_ = auVar150._0_8_;
        auVar110 = vshufpd_avx(auVar150,auVar150,1);
        auVar110 = vsubps_avx(auVar110,auVar190);
        auVar151._0_4_ = auVar110._0_4_ * auVar223._0_4_ + fVar242;
        auVar151._4_4_ = auVar110._4_4_ * auVar223._4_4_ + fVar243;
        auVar151._8_4_ = auVar110._8_4_ * auVar223._8_4_ + fVar242;
        auVar151._12_4_ = auVar110._12_4_ * auVar223._12_4_ + fVar243;
        auVar223 = vmovshdup_avx(auVar151);
        auVar255._0_8_ = auVar223._0_8_ ^ 0x8000000080000000;
        auVar255._8_4_ = auVar223._8_4_ ^ 0x80000000;
        auVar255._12_4_ = auVar223._12_4_ ^ 0x80000000;
        auVar197 = vmovshdup_avx(auVar183);
        auVar110 = vunpcklps_avx(auVar197,auVar255);
        auVar158 = vshufps_avx(auVar110,auVar255,4);
        auVar115._0_8_ = auVar183._0_8_ ^ 0x8000000080000000;
        auVar115._8_4_ = -auVar183._8_4_;
        auVar115._12_4_ = -auVar183._12_4_;
        auVar110 = vmovlhps_avx(auVar115,auVar151);
        auVar146 = vshufps_avx(auVar110,auVar151,8);
        auVar110 = ZEXT416((uint)(auVar151._0_4_ * auVar197._0_4_ - auVar183._0_4_ * auVar223._0_4_)
                          );
        auVar223 = vshufps_avx(auVar110,auVar110,0);
        auVar110 = vdivps_avx(auVar158,auVar223);
        auVar223 = vdivps_avx(auVar146,auVar223);
        auVar146 = vinsertps_avx(auVar308,auVar382,0x1c);
        auVar183 = vinsertps_avx(auVar321,auVar392,0x1c);
        auVar147 = vinsertps_avx(auVar382,auVar308,0x4c);
        auVar282 = vinsertps_avx(auVar392,auVar321,0x4c);
        auVar197 = vmovsldup_avx(auVar110);
        auVar191._0_4_ = auVar197._0_4_ * auVar146._0_4_;
        auVar191._4_4_ = auVar197._4_4_ * auVar146._4_4_;
        auVar191._8_4_ = auVar197._8_4_ * auVar146._8_4_;
        auVar191._12_4_ = auVar197._12_4_ * auVar146._12_4_;
        auVar152._0_4_ = auVar183._0_4_ * auVar197._0_4_;
        auVar152._4_4_ = auVar183._4_4_ * auVar197._4_4_;
        auVar152._8_4_ = auVar183._8_4_ * auVar197._8_4_;
        auVar152._12_4_ = auVar183._12_4_ * auVar197._12_4_;
        auVar158 = vminps_avx(auVar191,auVar152);
        auVar197 = vmaxps_avx(auVar152,auVar191);
        auVar33 = vmovsldup_avx(auVar223);
        auVar393._0_4_ = auVar147._0_4_ * auVar33._0_4_;
        auVar393._4_4_ = auVar147._4_4_ * auVar33._4_4_;
        auVar393._8_4_ = auVar147._8_4_ * auVar33._8_4_;
        auVar393._12_4_ = auVar147._12_4_ * auVar33._12_4_;
        auVar192._0_4_ = auVar282._0_4_ * auVar33._0_4_;
        auVar192._4_4_ = auVar282._4_4_ * auVar33._4_4_;
        auVar192._8_4_ = auVar282._8_4_ * auVar33._8_4_;
        auVar192._12_4_ = auVar282._12_4_ * auVar33._12_4_;
        auVar33 = vminps_avx(auVar393,auVar192);
        auVar229._0_4_ = auVar158._0_4_ + auVar33._0_4_;
        auVar229._4_4_ = auVar158._4_4_ + auVar33._4_4_;
        auVar229._8_4_ = auVar158._8_4_ + auVar33._8_4_;
        auVar229._12_4_ = auVar158._12_4_ + auVar33._12_4_;
        auVar158 = vmaxps_avx(auVar192,auVar393);
        auVar33 = vsubps_avx(auVar342,auVar213);
        auVar388 = vsubps_avx(auVar351,auVar213);
        auVar153._0_4_ = auVar197._0_4_ + auVar158._0_4_;
        auVar153._4_4_ = auVar197._4_4_ + auVar158._4_4_;
        auVar153._8_4_ = auVar197._8_4_ + auVar158._8_4_;
        auVar153._12_4_ = auVar197._12_4_ + auVar158._12_4_;
        auVar193._8_8_ = 0x3f800000;
        auVar193._0_8_ = 0x3f800000;
        auVar197 = vsubps_avx(auVar193,auVar153);
        auVar158 = vsubps_avx(auVar193,auVar229);
        fVar246 = auVar33._0_4_;
        auVar230._0_4_ = fVar246 * auVar197._0_4_;
        fVar247 = auVar33._4_4_;
        auVar230._4_4_ = fVar247 * auVar197._4_4_;
        fVar284 = auVar33._8_4_;
        auVar230._8_4_ = fVar284 * auVar197._8_4_;
        fVar134 = auVar33._12_4_;
        auVar230._12_4_ = fVar134 * auVar197._12_4_;
        fVar242 = auVar388._0_4_;
        auVar154._0_4_ = fVar242 * auVar197._0_4_;
        fVar243 = auVar388._4_4_;
        auVar154._4_4_ = fVar243 * auVar197._4_4_;
        fVar378 = auVar388._8_4_;
        auVar154._8_4_ = fVar378 * auVar197._8_4_;
        fVar245 = auVar388._12_4_;
        auVar154._12_4_ = fVar245 * auVar197._12_4_;
        auVar352._0_4_ = fVar246 * auVar158._0_4_;
        auVar352._4_4_ = fVar247 * auVar158._4_4_;
        auVar352._8_4_ = fVar284 * auVar158._8_4_;
        auVar352._12_4_ = fVar134 * auVar158._12_4_;
        auVar194._0_4_ = fVar242 * auVar158._0_4_;
        auVar194._4_4_ = fVar243 * auVar158._4_4_;
        auVar194._8_4_ = fVar378 * auVar158._8_4_;
        auVar194._12_4_ = fVar245 * auVar158._12_4_;
        auVar197 = vminps_avx(auVar230,auVar352);
        auVar158 = vminps_avx(auVar154,auVar194);
        auVar33 = vminps_avx(auVar197,auVar158);
        auVar197 = vmaxps_avx(auVar352,auVar230);
        auVar158 = vmaxps_avx(auVar194,auVar154);
        auVar388 = vshufps_avx(auVar213,auVar213,0x54);
        auVar158 = vmaxps_avx(auVar158,auVar197);
        auVar6 = vshufps_avx(auVar366,auVar366,0);
        auVar7 = vshufps_avx(auVar366,auVar366,0x55);
        auVar197 = vhaddps_avx(auVar33,auVar33);
        auVar158 = vhaddps_avx(auVar158,auVar158);
        auVar214._0_4_ = auVar6._0_4_ * auVar110._0_4_ + auVar7._0_4_ * auVar223._0_4_;
        auVar214._4_4_ = auVar6._4_4_ * auVar110._4_4_ + auVar7._4_4_ * auVar223._4_4_;
        auVar214._8_4_ = auVar6._8_4_ * auVar110._8_4_ + auVar7._8_4_ * auVar223._8_4_;
        auVar214._12_4_ = auVar6._12_4_ * auVar110._12_4_ + auVar7._12_4_ * auVar223._12_4_;
        auVar33 = vsubps_avx(auVar388,auVar214);
        fVar218 = auVar33._0_4_ + auVar197._0_4_;
        fVar240 = auVar33._0_4_ + auVar158._0_4_;
        auVar197 = vmaxss_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar218));
        auVar158 = vminss_avx(ZEXT416((uint)fVar240),ZEXT416((uint)fVar93));
      } while (auVar158._0_4_ < auVar197._0_4_);
      auVar197 = vmovshdup_avx(auVar110);
      auVar116._0_4_ = auVar197._0_4_ * auVar146._0_4_;
      auVar116._4_4_ = auVar197._4_4_ * auVar146._4_4_;
      auVar116._8_4_ = auVar197._8_4_ * auVar146._8_4_;
      auVar116._12_4_ = auVar197._12_4_ * auVar146._12_4_;
      auVar155._0_4_ = auVar183._0_4_ * auVar197._0_4_;
      auVar155._4_4_ = auVar183._4_4_ * auVar197._4_4_;
      auVar155._8_4_ = auVar183._8_4_ * auVar197._8_4_;
      auVar155._12_4_ = auVar183._12_4_ * auVar197._12_4_;
      auVar158 = vminps_avx(auVar116,auVar155);
      auVar197 = vmaxps_avx(auVar155,auVar116);
      auVar146 = vmovshdup_avx(auVar223);
      auVar231._0_4_ = auVar147._0_4_ * auVar146._0_4_;
      auVar231._4_4_ = auVar147._4_4_ * auVar146._4_4_;
      auVar231._8_4_ = auVar147._8_4_ * auVar146._8_4_;
      auVar231._12_4_ = auVar147._12_4_ * auVar146._12_4_;
      auVar156._0_4_ = auVar282._0_4_ * auVar146._0_4_;
      auVar156._4_4_ = auVar282._4_4_ * auVar146._4_4_;
      auVar156._8_4_ = auVar282._8_4_ * auVar146._8_4_;
      auVar156._12_4_ = auVar282._12_4_ * auVar146._12_4_;
      auVar146 = vminps_avx(auVar231,auVar156);
      auVar195._0_4_ = auVar158._0_4_ + auVar146._0_4_;
      auVar195._4_4_ = auVar158._4_4_ + auVar146._4_4_;
      auVar195._8_4_ = auVar158._8_4_ + auVar146._8_4_;
      auVar195._12_4_ = auVar158._12_4_ + auVar146._12_4_;
      auVar158 = vmaxps_avx(auVar156,auVar231);
      auVar117._0_4_ = auVar197._0_4_ + auVar158._0_4_;
      auVar117._4_4_ = auVar197._4_4_ + auVar158._4_4_;
      auVar117._8_4_ = auVar197._8_4_ + auVar158._8_4_;
      auVar117._12_4_ = auVar197._12_4_ + auVar158._12_4_;
      auVar197 = vsubps_avx(auVar273,auVar117);
      auVar158 = vsubps_avx(auVar273,auVar195);
      auVar196._0_4_ = fVar246 * auVar197._0_4_;
      auVar196._4_4_ = fVar247 * auVar197._4_4_;
      auVar196._8_4_ = fVar284 * auVar197._8_4_;
      auVar196._12_4_ = fVar134 * auVar197._12_4_;
      auVar232._0_4_ = fVar246 * auVar158._0_4_;
      auVar232._4_4_ = fVar247 * auVar158._4_4_;
      auVar232._8_4_ = fVar284 * auVar158._8_4_;
      auVar232._12_4_ = fVar134 * auVar158._12_4_;
      auVar118._0_4_ = fVar242 * auVar197._0_4_;
      auVar118._4_4_ = fVar243 * auVar197._4_4_;
      auVar118._8_4_ = fVar378 * auVar197._8_4_;
      auVar118._12_4_ = fVar245 * auVar197._12_4_;
      auVar157._0_4_ = fVar242 * auVar158._0_4_;
      auVar157._4_4_ = fVar243 * auVar158._4_4_;
      auVar157._8_4_ = fVar378 * auVar158._8_4_;
      auVar157._12_4_ = fVar245 * auVar158._12_4_;
      auVar197 = vminps_avx(auVar196,auVar232);
      auVar158 = vminps_avx(auVar118,auVar157);
      auVar197 = vminps_avx(auVar197,auVar158);
      auVar158 = vmaxps_avx(auVar232,auVar196);
      auVar146 = vmaxps_avx(auVar157,auVar118);
      auVar197 = vhaddps_avx(auVar197,auVar197);
      auVar158 = vmaxps_avx(auVar146,auVar158);
      auVar158 = vhaddps_avx(auVar158,auVar158);
      auVar146 = vmovshdup_avx(auVar33);
      auVar183 = ZEXT416((uint)(auVar146._0_4_ + auVar197._0_4_));
      auVar197 = vmaxss_avx(auVar404,auVar183);
      auVar146 = ZEXT416((uint)(auVar146._0_4_ + auVar158._0_4_));
      auVar158 = vminss_avx(auVar146,auVar34);
    } while (auVar158._0_4_ < auVar197._0_4_);
    bVar89 = 0;
    if ((fVar133 < fVar218) && (fVar240 < fVar93)) {
      auVar197 = vcmpps_avx(auVar146,auVar34,1);
      auVar158 = vcmpps_avx(auVar404,auVar183,1);
      auVar197 = vandps_avx(auVar158,auVar197);
      bVar89 = auVar197[0];
    }
    auVar322._8_4_ = 0x7fffffff;
    auVar322._0_8_ = 0x7fffffff7fffffff;
    auVar322._12_4_ = 0x7fffffff;
    if ((3 < (uint)uVar85 || fVar132 < 0.001) || (bVar89 & 1) != 0) {
      lVar87 = 0xc9;
      do {
        lVar87 = lVar87 + -1;
        if (lVar87 == 0) goto LAB_00b5b45c;
        fVar132 = auVar33._0_4_;
        fVar93 = 1.0 - fVar132;
        auVar197 = ZEXT416((uint)(fVar93 * fVar93 * fVar93));
        auVar197 = vshufps_avx(auVar197,auVar197,0);
        auVar158 = ZEXT416((uint)(fVar132 * 3.0 * fVar93 * fVar93));
        auVar158 = vshufps_avx(auVar158,auVar158,0);
        auVar146 = ZEXT416((uint)(fVar93 * fVar132 * fVar132 * 3.0));
        auVar146 = vshufps_avx(auVar146,auVar146,0);
        auVar183 = ZEXT416((uint)(fVar132 * fVar132 * fVar132));
        auVar183 = vshufps_avx(auVar183,auVar183,0);
        fVar93 = (float)local_6d0._0_4_ * auVar197._0_4_ +
                 local_650 * auVar158._0_4_ +
                 (float)local_3a0._0_4_ * auVar183._0_4_ + local_660 * auVar146._0_4_;
        fVar132 = (float)local_6d0._4_4_ * auVar197._4_4_ +
                  fStack_64c * auVar158._4_4_ +
                  (float)local_3a0._4_4_ * auVar183._4_4_ + fStack_65c * auVar146._4_4_;
        auVar119._0_8_ = CONCAT44(fVar132,fVar93);
        auVar119._8_4_ =
             fStack_6c8 * auVar197._8_4_ +
             fStack_648 * auVar158._8_4_ + fStack_398 * auVar183._8_4_ + fStack_658 * auVar146._8_4_
        ;
        auVar119._12_4_ =
             fStack_6c4 * auVar197._12_4_ +
             fStack_644 * auVar158._12_4_ +
             fStack_394 * auVar183._12_4_ + fStack_654 * auVar146._12_4_;
        auVar159._8_8_ = auVar119._0_8_;
        auVar159._0_8_ = auVar119._0_8_;
        auVar158 = vshufpd_avx(auVar119,auVar119,1);
        auVar197 = vmovshdup_avx(auVar33);
        auVar158 = vsubps_avx(auVar158,auVar159);
        auVar120._0_4_ = auVar197._0_4_ * auVar158._0_4_ + fVar93;
        auVar120._4_4_ = auVar197._4_4_ * auVar158._4_4_ + fVar132;
        auVar120._8_4_ = auVar197._8_4_ * auVar158._8_4_ + fVar93;
        auVar120._12_4_ = auVar197._12_4_ * auVar158._12_4_ + fVar132;
        auVar197 = vshufps_avx(auVar120,auVar120,0);
        auVar158 = vshufps_avx(auVar120,auVar120,0x55);
        auVar160._0_4_ = auVar110._0_4_ * auVar197._0_4_ + auVar223._0_4_ * auVar158._0_4_;
        auVar160._4_4_ = auVar110._4_4_ * auVar197._4_4_ + auVar223._4_4_ * auVar158._4_4_;
        auVar160._8_4_ = auVar110._8_4_ * auVar197._8_4_ + auVar223._8_4_ * auVar158._8_4_;
        auVar160._12_4_ = auVar110._12_4_ * auVar197._12_4_ + auVar223._12_4_ * auVar158._12_4_;
        auVar33 = vsubps_avx(auVar33,auVar160);
        auVar197 = vandps_avx(auVar322,auVar120);
        auVar158 = vshufps_avx(auVar197,auVar197,0xf5);
        auVar197 = vmaxss_avx(auVar158,auVar197);
      } while ((float)local_3b0._0_4_ <= auVar197._0_4_);
      fVar93 = auVar33._0_4_;
      if ((0.0 <= fVar93) && (fVar93 <= 1.0)) {
        auVar110 = vmovshdup_avx(auVar33);
        fVar132 = auVar110._0_4_;
        if ((0.0 <= fVar132) && (fVar132 <= 1.0)) {
          auVar110 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                   ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar282 = vinsertps_avx(auVar110,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28
                                  );
          auVar110 = vdpps_avx(auVar282,local_3c0,0x7f);
          auVar223 = vdpps_avx(auVar282,local_3d0,0x7f);
          auVar197 = vdpps_avx(auVar282,local_3e0,0x7f);
          auVar158 = vdpps_avx(auVar282,local_3f0,0x7f);
          auVar146 = vdpps_avx(auVar282,local_400,0x7f);
          auVar183 = vdpps_avx(auVar282,local_410,0x7f);
          auVar147 = vdpps_avx(auVar282,local_420,0x7f);
          auVar282 = vdpps_avx(auVar282,local_430,0x7f);
          fVar243 = 1.0 - fVar132;
          fVar378 = 1.0 - fVar93;
          fVar133 = auVar33._4_4_;
          fVar218 = auVar33._8_4_;
          fVar240 = auVar33._12_4_;
          fVar242 = fVar378 * fVar93 * fVar93 * 3.0;
          auVar292._0_4_ = fVar93 * fVar93 * fVar93;
          auVar292._4_4_ = fVar133 * fVar133 * fVar133;
          auVar292._8_4_ = fVar218 * fVar218 * fVar218;
          auVar292._12_4_ = fVar240 * fVar240 * fVar240;
          fVar218 = fVar378 * fVar378 * fVar93 * 3.0;
          fVar240 = fVar378 * fVar378 * fVar378;
          fVar133 = fVar240 * (fVar243 * auVar110._0_4_ + fVar132 * auVar146._0_4_) +
                    (fVar243 * auVar223._0_4_ + auVar183._0_4_ * fVar132) * fVar218 +
                    fVar242 * (auVar147._0_4_ * fVar132 + fVar243 * auVar197._0_4_) +
                    auVar292._0_4_ * (fVar243 * auVar158._0_4_ + fVar132 * auVar282._0_4_);
          if (((fVar137 <= fVar133) &&
              (fVar243 = *(float *)(ray + k * 4 + 0x100), fVar133 <= fVar243)) &&
             (pGVar18 = (context->scene->geometries).items[uVar83].ptr,
             (pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
            auStack_f0 = vshufps_avx(auVar33,auVar33,0x55);
            auVar323._8_4_ = 0x3f800000;
            auVar323._0_8_ = 0x3f8000003f800000;
            auVar323._12_4_ = 0x3f800000;
            auVar110 = vsubps_avx(auVar323,auStack_f0);
            fVar245 = auStack_f0._0_4_;
            fVar246 = auStack_f0._4_4_;
            fVar247 = auStack_f0._8_4_;
            fVar284 = auStack_f0._12_4_;
            fVar134 = auVar110._0_4_;
            fVar135 = auVar110._4_4_;
            fVar136 = auVar110._8_4_;
            fVar217 = auVar110._12_4_;
            auVar343._0_4_ = fVar245 * (float)local_4c0._0_4_ + fVar134 * (float)local_4a0._0_4_;
            auVar343._4_4_ = fVar246 * (float)local_4c0._4_4_ + fVar135 * (float)local_4a0._4_4_;
            auVar343._8_4_ = fVar247 * fStack_4b8 + fVar136 * fStack_498;
            auVar343._12_4_ = fVar284 * fStack_4b4 + fVar217 * fStack_494;
            auVar353._0_4_ = fVar245 * (float)local_4d0._0_4_ + fVar134 * fVar260;
            auVar353._4_4_ = fVar246 * (float)local_4d0._4_4_ + fVar135 * fVar263;
            auVar353._8_4_ = fVar247 * fStack_4c8 + fVar136 * fVar267;
            auVar353._12_4_ = fVar284 * fStack_4c4 + fVar217 * fVar280;
            auVar367._0_4_ = fVar245 * fVar262 + fVar134 * (float)local_4b0._0_4_;
            auVar367._4_4_ = fVar246 * fVar265 + fVar135 * (float)local_4b0._4_4_;
            auVar367._8_4_ = fVar247 * fVar279 + fVar136 * fStack_4a8;
            auVar367._12_4_ = fVar284 * fVar283 + fVar217 * fStack_4a4;
            auVar324._0_4_ = fVar245 * local_4e0 + fVar134 * fVar261;
            auVar324._4_4_ = fVar246 * fStack_4dc + fVar135 * fVar264;
            auVar324._8_4_ = fVar247 * fStack_4d8 + fVar136 * fVar278;
            auVar324._12_4_ = fVar284 * fStack_4d4 + fVar217 * fVar281;
            auVar158 = vsubps_avx(auVar353,auVar343);
            auVar146 = vsubps_avx(auVar367,auVar353);
            auVar183 = vsubps_avx(auVar324,auVar367);
            auStack_110 = vshufps_avx(auVar33,auVar33,0);
            fVar284 = auStack_110._0_4_;
            fVar134 = auStack_110._4_4_;
            fVar135 = auStack_110._8_4_;
            fVar136 = auStack_110._12_4_;
            auVar110 = vshufps_avx(ZEXT416((uint)fVar378),ZEXT416((uint)fVar378),0);
            fVar378 = auVar110._0_4_;
            fVar245 = auVar110._4_4_;
            fVar246 = auVar110._8_4_;
            fVar247 = auVar110._12_4_;
            auVar110 = vshufps_avx(auVar292,auVar292,0);
            auVar223 = vshufps_avx(ZEXT416((uint)fVar242),ZEXT416((uint)fVar242),0);
            auVar197 = vshufps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),0);
            auVar274._0_4_ =
                 (fVar378 * (fVar378 * auVar158._0_4_ + fVar284 * auVar146._0_4_) +
                 fVar284 * (fVar378 * auVar146._0_4_ + fVar284 * auVar183._0_4_)) * 3.0;
            auVar274._4_4_ =
                 (fVar245 * (fVar245 * auVar158._4_4_ + fVar134 * auVar146._4_4_) +
                 fVar134 * (fVar245 * auVar146._4_4_ + fVar134 * auVar183._4_4_)) * 3.0;
            auVar274._8_4_ =
                 (fVar246 * (fVar246 * auVar158._8_4_ + fVar135 * auVar146._8_4_) +
                 fVar135 * (fVar246 * auVar146._8_4_ + fVar135 * auVar183._8_4_)) * 3.0;
            auVar274._12_4_ =
                 (fVar247 * (fVar247 * auVar158._12_4_ + fVar136 * auVar146._12_4_) +
                 fVar136 * (fVar247 * auVar146._12_4_ + fVar136 * auVar183._12_4_)) * 3.0;
            auVar158 = vshufps_avx(ZEXT416((uint)fVar240),ZEXT416((uint)fVar240),0);
            auVar233._0_4_ =
                 auVar158._0_4_ * (float)local_450._0_4_ +
                 auVar197._0_4_ * (float)local_460._0_4_ +
                 auVar110._0_4_ * (float)local_480._0_4_ + auVar223._0_4_ * (float)local_470._0_4_;
            auVar233._4_4_ =
                 auVar158._4_4_ * (float)local_450._4_4_ +
                 auVar197._4_4_ * (float)local_460._4_4_ +
                 auVar110._4_4_ * (float)local_480._4_4_ + auVar223._4_4_ * (float)local_470._4_4_;
            auVar233._8_4_ =
                 auVar158._8_4_ * fStack_448 +
                 auVar197._8_4_ * fStack_458 +
                 auVar110._8_4_ * fStack_478 + auVar223._8_4_ * fStack_468;
            auVar233._12_4_ =
                 auVar158._12_4_ * fStack_444 +
                 auVar197._12_4_ * fStack_454 +
                 auVar110._12_4_ * fStack_474 + auVar223._12_4_ * fStack_464;
            auVar110 = vshufps_avx(auVar274,auVar274,0xc9);
            auVar256._0_4_ = auVar233._0_4_ * auVar110._0_4_;
            auVar256._4_4_ = auVar233._4_4_ * auVar110._4_4_;
            auVar256._8_4_ = auVar233._8_4_ * auVar110._8_4_;
            auVar256._12_4_ = auVar233._12_4_ * auVar110._12_4_;
            auVar110 = vshufps_avx(auVar233,auVar233,0xc9);
            auVar234._0_4_ = auVar274._0_4_ * auVar110._0_4_;
            auVar234._4_4_ = auVar274._4_4_ * auVar110._4_4_;
            auVar234._8_4_ = auVar274._8_4_ * auVar110._8_4_;
            auVar234._12_4_ = auVar274._12_4_ * auVar110._12_4_;
            auVar110 = vsubps_avx(auVar234,auVar256);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar18->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              auStack_170 = vshufps_avx(auVar110,auVar110,0x55);
              auStack_150 = vshufps_avx(auVar110,auVar110,0xaa);
              auStack_130 = vshufps_avx(auVar110,auVar110,0);
              local_180[0] = (RTCHitN)auStack_170[0];
              local_180[1] = (RTCHitN)auStack_170[1];
              local_180[2] = (RTCHitN)auStack_170[2];
              local_180[3] = (RTCHitN)auStack_170[3];
              local_180[4] = (RTCHitN)auStack_170[4];
              local_180[5] = (RTCHitN)auStack_170[5];
              local_180[6] = (RTCHitN)auStack_170[6];
              local_180[7] = (RTCHitN)auStack_170[7];
              local_180[8] = (RTCHitN)auStack_170[8];
              local_180[9] = (RTCHitN)auStack_170[9];
              local_180[10] = (RTCHitN)auStack_170[10];
              local_180[0xb] = (RTCHitN)auStack_170[0xb];
              local_180[0xc] = (RTCHitN)auStack_170[0xc];
              local_180[0xd] = (RTCHitN)auStack_170[0xd];
              local_180[0xe] = (RTCHitN)auStack_170[0xe];
              local_180[0xf] = (RTCHitN)auStack_170[0xf];
              local_160 = auStack_150;
              local_140 = auStack_130;
              local_120 = auStack_110;
              local_100 = auStack_f0;
              local_e0 = local_340._0_8_;
              uStack_d8 = local_340._8_8_;
              uStack_d0 = local_340._16_8_;
              uStack_c8 = local_340._24_8_;
              local_c0 = local_320;
              vcmpps_avx(local_320,local_320,0xf);
              uStack_9c = context->user->instID[0];
              local_a0 = uStack_9c;
              uStack_98 = uStack_9c;
              uStack_94 = uStack_9c;
              uStack_90 = uStack_9c;
              uStack_8c = uStack_9c;
              uStack_88 = uStack_9c;
              uStack_84 = uStack_9c;
              uStack_7c = context->user->instPrimID[0];
              local_80 = uStack_7c;
              uStack_78 = uStack_7c;
              uStack_74 = uStack_7c;
              uStack_70 = uStack_7c;
              uStack_6c = uStack_7c;
              uStack_68 = uStack_7c;
              uStack_64 = uStack_7c;
              *(float *)(ray + k * 4 + 0x100) = fVar133;
              local_540 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar90 & 0xf) << 4));
              local_530 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar90 >> 4) * 0x10)
              ;
              local_510.valid = (int *)local_540;
              local_510.geometryUserPtr = pGVar18->userPtr;
              local_510.context = context->user;
              local_510.hit = local_180;
              local_510.N = 8;
              local_510.ray = (RTCRayN *)ray;
              if (pGVar18->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar18->intersectionFilterN)(&local_510);
              }
              auVar110 = vpcmpeqd_avx(local_540,ZEXT816(0) << 0x40);
              auVar223 = vpcmpeqd_avx(local_530,ZEXT816(0) << 0x40);
              auVar202._16_16_ = auVar223;
              auVar202._0_16_ = auVar110;
              auVar122 = _DAT_01f7b020 & ~auVar202;
              if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar122 >> 0x7f,0) != '\0') ||
                    (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar122 >> 0xbf,0) != '\0') ||
                  (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar122[0x1f] < '\0') {
                p_Var23 = context->args->filter;
                if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar18->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var23)(&local_510);
                }
                auVar110 = vpcmpeqd_avx(local_540,ZEXT816(0) << 0x40);
                auVar223 = vpcmpeqd_avx(local_530,ZEXT816(0) << 0x40);
                auVar129._16_16_ = auVar223;
                auVar129._0_16_ = auVar110;
                auVar122 = _DAT_01f7b020 & ~auVar129;
                if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar122 >> 0x7f,0) != '\0') ||
                      (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar122 >> 0xbf,0) != '\0') ||
                    (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar122[0x1f] < '\0') {
                  auVar130._0_8_ = auVar110._0_8_ ^ 0xffffffffffffffff;
                  auVar130._8_4_ = auVar110._8_4_ ^ 0xffffffff;
                  auVar130._12_4_ = auVar110._12_4_ ^ 0xffffffff;
                  auVar130._16_4_ = auVar223._0_4_ ^ 0xffffffff;
                  auVar130._20_4_ = auVar223._4_4_ ^ 0xffffffff;
                  auVar130._24_4_ = auVar223._8_4_ ^ 0xffffffff;
                  auVar130._28_4_ = auVar223._12_4_ ^ 0xffffffff;
                  auVar122 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])local_510.hit);
                  *(undefined1 (*) [32])(local_510.ray + 0x180) = auVar122;
                  auVar122 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])(local_510.hit + 0x20));
                  *(undefined1 (*) [32])(local_510.ray + 0x1a0) = auVar122;
                  auVar122 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])(local_510.hit + 0x40));
                  *(undefined1 (*) [32])(local_510.ray + 0x1c0) = auVar122;
                  auVar122 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])(local_510.hit + 0x60));
                  *(undefined1 (*) [32])(local_510.ray + 0x1e0) = auVar122;
                  auVar122 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])(local_510.hit + 0x80));
                  *(undefined1 (*) [32])(local_510.ray + 0x200) = auVar122;
                  auVar122 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])(local_510.hit + 0xa0));
                  *(undefined1 (*) [32])(local_510.ray + 0x220) = auVar122;
                  auVar122 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])(local_510.hit + 0xc0));
                  *(undefined1 (*) [32])(local_510.ray + 0x240) = auVar122;
                  auVar122 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])(local_510.hit + 0xe0));
                  *(undefined1 (*) [32])(local_510.ray + 0x260) = auVar122;
                  auVar122 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])(local_510.hit + 0x100));
                  *(undefined1 (*) [32])(local_510.ray + 0x280) = auVar122;
                  goto LAB_00b5b45c;
                }
              }
              *(float *)(ray + k * 4 + 0x100) = fVar243;
              goto LAB_00b5b45c;
            }
            *(float *)(ray + k * 4 + 0x100) = fVar133;
            uVar92 = vextractps_avx(auVar110,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar92;
            uVar92 = vextractps_avx(auVar110,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar92;
            *(int *)(ray + k * 4 + 0x1c0) = auVar110._0_4_;
            *(float *)(ray + k * 4 + 0x1e0) = fVar93;
            *(float *)(ray + k * 4 + 0x200) = fVar132;
            *(uint *)(ray + k * 4 + 0x220) = uVar17;
            *(uint *)(ray + k * 4 + 0x240) = uVar83;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
          }
        }
      }
      goto LAB_00b5b45c;
    }
    auVar110 = vinsertps_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar93),0x10);
    auVar405 = ZEXT1664(auVar110);
    auVar399 = ZEXT1664(auVar404);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }